

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O1

void __thiscall Tagliatelle<UF>::FirstScan(Tagliatelle<UF> *this)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  char cVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint *puVar15;
  uint *puVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  uint *puVar20;
  long lVar21;
  undefined4 *puVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  undefined4 uVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  uint *puVar40;
  char *pcVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  bool bVar53;
  long local_80;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar31 = *(uint *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar31 & 0xfffffffe;
  this->o_rows = (uVar31 & 0x80000001) == 1;
  this->e_cols = uVar3 & 0xfffffffe;
  this->o_cols = (uVar3 & 0x80000001) == 1;
  puVar15 = UF::P_;
  *UF::P_ = 0;
  UF::length_ = 1;
  lVar10 = *(long *)&pMVar4->field_0x10;
  if (uVar31 != 1) {
    lVar27 = **(long **)&pMVar4->field_0x48;
    lVar38 = lVar10 + lVar27;
    lVar32 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar19 = (long)(int)uVar3 + -2;
    iVar37 = (int)lVar19;
    if ((int)uVar3 < 3) {
      uVar26 = 0;
      lVar19 = 1;
    }
    else {
      uVar33 = 0xfffffffe;
      uVar36 = 0;
      do {
        iVar24 = (int)uVar36;
        uVar49 = (ulong)iVar24;
        iVar30 = (int)uVar33;
        if ((*(char *)(lVar10 + uVar49) != '\0') || (*(char *)(lVar38 + uVar49) != '\0')) {
          cVar8 = *(char *)(lVar10 + 3 + (long)iVar30);
          puVar15[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          *(uint *)(lVar32 + uVar49 * 4) = UF::length_;
          UF::length_ = uVar26;
          if (cVar8 != '\0') goto LAB_002711de;
          goto LAB_0027127e;
        }
        if ((*(char *)((long)iVar30 + 3 + lVar10) != '\0') ||
           (uVar33 = uVar36, *(char *)(lVar38 + 3 + (long)iVar30) != '\0')) {
          puVar15[UF::length_] = UF::length_;
          uVar26 = UF::length_;
          UF::length_ = UF::length_ + 1;
LAB_002711da:
          *(uint *)(lVar32 + uVar49 * 4) = uVar26;
LAB_002711de:
          iVar30 = iVar24 + 2;
          if (iVar30 < iVar37) {
            lVar47 = (long)iVar24;
            lVar23 = lVar47 + 2;
            lVar21 = lVar32 + lVar47 * 4;
            lVar11 = lVar10 + 3 + lVar47;
            lVar47 = lVar47 + lVar27 + lVar10 + 3;
            lVar34 = 0;
            do {
              if ((*(char *)(lVar11 + -1 + lVar34) == '\0') &&
                 (*(char *)(lVar47 + -1 + lVar34) == '\0')) {
                if ((*(char *)(lVar11 + lVar34) == '\0') && (*(char *)(lVar47 + lVar34) == '\0')) {
                  uVar49 = lVar23 + lVar34;
                  uVar33 = uVar49 & 0xffffffff;
                  goto LAB_002713cf;
                }
                puVar15[UF::length_] = UF::length_;
                uVar26 = UF::length_;
                UF::length_ = UF::length_ + 1;
              }
              else {
                if (*(char *)(lVar11 + lVar34) == '\0') goto LAB_0027126f;
                uVar26 = *(uint *)(lVar21 + lVar34 * 4);
              }
              *(uint *)(lVar21 + 8 + lVar34 * 4) = uVar26;
              lVar14 = lVar23 + lVar34;
              lVar34 = lVar34 + 2;
              if (lVar19 <= lVar14 + 2) {
                iVar30 = iVar24 + (int)lVar34 + 2;
                iVar24 = iVar24 + (int)lVar34;
                break;
              }
            } while( true );
          }
          lVar27 = (long)iVar30;
          if (iVar30 <= iVar37) {
            if (*(char *)(lVar10 + lVar27) != '\0') goto LAB_0027154f;
            if (*(char *)(lVar38 + lVar27) != '\0') goto LAB_002715e0;
            goto LAB_0027162d;
          }
          if (*(char *)(lVar10 + lVar27) == '\0') {
            if (*(char *)(lVar38 + lVar27) == '\0') goto LAB_00271608;
LAB_002715e0:
            uVar26 = *(uint *)(lVar32 + (long)iVar24 * 4);
          }
          else {
LAB_0027154f:
            uVar26 = *(uint *)(lVar32 + (long)iVar24 * 4);
          }
          goto LAB_00271665;
        }
LAB_002713cf:
        *(undefined4 *)(lVar32 + uVar49 * 4) = 0;
        uVar26 = (int)uVar33 + 2;
        uVar36 = (ulong)uVar26;
      } while ((int)uVar26 < iVar37);
      lVar19 = (long)((int)uVar33 + 3);
    }
    lVar27 = (long)(int)uVar26;
    if (iVar37 < (int)uVar26) {
      if (*(char *)(lVar10 + lVar27) == '\0') {
        if (*(char *)(lVar38 + lVar27) == '\0') goto LAB_00271608;
LAB_00271598:
        UF::P_[UF::length_] = UF::length_;
LAB_002715a2:
        uVar26 = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
      else {
LAB_002714d1:
        UF::P_[UF::length_] = UF::length_;
LAB_002714db:
        uVar26 = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
    }
    else {
      if (*(char *)(lVar10 + lVar27) != '\0') goto LAB_002714d1;
      if (((*(char *)(lVar38 + lVar27) != '\0') || (*(char *)(lVar10 + lVar19) != '\0')) ||
         (*(char *)(lVar38 + lVar19) != '\0')) goto LAB_00271598;
LAB_00271608:
      uVar26 = 0;
    }
LAB_00271665:
    *(uint *)(lVar32 + lVar27 * 4) = uVar26;
    if (2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
      lVar10 = (long)iVar37;
      lVar38 = 2;
      lVar27 = 1;
      lVar19 = 3;
      lVar32 = 0;
LAB_00271692:
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar11 = *(long *)&pMVar4->field_0x10;
      lVar23 = **(long **)&pMVar4->field_0x48;
      lVar39 = lVar23 * lVar38;
      lVar21 = lVar11 + lVar39;
      pcVar41 = (char *)(lVar21 - lVar23);
      pcVar1 = (char *)(lVar21 + lVar23);
      lVar34 = *(long *)&pMVar5->field_0x10;
      lVar47 = **(long **)&pMVar5->field_0x48;
      lVar14 = lVar47 * lVar38;
      puVar15 = (uint *)(lVar14 + lVar34);
      puVar16 = (uint *)((long)puVar15 + lVar47 * -2);
      cVar8 = *(char *)(lVar11 + lVar39);
      if (2 < (int)uVar3) {
        if (cVar8 == '\0') {
          if (*pcVar1 == '\0') {
            if (*(char *)(lVar21 + 1) == '\0') {
              if (pcVar1[1] != '\0') {
                UF::P_[UF::length_] = UF::length_;
                uVar26 = UF::length_ + 1;
                *puVar15 = UF::length_;
                UF::length_ = uVar26;
                uVar33 = 0;
                goto LAB_00275d77;
              }
              uVar33 = 0;
              puVar20 = puVar15;
              goto LAB_0027519e;
            }
            if (pcVar41[1] != '\0') goto LAB_00271a62;
            cVar8 = *pcVar41;
            if (pcVar41[2] == '\0') goto LAB_00271f4c;
            if (cVar8 == '\0') goto LAB_002721b6;
            uVar26 = *puVar16;
            if (pcVar41[1 - lVar23] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[2];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_00272124;
            }
          }
          else {
            if (*(char *)(lVar21 + 1) == '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar26 = UF::length_ + 1;
              *puVar15 = UF::length_;
              UF::length_ = uVar26;
              uVar33 = 0;
              goto LAB_00277c1d;
            }
            if (pcVar41[1] != '\0') {
LAB_00271a62:
              *puVar15 = *puVar16;
              uVar33 = 0;
              goto LAB_00271a79;
            }
            cVar8 = *pcVar41;
            if (pcVar41[2] == '\0') {
LAB_00271f4c:
              if (cVar8 != '\0') {
                *puVar15 = *puVar16;
                uVar33 = 0;
                goto LAB_002778d2;
              }
              UF::P_[UF::length_] = UF::length_;
              uVar26 = UF::length_ + 1;
              *puVar15 = UF::length_;
              UF::length_ = uVar26;
              uVar33 = 0;
              goto LAB_00276eae;
            }
            if (cVar8 == '\0') {
LAB_002721b6:
              *puVar15 = puVar16[2];
              goto LAB_002721bc;
            }
            uVar26 = *puVar16;
            if (pcVar41[1 - lVar23] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[2];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_00272124;
            }
          }
          *puVar15 = uVar26;
LAB_002721bc:
          uVar33 = 0;
          goto LAB_002775c6;
        }
        if (pcVar41[1] == '\0') {
          if (*(char *)(lVar21 + 1) == '\0') {
            if (*pcVar41 != '\0') {
              *puVar15 = *puVar16;
              uVar33 = 0;
              goto LAB_00271c6e;
            }
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            *puVar15 = UF::length_;
            UF::length_ = uVar26;
            uVar33 = 0;
            goto LAB_002729bc;
          }
          if (pcVar41[2] == '\0') {
            if (*pcVar41 != '\0') {
              *puVar15 = *puVar16;
              uVar33 = 0;
              goto LAB_002778d2;
            }
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            *puVar15 = UF::length_;
            UF::length_ = uVar26;
            uVar33 = 0;
            goto LAB_00276eae;
          }
          if (*pcVar41 == '\0') {
            *puVar15 = puVar16[2];
          }
          else {
            if (pcVar41[1 - lVar23] == '\0') {
              uVar26 = *puVar16;
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[2];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
LAB_00272124:
              uVar18 = uVar26;
              if (uVar26 < uVar9) {
                uVar18 = uVar9;
              }
              if (uVar9 < uVar26) {
                uVar26 = uVar9;
              }
              UF::P_[uVar18] = uVar26;
              *puVar15 = uVar26;
              uVar33 = 0;
              goto LAB_002775c6;
            }
            *puVar15 = *puVar16;
          }
          uVar33 = 0;
          goto LAB_002775c6;
        }
        *puVar15 = *puVar16;
        uVar33 = 0;
LAB_0027178d:
        puVar20 = UF::P_;
        uVar26 = (int)uVar33 + 2;
        uVar36 = (ulong)uVar26;
        if ((int)uVar26 < iVar37) {
          lVar12 = (long)(int)uVar33;
          uVar36 = lVar12 + 2;
          while (uVar33 = uVar36, iVar24 = (int)lVar12, *(char *)(lVar21 + uVar33) != '\0') {
            if (*(char *)(lVar12 + 1 + lVar21) != '\0') {
              if (pcVar41[lVar12 + 3] != '\0') {
                if (pcVar41[uVar33] != '\0') goto LAB_002717f2;
                if (pcVar41[uVar33 - lVar23] == '\0') {
                  uVar26 = puVar16[uVar33];
                  do {
                    uVar9 = uVar26;
                    uVar26 = puVar20[uVar9];
                    uVar18 = puVar15[lVar12];
                  } while (puVar20[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = puVar20[uVar26];
                  } while (puVar20[uVar26] < uVar26);
                  goto LAB_0027190d;
                }
                uVar26 = puVar16[lVar12];
                goto LAB_00271834;
              }
              if (*(char *)(lVar21 + 3 + lVar12) == '\0') {
                uVar26 = *(uint *)((long)puVar15 + ((lVar12 << 0x20) >> 0x1e));
LAB_002739a3:
                uVar36 = uVar33 & 0xffffffff;
                goto LAB_00279017;
              }
              lVar17 = (lVar12 << 0x20) + 0x400000000 >> 0x20;
              if (pcVar41[lVar17] == '\0') {
                uVar26 = puVar15[iVar24];
                goto LAB_0027420c;
              }
              if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
                uVar26 = puVar16[lVar17];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar15[iVar24];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_0027433f;
              }
              if (pcVar41[uVar33] == '\0') {
                if (pcVar41[uVar33 - lVar23] == '\0') {
                  uVar26 = puVar16[uVar33];
                  do {
                    uVar9 = uVar26;
                    uVar26 = UF::P_[uVar9];
                    uVar18 = puVar15[iVar24];
                  } while (UF::P_[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = UF::P_[uVar26];
                    if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
                  } while( true );
                }
                puVar15[uVar33] = puVar16[iVar24];
              }
              else {
                uVar26 = puVar16[uVar33];
LAB_002728e2:
                puVar15[uVar33] = uVar26;
              }
              goto LAB_002775c6;
            }
            if (pcVar1[lVar12 + 1] == '\0') {
              if (pcVar41[lVar12 + 3] == '\0') {
                if (*(char *)(lVar21 + 3 + lVar12) == '\0') {
                  if (pcVar41[uVar33] != '\0') {
                    puVar15[uVar33] = puVar16[uVar33];
                    goto LAB_00271c6e;
                  }
                  puVar15[uVar33] = puVar16[iVar24];
                  goto LAB_002729bc;
                }
                lVar17 = (lVar12 << 0x20) + 0x400000000 >> 0x20;
                if (pcVar41[lVar17] == '\0') {
                  if (pcVar41[uVar33] != '\0') {
                    puVar15[uVar33] = puVar16[uVar33];
                    uVar33 = uVar33 & 0xffffffff;
                    goto LAB_002778d2;
                  }
                  puVar15[uVar33] = puVar16[iVar24];
                  uVar33 = uVar33 & 0xffffffff;
                  goto LAB_00276eae;
                }
                if (pcVar41[uVar33] != '\0') {
                  uVar26 = puVar16[uVar33];
                  if (pcVar41[lVar12 + (3 - lVar23)] != '\0') goto LAB_00274f7c;
                  do {
                    uVar9 = uVar26;
                    uVar26 = UF::P_[uVar9];
                    uVar18 = puVar16[lVar17];
                  } while (UF::P_[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = UF::P_[uVar26];
                    if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
                  } while( true );
                }
                if (pcVar41[lVar12 + (3 - lVar23)] != '\0') {
                  uVar26 = puVar16[iVar24];
                  if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_00274f7c;
                  do {
                    uVar9 = uVar26;
                    uVar26 = UF::P_[uVar9];
                    uVar18 = puVar16[uVar33];
                  } while (UF::P_[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = UF::P_[uVar26];
                    if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
                  } while( true );
                }
                uVar26 = puVar16[iVar24];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar17];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                  if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
                } while( true );
              }
              if (pcVar41[uVar33] == '\0') {
                uVar26 = puVar16[lVar12];
                if (pcVar41[uVar33 - lVar23] == '\0') {
                  do {
                    uVar9 = uVar26;
                    uVar26 = puVar20[uVar9];
                    uVar18 = puVar16[uVar33];
                  } while (puVar20[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = puVar20[uVar26];
                  } while (puVar20[uVar26] < uVar26);
LAB_0027190d:
                  uVar18 = uVar26;
                  if (uVar26 < uVar9) {
                    uVar18 = uVar9;
                  }
                  if (uVar9 < uVar26) {
                    uVar26 = uVar9;
                  }
                  puVar20[uVar18] = uVar26;
                }
              }
              else {
LAB_002717f2:
                uVar26 = puVar16[uVar33];
              }
              goto LAB_00271834;
            }
            if (pcVar41[lVar12 + 3] == '\0') {
              if (*(char *)(lVar21 + 3 + lVar12) == '\0') {
                uVar26 = *(uint *)((long)puVar16 + ((lVar12 << 0x20) >> 0x1e));
                goto LAB_002739a3;
              }
              lVar17 = (lVar12 << 0x20) + 0x400000000 >> 0x20;
              if (pcVar41[lVar17] == '\0') {
                uVar26 = puVar16[iVar24];
                goto LAB_0027420c;
              }
              if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
                uVar26 = puVar16[iVar24];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar17];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_0027433f;
              }
              if (pcVar41[uVar33] != '\0') {
                uVar26 = puVar16[iVar24];
                goto LAB_002728e2;
              }
              if (pcVar41[uVar33 - lVar23] == '\0') {
                uVar26 = puVar16[iVar24];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[uVar33];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                  if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
                } while( true );
              }
              puVar15[uVar33] = puVar16[iVar24];
              goto LAB_002775c6;
            }
            if (pcVar41[uVar33] == '\0') {
              uVar26 = puVar16[lVar12];
              if (pcVar41[uVar33 - lVar23] == '\0') {
                do {
                  uVar9 = uVar26;
                  uVar26 = puVar20[uVar9];
                  uVar18 = puVar16[uVar33];
                } while (puVar20[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = puVar20[uVar26];
                } while (puVar20[uVar26] < uVar26);
                goto LAB_0027190d;
              }
            }
            else {
              uVar26 = puVar16[lVar12];
            }
LAB_00271834:
            puVar15[uVar33] = uVar26;
            uVar36 = uVar33 + 2;
            lVar12 = lVar12 + 2;
            if (lVar10 <= (long)uVar36) goto LAB_00272044;
          }
          lVar12 = lVar12 << 0x20;
          lVar17 = lVar12 + 0x300000000 >> 0x20;
          if (pcVar1[uVar33] == '\0') {
            if (*(char *)(lVar21 + lVar17) == '\0') {
              if (pcVar1[lVar17] != '\0') {
                UF::P_[UF::length_] = UF::length_;
                uVar26 = UF::length_ + 1;
                puVar15[uVar33] = UF::length_;
                UF::length_ = uVar26;
                uVar33 = uVar33 & 0xffffffff;
                goto LAB_00275d77;
              }
              puVar20 = puVar15 + uVar33;
              goto LAB_0027519e;
            }
            if (pcVar41[lVar17] != '\0') goto LAB_0027380c;
            lVar12 = lVar12 + 0x400000000 >> 0x20;
            cVar8 = pcVar41[uVar33];
            if (pcVar41[lVar12] == '\0') goto LAB_00274bf9;
            if (cVar8 != '\0') {
              uVar26 = puVar16[uVar33];
              if (pcVar41[lVar17 - lVar23] != '\0') goto LAB_00274f7c;
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[lVar12];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
                if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
              } while( true );
            }
            uVar26 = puVar16[lVar12];
            goto LAB_00274dcf;
          }
          lVar35 = (long)(iVar24 + 1);
          if (*(char *)(lVar21 + lVar17) == '\0') {
            if (pcVar1[lVar35] != '\0') {
              puVar15[uVar33] = puVar15[iVar24];
              goto LAB_00277c1d;
            }
            if (*(char *)(lVar21 + lVar35) != '\0') {
              puVar15[uVar33] = puVar15[iVar24];
              goto LAB_00277c1d;
            }
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            puVar15[uVar33] = UF::length_;
            UF::length_ = uVar26;
            goto LAB_00277c1d;
          }
          if (*(char *)(lVar21 + lVar35) == '\0') {
            if (pcVar1[lVar35] == '\0') {
              if (pcVar41[lVar17] != '\0') {
                uVar26 = puVar16[uVar33];
                goto LAB_00273e2f;
              }
              lVar12 = lVar12 + 0x400000000 >> 0x20;
              cVar8 = pcVar41[uVar33];
              if (pcVar41[lVar12] == '\0') goto joined_r0x00274eb1;
              if (cVar8 != '\0') {
                uVar26 = puVar16[uVar33];
                if (pcVar41[lVar17 - lVar23] != '\0') goto LAB_00274f7c;
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar12];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                  if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
                } while( true );
              }
              uVar26 = puVar16[lVar12];
              goto LAB_002745f8;
            }
            if (pcVar41[lVar17] == '\0') {
              lVar12 = lVar12 + 0x400000000 >> 0x20;
              if (pcVar41[lVar12] == '\0') {
                if (pcVar41[uVar33] != '\0') {
                  uVar26 = puVar16[iVar24];
                  goto LAB_00273743;
                }
                puVar15[uVar33] = puVar15[iVar24];
                goto LAB_00279c7f;
              }
              if (pcVar41[lVar17 - lVar23] != '\0') {
                if (pcVar41[uVar33] != '\0') {
                  lVar12 = (long)iVar24;
                  goto LAB_002745f0;
                }
                uVar26 = puVar16[iVar24];
                if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_00274f7c;
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[uVar33];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                  if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
                } while( true );
              }
              if (pcVar41[uVar33] != '\0') {
                uVar26 = puVar16[iVar24];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar12];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                  if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
                } while( true );
              }
              uVar26 = puVar16[lVar12];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar15[iVar24];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
                if (uVar26 <= UF::P_[uVar26]) goto LAB_0027370e;
              } while( true );
            }
            if (pcVar41[uVar33] == '\0') {
              uVar26 = puVar16[iVar24];
              if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_0027475e;
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[uVar33];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
                if (uVar26 <= UF::P_[uVar26]) goto LAB_00274751;
              } while( true );
            }
LAB_00273cd7:
            uVar26 = puVar16[iVar24];
            goto LAB_00273cda;
          }
          if (pcVar41[lVar17] != '\0') {
            if (pcVar41[uVar33] != '\0') {
              puVar15[uVar33] = puVar16[uVar33];
              goto LAB_00271a79;
            }
            if (pcVar41[uVar33 - lVar23] == '\0') {
              uVar26 = puVar16[uVar33];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar15[iVar24];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
                if (uVar26 <= UF::P_[uVar26]) goto LAB_00274751;
              } while( true );
            }
            goto LAB_00273cd7;
          }
          lVar12 = lVar12 + 0x400000000 >> 0x20;
          if (pcVar41[lVar12] == '\0') {
            uVar26 = puVar15[iVar24];
LAB_0027420c:
            uVar36 = uVar33 & 0xffffffff;
            goto LAB_00278d3d;
          }
          if (pcVar41[lVar17 - lVar23] == '\0') {
            uVar26 = puVar16[lVar12];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[iVar24];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
          }
          else {
            if (pcVar41[uVar33] != '\0') {
              puVar15[uVar33] = puVar16[uVar33];
              goto LAB_002775c6;
            }
            if (pcVar41[uVar33 - lVar23] != '\0') {
              puVar15[uVar33] = puVar16[iVar24];
              goto LAB_002775c6;
            }
            uVar26 = puVar16[uVar33];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[iVar24];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
LAB_0027433f:
            uVar18 = uVar26;
            if (uVar26 < uVar9) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
          }
          puVar15[uVar33] = uVar26;
LAB_002775c6:
          puVar20 = UF::P_;
          uVar26 = (int)uVar33 + 2;
          uVar36 = (ulong)uVar26;
          if ((int)uVar26 < iVar37) {
            lVar17 = (long)(int)uVar33;
            uVar36 = lVar17 + 2;
            do {
              uVar33 = uVar36;
              iVar24 = (int)lVar17;
              if (*(char *)(lVar21 + uVar33) == '\0') {
                cVar8 = *(char *)(lVar17 + 3 + lVar21);
                if (pcVar1[uVar33] == '\0') {
                  if (cVar8 == '\0') {
                    if (pcVar1[lVar17 + 3] != '\0') {
                      UF::P_[UF::length_] = UF::length_;
                      uVar26 = UF::length_ + 1;
                      puVar15[uVar33] = UF::length_;
                      UF::length_ = uVar26;
                      goto LAB_00275d77;
                    }
LAB_00279c49:
                    puVar20 = puVar15 + uVar33;
                    goto LAB_0027519e;
                  }
                  if (pcVar41[lVar17 + 3] != '\0') goto LAB_00277827;
                  if (pcVar41[lVar17 + 4] == '\0') {
                    puVar15[uVar33] = puVar16[uVar33];
                    goto LAB_002778d2;
                  }
                  uVar26 = puVar16[uVar33];
                  if (pcVar41[lVar17 + (3 - lVar23)] != '\0') goto LAB_0027773d;
                  do {
                    uVar9 = uVar26;
                    uVar26 = puVar20[uVar9];
                    uVar18 = puVar16[lVar17 + 4];
                  } while (puVar20[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = puVar20[uVar26];
                  } while (puVar20[uVar26] < uVar26);
                }
                else {
                  if (cVar8 == '\0') {
LAB_002777c0:
                    puVar15[uVar33] = puVar15[(int)lVar17];
                    goto LAB_00277c1d;
                  }
                  if (pcVar41[lVar17 + 3] != '\0') {
LAB_00277827:
                    puVar15[uVar33] = puVar16[uVar33];
                    goto LAB_00271a79;
                  }
                  if (pcVar41[lVar17 + 4] == '\0') {
                    uVar26 = puVar15[iVar24];
                    uVar36 = uVar33;
                    goto LAB_00278d3d;
                  }
                  if (pcVar41[lVar17 + (3 - lVar23)] != '\0') goto LAB_00277696;
                  uVar26 = puVar16[lVar17 + 4];
                  do {
                    uVar9 = uVar26;
                    uVar26 = puVar20[uVar9];
                    uVar18 = puVar15[lVar17];
                  } while (puVar20[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = puVar20[uVar26];
                  } while (puVar20[uVar26] < uVar26);
                }
LAB_00277720:
                uVar18 = uVar26;
                if (uVar26 < uVar9) {
                  uVar18 = uVar9;
                }
                if (uVar9 < uVar26) {
                  uVar26 = uVar9;
                }
                puVar20[uVar18] = uVar26;
              }
              else {
                if (pcVar41[lVar17 + 3] != '\0') {
                  puVar15[uVar33] = puVar16[uVar33];
                  goto LAB_0027178d;
                }
                if (*(char *)(lVar21 + 3 + lVar17) == '\0') {
                  uVar26 = puVar15[iVar24];
                  uVar36 = uVar33 & 0xffffffff;
                  goto LAB_00279017;
                }
                if (pcVar41[lVar17 + 4] == '\0') goto LAB_00277818;
                if (pcVar41[lVar17 + (3 - lVar23)] == '\0') {
                  uVar26 = puVar16[lVar17 + 4];
                  do {
                    uVar9 = uVar26;
                    uVar26 = puVar20[uVar9];
                    uVar18 = puVar15[lVar17];
                  } while (puVar20[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = puVar20[uVar26];
                  } while (puVar20[uVar26] < uVar26);
                  goto LAB_00277720;
                }
LAB_00277696:
                uVar26 = puVar16[uVar33];
              }
LAB_0027773d:
              puVar15[uVar33] = uVar26;
              uVar36 = uVar33 + 2;
              lVar17 = lVar17 + 2;
              if (lVar10 <= (long)uVar36) break;
            } while( true );
          }
          iVar24 = (int)uVar33;
          if (iVar37 < (int)uVar36) {
LAB_00277957:
            uVar49 = uVar36 & 0xffffffff;
            if ((*(char *)(lVar21 + uVar49) == '\0') && (pcVar1[uVar49] == '\0')) {
LAB_002797b5:
              puVar15[uVar49] = 0;
            }
            else {
              uVar26 = puVar15[(long)(int)uVar36 + -2];
LAB_002795db:
              puVar15[uVar49] = uVar26;
            }
            goto LAB_0027b423;
          }
          uVar49 = uVar36 & 0xffffffff;
          if (*(char *)(lVar21 + uVar49) == '\0') {
            uVar33 = (ulong)(iVar24 + 3);
            if (pcVar1[uVar49] == '\0') {
              if (*(char *)(lVar21 + uVar33) == '\0') {
LAB_00277850:
                cVar8 = pcVar1[uVar33];
joined_r0x00273029:
                if (cVar8 == '\0') goto LAB_002797b5;
LAB_00279cfe:
                UF::P_[UF::length_] = UF::length_;
                uVar26 = UF::length_ + 1;
                puVar15[uVar49] = UF::length_;
                UF::length_ = uVar26;
                goto LAB_0027b423;
              }
            }
            else if ((*(char *)(lVar21 + uVar33) == '\0') || (pcVar41[uVar33] == '\0')) {
LAB_002777ab:
              lVar21 = (long)iVar24;
              goto LAB_002777ae;
            }
LAB_0027777f:
            uVar26 = puVar16[uVar49];
          }
          else {
            lVar21 = (long)iVar24;
            if (pcVar41[lVar21 + 3] != '\0') goto LAB_0027777f;
LAB_002777ae:
            uVar26 = puVar15[lVar21];
          }
LAB_002777b2:
          puVar15[uVar49] = uVar26;
          goto LAB_0027b423;
        }
LAB_00272044:
        uVar49 = uVar36 & 0xffffffff;
        iVar24 = (int)uVar33;
        if (iVar37 < (int)uVar36) {
          if (*(char *)(lVar21 + uVar49) == '\0') {
            if (pcVar1[uVar49] == '\0') {
LAB_00275841:
              puVar15[uVar49] = 0;
            }
            else {
              if ((pcVar1[iVar24 + 1] != '\0') || (*(char *)(lVar21 + (ulong)(iVar24 + 1)) != '\0'))
              goto LAB_0027324e;
LAB_0027556c:
              UF::P_[UF::length_] = UF::length_;
              uVar26 = UF::length_;
LAB_00275838:
              UF::length_ = uVar26 + 1;
              puVar15[uVar49] = uVar26;
            }
          }
          else {
            if (*(char *)(lVar21 + (ulong)(iVar24 + 1)) == '\0') {
              if ((pcVar1[iVar24 + 1] != '\0') || (pcVar41[uVar49] == '\0')) goto LAB_0027207a;
              goto LAB_00275556;
            }
LAB_0027324e:
            uVar26 = puVar15[iVar24];
LAB_0027555e:
            puVar15[uVar49] = uVar26;
          }
          goto LAB_0027b423;
        }
        if (*(char *)(lVar21 + uVar49) == '\0') {
          uVar33 = (ulong)(iVar24 + 3);
          if (pcVar1[uVar49] == '\0') {
            if (*(char *)(lVar21 + uVar33) == '\0') {
              cVar8 = pcVar1[uVar33];
LAB_0027534e:
              if (cVar8 == '\0') {
                puVar15[uVar49] = 0;
                goto LAB_0027b423;
              }
LAB_00275359:
              UF::P_[UF::length_] = UF::length_;
              uVar26 = UF::length_ + 1;
              puVar15[uVar49] = UF::length_;
              UF::length_ = uVar26;
              goto LAB_0027b423;
            }
            if (pcVar41[uVar33] == '\0') {
              cVar8 = pcVar41[uVar49];
LAB_0027572f:
              if (cVar8 == '\0') goto LAB_00275359;
            }
LAB_00275527:
            uVar26 = puVar16[uVar49];
            goto LAB_00275717;
          }
          uVar36 = (ulong)(iVar24 + 1);
          if (*(char *)(lVar21 + uVar33) == '\0') {
            if ((pcVar1[uVar36] == '\0') && (*(char *)(lVar21 + uVar36) == '\0')) goto LAB_0027556c;
            goto LAB_0027324e;
          }
          if (*(char *)(lVar21 + uVar36) == '\0') {
            if (pcVar1[uVar36] == '\0') {
              if (pcVar41[uVar33] == '\0') {
                cVar8 = pcVar41[uVar49];
                goto LAB_0027572f;
              }
LAB_00275556:
              uVar26 = puVar16[uVar49];
            }
            else {
              if (pcVar41[uVar33] != '\0') {
                if (pcVar41[uVar49] != '\0') goto LAB_0027207a;
                if (pcVar41[uVar49 - lVar23] != '\0') {
                  puVar15[uVar49] = puVar16[iVar24];
                  goto LAB_0027b423;
                }
                uVar26 = puVar16[iVar24];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[uVar49];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_0027532f;
              }
              if (pcVar41[uVar49] == '\0') {
                uVar26 = puVar15[iVar24];
              }
              else {
                uVar26 = puVar16[iVar24];
              }
            }
            goto LAB_0027555e;
          }
          if (pcVar41[uVar33] == '\0') goto LAB_0027324e;
          if (pcVar41[uVar49] != '\0') goto LAB_00275556;
          if (pcVar41[uVar49 - lVar23] != '\0') {
LAB_0027207a:
            lVar21 = (long)iVar24;
LAB_002752bc:
            uVar26 = puVar16[lVar21];
            goto LAB_0027555e;
          }
          uVar26 = puVar16[uVar49];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[iVar24];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027532f;
        }
        if (*(char *)(lVar21 + (ulong)(iVar24 + 1)) != '\0') {
          lVar21 = (long)iVar24;
          if (pcVar41[lVar21 + 3] == '\0') goto LAB_0027324e;
          if (pcVar41[uVar49] != '\0') goto LAB_00275527;
          if (pcVar41[uVar49 - lVar23] == '\0') {
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar21];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_0027532f;
          }
LAB_0027570f:
          uVar26 = puVar16[lVar21];
LAB_00275717:
          puVar15[uVar49] = uVar26;
          goto LAB_0027b423;
        }
        lVar21 = (long)iVar24;
        if (pcVar1[iVar24 + 1] == '\0') {
          if (pcVar41[lVar21 + 3] == '\0') {
            if (pcVar41[uVar49] == '\0') goto LAB_0027570f;
          }
          else if (pcVar41[uVar49] == '\0') {
            uVar26 = puVar16[lVar21];
            if (pcVar41[uVar49 - lVar23] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[uVar49];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_0027532f;
            }
            goto LAB_0027533c;
          }
          goto LAB_00275527;
        }
        if ((pcVar41[lVar21 + 3] == '\0') || (pcVar41[uVar49] != '\0')) goto LAB_0027570f;
        uVar26 = puVar16[lVar21];
        if (pcVar41[uVar49 - lVar23] == '\0') {
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar49];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027532f;
        }
        goto LAB_0027533c;
      }
      if (uVar3 == 2) {
        if (cVar8 == '\0') {
          if (*pcVar1 == '\0') {
            if (*(char *)(lVar21 + 1) == '\0') {
              cVar8 = pcVar1[1];
              goto joined_r0x00271a3a;
            }
          }
          else if (*(char *)(lVar21 + 1) == '\0') goto LAB_00272017;
          cVar8 = pcVar41[1];
        }
        else {
          cVar8 = pcVar41[1];
        }
        if (cVar8 == '\0') {
          cVar8 = *pcVar41;
joined_r0x0027194b:
          if (cVar8 == '\0') goto LAB_00272017;
        }
        *puVar15 = *puVar16;
      }
      else {
        if (cVar8 != '\0') {
          cVar8 = *pcVar41;
          goto joined_r0x0027194b;
        }
        cVar8 = *pcVar1;
joined_r0x00271a3a:
        if (cVar8 == '\0') {
          *puVar15 = 0;
          goto LAB_0027b423;
        }
LAB_00272017:
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        *puVar15 = UF::length_;
        UF::length_ = uVar26;
      }
      goto LAB_0027b423;
    }
LAB_0027b721:
    puVar15 = UF::P_;
    if (this->o_rows == false) {
      return;
    }
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar27 = *(long *)&pMVar4->field_0x10;
    lVar32 = **(long **)&pMVar4->field_0x48;
    lVar34 = (long)(int)(uVar31 - 1);
    lVar10 = lVar27 + lVar32 * lVar34;
    lVar23 = lVar10 - lVar32;
    lVar38 = *(long *)&pMVar5->field_0x10;
    lVar21 = **(long **)&pMVar5->field_0x48;
    lVar19 = lVar38 + lVar21 * lVar34;
    lVar11 = lVar19 + lVar21 * -2;
    if ((int)uVar3 < 3) {
      uVar31 = 0;
      iVar24 = -2;
    }
    else {
      lVar17 = lVar23 - lVar32;
      lVar47 = (long)iVar37;
      lVar14 = lVar27 + lVar32 * (lVar34 + -2) + 3;
      lVar35 = (lVar34 + -1) * lVar32;
      lVar39 = lVar35 + lVar27 + 2;
      lVar32 = lVar32 * lVar34 + lVar27 + 3;
      lVar12 = lVar21 * (lVar34 + -2) + lVar38 + 8;
      lVar38 = lVar21 * lVar34 + 8 + lVar38;
      lVar27 = lVar35 + lVar27 + 4;
      iVar24 = -2;
      uVar33 = 0;
      do {
        iVar30 = (int)uVar33;
        uVar36 = (ulong)iVar30;
        lVar21 = (long)iVar24;
        if (*(char *)(lVar10 + uVar36) == '\0') {
          if (*(char *)(lVar10 + 3 + lVar21) == '\0') goto LAB_0027b964;
          if (*(char *)(lVar23 + 3 + lVar21) != '\0') goto LAB_0027c1dd;
          cVar8 = *(char *)(lVar23 + uVar36);
          if (*(char *)(lVar21 + 4 + lVar23) == '\0') {
LAB_0027b921:
            if (cVar8 != '\0') goto LAB_0027c067;
            puVar15[UF::length_] = UF::length_;
            uVar31 = UF::length_;
            UF::length_ = UF::length_ + 1;
            goto LAB_0027bd1a;
          }
          if (cVar8 == '\0') {
LAB_0027b942:
            uVar31 = *(uint *)(lVar11 + 0x10 + lVar21 * 4);
            goto LAB_0027bf4b;
          }
          uVar31 = *(uint *)(lVar11 + uVar36 * 4);
          if (*(char *)(lVar17 + 3 + lVar21) != '\0') goto LAB_0027bf4b;
          do {
            uVar26 = uVar31;
            uVar31 = puVar15[uVar26];
            uVar3 = *(uint *)(lVar11 + 0x10 + lVar21 * 4);
          } while (puVar15[uVar26] < uVar26);
          do {
            uVar31 = uVar3;
            uVar3 = puVar15[uVar31];
          } while (puVar15[uVar31] < uVar31);
LAB_0027b8fe:
          uVar3 = uVar31;
          if (uVar31 < uVar26) {
            uVar3 = uVar26;
          }
          if (uVar26 < uVar31) {
            uVar31 = uVar26;
          }
          puVar15[uVar3] = uVar31;
LAB_0027bf4b:
          *(uint *)(lVar19 + uVar36 * 4) = uVar31;
          puVar16 = UF::P_;
          iVar24 = (int)uVar33;
          uVar36 = (ulong)(iVar24 + 2U);
          if ((int)(iVar24 + 2U) < iVar37) {
            lVar21 = (long)iVar24;
            uVar33 = lVar21 + 2;
            while (uVar36 = uVar33, *(char *)(lVar10 + uVar36) == '\0') {
              if (*(char *)(lVar10 + 3 + lVar21) == '\0') goto LAB_0027c934;
              if (*(char *)(lVar23 + 3 + lVar21) != '\0') goto LAB_0027c1da;
              if (*(char *)(lVar21 + 4 + lVar23) == '\0') {
LAB_0027c064:
                iVar30 = (int)uVar36;
                goto LAB_0027c067;
              }
              uVar31 = *(uint *)(lVar11 + uVar36 * 4);
              if (*(char *)(lVar17 + 3 + lVar21) == '\0') {
                do {
                  uVar26 = uVar31;
                  uVar31 = puVar16[uVar26];
                  uVar3 = *(uint *)(lVar11 + 0x10 + lVar21 * 4);
                } while (puVar16[uVar26] < uVar26);
                do {
                  uVar31 = uVar3;
                  uVar3 = puVar16[uVar31];
                } while (puVar16[uVar31] < uVar31);
LAB_0027c01a:
                uVar3 = uVar31;
                if (uVar31 < uVar26) {
                  uVar3 = uVar26;
                }
                if (uVar26 < uVar31) {
                  uVar31 = uVar26;
                }
                puVar16[uVar3] = uVar31;
              }
LAB_0027c027:
              *(uint *)(lVar19 + uVar36 * 4) = uVar31;
              uVar33 = uVar36 + 2;
              lVar21 = lVar21 + 2;
              if (lVar47 <= (long)uVar33) {
                iVar24 = (int)uVar36;
                uVar36 = uVar33 & 0xffffffff;
                goto LAB_0027cd2f;
              }
            }
            if (*(char *)(lVar23 + 3 + lVar21) == '\0') {
              if (*(char *)(lVar10 + 3 + lVar21) != '\0') {
                if (*(char *)(lVar21 + 4 + lVar23) == '\0') {
                  puVar22 = (undefined4 *)(lVar19 + (long)(int)lVar21 * 4);
                  goto LAB_0027c4ef;
                }
                if (*(char *)(lVar17 + 3 + lVar21) == '\0') {
                  uVar31 = *(uint *)(lVar11 + 0x10 + lVar21 * 4);
                  do {
                    uVar26 = uVar31;
                    uVar31 = puVar16[uVar26];
                    uVar3 = *(uint *)(lVar19 + lVar21 * 4);
                  } while (puVar16[uVar26] < uVar26);
                  do {
                    uVar31 = uVar3;
                    uVar3 = puVar16[uVar31];
                  } while (puVar16[uVar31] < uVar31);
                  goto LAB_0027c01a;
                }
                uVar31 = *(uint *)(lVar11 + uVar36 * 4);
                goto LAB_0027c027;
              }
              uVar31 = *(uint *)(lVar19 + (long)(int)lVar21 * 4);
LAB_0027c979:
              iVar24 = (int)uVar36;
              goto LAB_0027c97c;
            }
            uVar31 = *(uint *)(lVar11 + uVar36 * 4);
LAB_0027c7de:
            uVar33 = uVar36 & 0xffffffff;
LAB_0027c7e1:
            *(uint *)(lVar19 + uVar36 * 4) = uVar31;
            puVar16 = UF::P_;
            iVar24 = (int)uVar33;
            uVar33 = (ulong)(iVar24 + 2U);
            if (iVar37 <= (int)(iVar24 + 2U)) {
LAB_0027cc4f:
              lVar38 = (long)(int)uVar33;
              if (iVar37 < (int)uVar33) {
                if (*(char *)(lVar10 + lVar38) != '\0') {
                  lVar27 = (long)iVar24;
                  if (*(char *)(lVar10 + 1 + lVar27) == '\0') {
                    if (*(char *)(lVar23 + lVar38) == '\0') {
                      uVar29 = *(undefined4 *)(lVar11 + lVar27 * 4);
                    }
                    else {
                      uVar29 = *(undefined4 *)(lVar11 + lVar38 * 4);
                    }
                  }
                  else {
                    uVar29 = *(undefined4 *)(lVar19 + lVar27 * 4);
                  }
                  *(undefined4 *)(lVar19 + lVar38 * 4) = uVar29;
                  return;
                }
LAB_0027cf21:
                *(undefined4 *)(lVar19 + lVar38 * 4) = 0;
                return;
              }
              lVar27 = (long)iVar24;
              if (*(char *)(lVar10 + lVar38) == '\0') {
LAB_0027cf9d:
                if (*(char *)(lVar27 + 3 + lVar10) == '\0') {
                  *(undefined4 *)(lVar19 + lVar38 * 4) = 0;
                  return;
                }
                if ((*(char *)(lVar23 + 3 + lVar27) == '\0') && (*(char *)(lVar23 + lVar38) == '\0')
                   ) {
                  UF::P_[UF::length_] = UF::length_;
                  uVar31 = UF::length_ + 1;
                  *(uint *)(lVar19 + lVar38 * 4) = UF::length_;
                  UF::length_ = uVar31;
                  return;
                }
                *(undefined4 *)(lVar19 + lVar38 * 4) = *(undefined4 *)(lVar11 + lVar38 * 4);
                return;
              }
              cVar8 = *(char *)(lVar23 + 3 + lVar27);
              if (*(char *)(lVar10 + 1 + lVar27) == '\0') {
                if (cVar8 == '\0') {
                  if (*(char *)(lVar23 + lVar38) == '\0') goto LAB_0027d1f3;
                }
                else if (*(char *)(lVar23 + lVar38) == '\0') {
                  uVar31 = *(uint *)(lVar11 + lVar27 * 4);
                  if (*(char *)(lVar17 + lVar38) == '\0') {
                    do {
                      uVar26 = uVar31;
                      uVar31 = UF::P_[uVar26];
                      uVar3 = *(uint *)(lVar11 + lVar38 * 4);
                    } while (UF::P_[uVar26] < uVar26);
                    do {
                      uVar31 = uVar3;
                      uVar3 = UF::P_[uVar31];
                    } while (UF::P_[uVar31] < uVar31);
LAB_0027d267:
                    uVar3 = uVar31;
                    if (uVar31 < uVar26) {
                      uVar3 = uVar26;
                    }
                    if (uVar26 < uVar31) {
                      uVar31 = uVar26;
                    }
                    UF::P_[uVar3] = uVar31;
                  }
LAB_0027d274:
                  *(uint *)(lVar19 + lVar38 * 4) = uVar31;
                  return;
                }
              }
              else {
                if (cVar8 == '\0') {
                  uVar29 = *(undefined4 *)(lVar19 + lVar27 * 4);
                  goto LAB_0027d1ed;
                }
                if (*(char *)(lVar23 + lVar38) == '\0') {
                  if (*(char *)(lVar17 + lVar38) == '\0') {
                    uVar31 = *(uint *)(lVar11 + lVar38 * 4);
                    do {
                      uVar26 = uVar31;
                      uVar31 = UF::P_[uVar26];
                      uVar3 = *(uint *)(lVar19 + lVar27 * 4);
                    } while (UF::P_[uVar26] < uVar26);
                    do {
                      uVar31 = uVar3;
                      uVar3 = UF::P_[uVar31];
                    } while (UF::P_[uVar31] < uVar31);
                    uVar3 = uVar31;
                    if (uVar26 >= uVar31 && uVar26 != uVar31) {
                      uVar3 = uVar26;
                    }
                    if (uVar26 < uVar31) {
                      uVar31 = uVar26;
                    }
                    UF::P_[uVar3] = uVar31;
                    *(uint *)(lVar19 + lVar38 * 4) = uVar31;
                    return;
                  }
LAB_0027d1f3:
                  uVar29 = *(undefined4 *)(lVar11 + lVar27 * 4);
                  goto LAB_0027d1ed;
                }
              }
LAB_0027d1e9:
              uVar29 = *(undefined4 *)(lVar11 + lVar38 * 4);
LAB_0027d1ed:
              *(undefined4 *)(lVar19 + lVar38 * 4) = uVar29;
              return;
            }
            lVar21 = (long)iVar24;
            uVar33 = lVar21 + 2;
LAB_0027c7fd:
            uVar36 = uVar33;
            iVar24 = (int)lVar21;
            if (*(char *)(lVar10 + uVar36) == '\0') {
              lVar34 = (lVar21 << 0x20) + 0x300000000 >> 0x20;
              if (*(char *)(lVar10 + lVar34) == '\0') goto LAB_0027c934;
              if (*(char *)(lVar23 + lVar34) != '\0') goto LAB_0027c1da;
              lVar21 = (long)(iVar24 + 4);
              if (*(char *)(lVar23 + lVar21) == '\0') {
                if (*(char *)(lVar23 + uVar36) == '\0') goto LAB_0027ca3f;
                goto LAB_0027c064;
              }
              if (*(char *)(lVar23 + uVar36) == '\0') goto LAB_0027caa7;
              uVar31 = *(uint *)(lVar11 + uVar36 * 4);
              if (*(char *)(lVar17 + lVar34) == '\0') {
                do {
                  uVar26 = uVar31;
                  uVar31 = puVar15[uVar26];
                  uVar3 = *(uint *)(lVar11 + lVar21 * 4);
                } while (puVar15[uVar26] < uVar26);
                do {
                  uVar31 = uVar3;
                  uVar3 = puVar15[uVar31];
                } while (puVar15[uVar31] < uVar31);
                goto LAB_0027cb6d;
              }
              goto LAB_0027cb7b;
            }
            cVar8 = *(char *)(lVar21 + 3 + lVar23);
            if (*(char *)(lVar10 + 1 + lVar21) == '\0') {
              if (cVar8 != '\0') {
                if (*(char *)(lVar23 + uVar36) != '\0') goto LAB_0027c844;
                uVar31 = *(uint *)(lVar11 + lVar21 * 4);
                if (*(char *)(lVar17 + uVar36) == '\0') {
                  do {
                    uVar26 = uVar31;
                    uVar31 = puVar16[uVar26];
                    uVar3 = *(uint *)(lVar11 + uVar36 * 4);
                  } while (puVar16[uVar26] < uVar26);
                  do {
                    uVar31 = uVar3;
                    uVar3 = puVar16[uVar31];
                  } while (puVar16[uVar31] < uVar31);
                  goto LAB_0027c8ad;
                }
LAB_0027c848:
                *(uint *)(lVar19 + uVar36 * 4) = uVar31;
                uVar33 = uVar36 + 2;
                lVar21 = lVar21 + 2;
                if (lVar47 <= (long)uVar33) {
                  iVar24 = (int)uVar36;
                  goto LAB_0027cc4f;
                }
                goto LAB_0027c7fd;
              }
              if (*(char *)(lVar10 + 3 + lVar21) == '\0') {
                if (*(char *)(lVar23 + uVar36) == '\0') {
                  uVar31 = *(uint *)(lVar11 + lVar21 * 4);
                }
                else {
                  uVar31 = *(uint *)(lVar11 + uVar36 * 4);
                }
                goto LAB_0027c979;
              }
              lVar34 = (long)(iVar24 + 4);
              if (*(char *)(lVar23 + lVar34) == '\0') {
                if (*(char *)(lVar23 + uVar36) == '\0') {
                  uVar31 = *(uint *)(lVar11 + lVar21 * 4);
                  goto LAB_0027bd17;
                }
                goto LAB_0027c064;
              }
              cVar8 = *(char *)(lVar17 + 3 + lVar21);
              if (*(char *)(lVar23 + uVar36) == '\0') {
                if (cVar8 != '\0') {
                  uVar31 = *(uint *)(lVar11 + lVar21 * 4);
                  if (*(char *)(lVar17 + uVar36) == '\0') {
                    do {
                      uVar26 = uVar31;
                      uVar31 = puVar15[uVar26];
                      uVar3 = *(uint *)(lVar11 + uVar36 * 4);
                    } while (puVar15[uVar26] < uVar26);
                    do {
                      uVar31 = uVar3;
                      uVar3 = puVar15[uVar31];
                    } while (puVar15[uVar31] < uVar31);
                    goto LAB_0027cb6d;
                  }
                  goto LAB_0027cb7b;
                }
                uVar31 = *(uint *)(lVar11 + lVar21 * 4);
                do {
                  uVar26 = uVar31;
                  uVar31 = puVar15[uVar26];
                  uVar3 = *(uint *)(lVar11 + lVar34 * 4);
                } while (puVar15[uVar26] < uVar26);
                do {
                  uVar31 = uVar3;
                  uVar3 = puVar15[uVar31];
                } while (puVar15[uVar31] < uVar31);
              }
              else {
                uVar31 = *(uint *)(lVar11 + uVar36 * 4);
                if (cVar8 != '\0') goto LAB_0027cb7b;
                do {
                  uVar26 = uVar31;
                  uVar31 = puVar15[uVar26];
                  uVar3 = *(uint *)(lVar11 + lVar34 * 4);
                } while (puVar15[uVar26] < uVar26);
                do {
                  uVar31 = uVar3;
                  uVar3 = puVar15[uVar31];
                } while (puVar15[uVar31] < uVar31);
              }
            }
            else {
              if (cVar8 != '\0') {
                if (*(char *)(lVar23 + uVar36) == '\0') {
                  if (*(char *)(lVar17 + uVar36) == '\0') {
                    uVar31 = *(uint *)(lVar11 + uVar36 * 4);
                    do {
                      uVar26 = uVar31;
                      uVar31 = puVar16[uVar26];
                      uVar3 = *(uint *)(lVar19 + lVar21 * 4);
                    } while (puVar16[uVar26] < uVar26);
                    do {
                      uVar31 = uVar3;
                      uVar3 = puVar16[uVar31];
                    } while (puVar16[uVar31] < uVar31);
LAB_0027c8ad:
                    uVar3 = uVar31;
                    if (uVar31 < uVar26) {
                      uVar3 = uVar26;
                    }
                    if (uVar26 < uVar31) {
                      uVar31 = uVar26;
                    }
                    puVar16[uVar3] = uVar31;
                  }
                  else {
                    uVar31 = *(uint *)(lVar11 + lVar21 * 4);
                  }
                }
                else {
LAB_0027c844:
                  uVar31 = *(uint *)(lVar11 + uVar36 * 4);
                }
                goto LAB_0027c848;
              }
              if (*(char *)(lVar10 + 3 + lVar21) == '\0') {
LAB_0027c975:
                uVar31 = *(uint *)(lVar19 + lVar21 * 4);
                goto LAB_0027c979;
              }
              if (*(char *)(lVar23 + (iVar24 + 4)) == '\0') {
LAB_0027c9f2:
                puVar22 = (undefined4 *)(lVar19 + lVar21 * 4);
LAB_0027c4ef:
                iVar24 = (int)uVar36;
                *(undefined4 *)(lVar19 + uVar36 * 4) = *puVar22;
                uVar31 = iVar24 + 2;
                if ((int)uVar31 < iVar37) {
                  lVar52 = (long)iVar24;
                  lVar21 = lVar52 + 2;
                  lVar45 = lVar52 << 0x20;
                  lVar34 = lVar38 + lVar52 * 4;
                  lVar51 = lVar27 + lVar52;
                  lVar35 = 0;
LAB_0027c539:
                  if (*(char *)(lVar32 + lVar52 + -1 + lVar35) == '\0') goto LAB_0027c58f;
                  lVar44 = lVar45 >> 0x20;
                  lVar28 = lVar45 >> 0x1e;
                  if (*(char *)(lVar51 + -1 + lVar35) != '\0') {
                    uVar36 = lVar21 + lVar35;
                    if (*(char *)(lVar35 + -1 + lVar14 + lVar52) == '\0') {
                      uVar31 = *(uint *)(lVar12 + lVar52 * 4 + lVar35 * 4);
                      do {
                        uVar26 = uVar31;
                        uVar31 = puVar15[uVar26];
                        uVar3 = *(uint *)(lVar19 + lVar28);
                      } while (puVar15[uVar26] < uVar26);
                      do {
                        uVar31 = uVar3;
                        uVar3 = puVar15[uVar31];
                      } while (puVar15[uVar31] < uVar31);
                      goto LAB_0027c7d0;
                    }
                    if (*(char *)(lVar23 + lVar44) == '\0') {
                      uVar31 = *(uint *)(lVar12 + lVar52 * 4 + lVar35 * 4);
                      do {
                        uVar26 = uVar31;
                        uVar31 = puVar15[uVar26];
                        uVar3 = *(uint *)(lVar19 + lVar44 * 4);
                      } while (puVar15[uVar26] < uVar26);
                      do {
                        uVar31 = uVar3;
                        uVar3 = puVar15[uVar31];
                      } while (puVar15[uVar31] < uVar31);
                    }
                    else {
                      uVar31 = *(uint *)(lVar11 + lVar44 * 4);
                      if (*(char *)(lVar17 + 1 + lVar44) != '\0') goto LAB_0027c3f4;
                      do {
                        uVar26 = uVar31;
                        uVar31 = puVar15[uVar26];
                        uVar3 = *(uint *)(lVar12 + lVar52 * 4 + lVar35 * 4);
                      } while (puVar15[uVar26] < uVar26);
                      do {
                        uVar31 = uVar3;
                        uVar3 = puVar15[uVar31];
                      } while (puVar15[uVar31] < uVar31);
                    }
                    goto LAB_0027c7d0;
                  }
                  if (*(char *)(lVar32 + lVar52 + lVar35) == '\0') {
                    uVar36 = lVar21 + lVar35;
                    uVar31 = *(uint *)(lVar19 + lVar28);
                    iVar24 = (int)uVar36;
                    goto LAB_0027c97c;
                  }
                  if (*(char *)(lVar51 + lVar35) == '\0') goto code_r0x0027c563;
                  uVar36 = lVar21 + lVar35;
                  if (*(char *)(lVar35 + lVar14 + lVar52) == '\0') {
                    uVar31 = *(uint *)(lVar12 + lVar52 * 4 + 8 + lVar35 * 4);
                    do {
                      uVar26 = uVar31;
                      uVar31 = puVar15[uVar26];
                      uVar3 = *(uint *)(lVar19 + lVar28);
                    } while (puVar15[uVar26] < uVar26);
                    do {
                      uVar31 = uVar3;
                      uVar3 = puVar15[uVar31];
                    } while (puVar15[uVar31] < uVar31);
                  }
                  else {
                    if (*(char *)(lVar35 + -1 + lVar14 + lVar52) == '\0') {
                      uVar31 = *(uint *)(lVar12 + lVar52 * 4 + lVar35 * 4);
                      do {
                        uVar26 = uVar31;
                        uVar31 = puVar15[uVar26];
                        uVar3 = *(uint *)(lVar19 + lVar28);
                      } while (puVar15[uVar26] < uVar26);
                      do {
                        uVar31 = uVar3;
                        uVar3 = puVar15[uVar31];
                      } while (puVar15[uVar31] < uVar31);
                      goto LAB_0027cb6d;
                    }
                    if (*(char *)(lVar23 + lVar44) == '\0') {
                      uVar31 = *(uint *)(lVar12 + lVar52 * 4 + lVar35 * 4);
                      do {
                        uVar26 = uVar31;
                        uVar31 = puVar15[uVar26];
                        uVar3 = *(uint *)(lVar19 + lVar44 * 4);
                      } while (puVar15[uVar26] < uVar26);
                      do {
                        uVar31 = uVar3;
                        uVar3 = puVar15[uVar31];
                      } while (puVar15[uVar31] < uVar31);
                    }
                    else {
                      uVar31 = *(uint *)(lVar11 + lVar44 * 4);
                      if (*(char *)(lVar17 + 1 + lVar44) != '\0') goto LAB_0027c3b2;
                      do {
                        uVar26 = uVar31;
                        uVar31 = puVar15[uVar26];
                        uVar3 = *(uint *)(lVar12 + lVar52 * 4 + lVar35 * 4);
                      } while (puVar15[uVar26] < uVar26);
                      do {
                        uVar31 = uVar3;
                        uVar3 = puVar15[uVar31];
                      } while (puVar15[uVar31] < uVar31);
                    }
                  }
                  goto LAB_0027cb6d;
                }
LAB_0027cdff:
                uVar36 = (ulong)uVar31;
                if (iVar37 < (int)uVar31) goto LAB_0027ce16;
                lVar38 = (long)(int)uVar31;
                if (*(char *)(lVar10 + lVar38) == '\0') {
                  if (*(char *)((long)iVar24 + 3 + lVar10) == '\0') {
LAB_0027d10b:
                    *(undefined4 *)(lVar19 + lVar38 * 4) = 0;
                    return;
                  }
                  if (*(char *)(lVar23 + 3 + (long)iVar24) == '\0') {
                    UF::P_[UF::length_] = UF::length_;
                    uVar31 = UF::length_;
LAB_0027d2af:
                    UF::length_ = uVar31 + 1;
                    *(uint *)(lVar19 + lVar38 * 4) = uVar31;
                    return;
                  }
                  uVar29 = *(undefined4 *)(lVar11 + lVar38 * 4);
                  goto LAB_0027d1ed;
                }
                lVar10 = (long)iVar24;
                if (*(char *)(lVar23 + 3 + lVar10) == '\0') {
LAB_0027cfc8:
                  uVar29 = *(undefined4 *)(lVar19 + lVar10 * 4);
                  goto LAB_0027d1ed;
                }
                if (*(char *)(lVar17 + lVar38) == '\0') {
                  uVar31 = *(uint *)(lVar11 + lVar38 * 4);
                  do {
                    uVar26 = uVar31;
                    uVar31 = UF::P_[uVar26];
                    uVar3 = *(uint *)(lVar19 + lVar10 * 4);
                  } while (UF::P_[uVar26] < uVar26);
                  do {
                    uVar31 = uVar3;
                    uVar3 = UF::P_[uVar31];
                  } while (UF::P_[uVar31] < uVar31);
                }
                else {
                  if (*(char *)(lVar23 + lVar10) != '\0') {
                    uVar31 = *(uint *)(lVar11 + lVar10 * 4);
                    if (*(char *)(lVar17 + 1 + lVar10) == '\0') {
                      do {
                        uVar26 = uVar31;
                        uVar31 = UF::P_[uVar26];
                        uVar3 = *(uint *)(lVar11 + lVar38 * 4);
                      } while (UF::P_[uVar26] < uVar26);
                      do {
                        uVar31 = uVar3;
                        uVar3 = UF::P_[uVar31];
                      } while (UF::P_[uVar31] < uVar31);
                      goto LAB_0027d267;
                    }
                    goto LAB_0027d274;
                  }
                  uVar31 = *(uint *)(lVar11 + lVar38 * 4);
                  do {
                    uVar26 = uVar31;
                    uVar31 = UF::P_[uVar26];
                    uVar3 = *(uint *)(lVar19 + lVar10 * 4);
                  } while (UF::P_[uVar26] < uVar26);
                  do {
                    uVar31 = uVar3;
                    uVar3 = UF::P_[uVar31];
                  } while (UF::P_[uVar31] < uVar31);
                }
                goto LAB_0027d267;
              }
              if (*(char *)(lVar17 + 3 + lVar21) == '\0') {
                uVar31 = *(uint *)(lVar11 + (long)(iVar24 + 4) * 4);
                do {
                  uVar26 = uVar31;
                  uVar31 = puVar15[uVar26];
                  uVar3 = *(uint *)(lVar19 + lVar21 * 4);
                } while (puVar15[uVar26] < uVar26);
                do {
                  uVar31 = uVar3;
                  uVar3 = puVar15[uVar31];
                } while (puVar15[uVar31] < uVar31);
                goto LAB_0027cb6d;
              }
              if (*(char *)(lVar23 + uVar36) != '\0') {
                uVar31 = *(uint *)(lVar11 + uVar36 * 4);
                goto LAB_0027cb7b;
              }
              if (*(char *)(lVar17 + uVar36) != '\0') {
LAB_0027caa7:
                uVar31 = *(uint *)(lVar11 + lVar21 * 4);
                goto LAB_0027cb7b;
              }
              uVar31 = *(uint *)(lVar11 + uVar36 * 4);
              do {
                uVar26 = uVar31;
                uVar31 = puVar15[uVar26];
                uVar3 = *(uint *)(lVar19 + lVar21 * 4);
              } while (puVar15[uVar26] < uVar26);
              do {
                uVar31 = uVar3;
                uVar3 = puVar15[uVar31];
              } while (puVar15[uVar31] < uVar31);
            }
            goto LAB_0027cb6d;
          }
LAB_0027cd2f:
          if (iVar37 < (int)uVar36) {
LAB_0027ce16:
            lVar38 = (long)(int)uVar36;
            if (*(char *)(lVar10 + lVar38) != '\0') {
              *(undefined4 *)(lVar19 + lVar38 * 4) = *(undefined4 *)(lVar19 + -8 + lVar38 * 4);
              return;
            }
            *(undefined4 *)(lVar19 + lVar38 * 4) = 0;
            return;
          }
          lVar38 = (long)(int)uVar36;
          lVar27 = (long)iVar24;
          if (*(char *)(lVar10 + lVar38) == '\0') {
            if (*(char *)(lVar10 + 3 + lVar27) == '\0') goto LAB_0027cfdd;
            goto LAB_0027cbe9;
          }
          if (*(char *)(lVar23 + 3 + lVar27) != '\0') goto LAB_0027cbe9;
          uVar29 = *(undefined4 *)(lVar19 + lVar27 * 4);
          goto LAB_0027cbed;
        }
        if (*(char *)(lVar23 + 3 + lVar21) != '\0') {
          uVar31 = *(uint *)(lVar11 + uVar36 * 4);
          goto LAB_0027c7e1;
        }
        if (*(char *)(lVar10 + 3 + lVar21) != '\0') {
          cVar8 = *(char *)(lVar23 + uVar36);
          if (*(char *)(lVar21 + 4 + lVar23) == '\0') goto LAB_0027b921;
          if (cVar8 == '\0') goto LAB_0027b942;
          uVar31 = *(uint *)(lVar11 + uVar36 * 4);
          if (*(char *)(lVar17 + 3 + lVar21) != '\0') goto LAB_0027bf4b;
          do {
            uVar26 = uVar31;
            uVar31 = puVar15[uVar26];
            uVar3 = *(uint *)(lVar11 + 0x10 + lVar21 * 4);
          } while (puVar15[uVar26] < uVar26);
          do {
            uVar31 = uVar3;
            uVar3 = puVar15[uVar31];
          } while (puVar15[uVar31] < uVar31);
          goto LAB_0027b8fe;
        }
        iVar24 = iVar30;
        if (*(char *)(lVar23 + uVar36) == '\0') {
          puVar15[UF::length_] = UF::length_;
          uVar31 = UF::length_;
          UF::length_ = UF::length_ + 1;
        }
        else {
          uVar31 = *(uint *)(lVar11 + uVar36 * 4);
        }
LAB_0027c97c:
        *(uint *)(lVar19 + uVar36 * 4) = uVar31;
        uVar31 = iVar24 + 2;
        uVar33 = (ulong)uVar31;
      } while ((int)uVar31 < iVar37);
    }
    lVar38 = (long)(int)uVar31;
    if (iVar37 < (int)uVar31) {
      if (*(char *)(lVar10 + lVar38) == '\0') {
LAB_0027cfdd:
        *(undefined4 *)(lVar19 + lVar38 * 4) = 0;
        return;
      }
    }
    else {
      if (*(char *)(lVar10 + lVar38) == '\0') {
        if (*(char *)((long)iVar24 + 3 + lVar10) == '\0') goto LAB_0027cfdd;
        cVar8 = *(char *)(lVar23 + 3 + (long)iVar24);
      }
      else {
        cVar8 = *(char *)(lVar23 + 3 + (long)iVar24);
      }
      if (cVar8 != '\0') goto LAB_0027cbe9;
    }
    if (*(char *)(lVar23 + lVar38) == '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar31 = UF::length_ + 1;
      *(uint *)(lVar19 + lVar38 * 4) = UF::length_;
      UF::length_ = uVar31;
      return;
    }
LAB_0027cbe9:
    uVar29 = *(undefined4 *)(lVar11 + lVar38 * 4);
LAB_0027cbed:
    *(undefined4 *)(lVar19 + lVar38 * 4) = uVar29;
    return;
  }
  lVar19 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar38 = (long)(int)uVar3 + -2;
  iVar37 = (int)lVar38;
  if (2 < (int)uVar3) {
    iVar30 = -2;
    iVar24 = 0;
LAB_00271014:
    lVar27 = (long)iVar24;
    if (*(char *)(lVar10 + lVar27) == '\0') {
      if (*(char *)(lVar10 + 3 + (long)iVar30) != '\0') {
        puVar15[UF::length_] = UF::length_;
        uVar31 = UF::length_ + 1;
        *(uint *)(lVar19 + lVar27 * 4) = UF::length_;
        UF::length_ = uVar31;
        goto LAB_00271071;
      }
      uVar29 = 0;
      goto LAB_002710e7;
    }
    cVar8 = *(char *)(lVar10 + 3 + (long)iVar30);
    puVar15[UF::length_] = UF::length_;
    uVar31 = UF::length_ + 1;
    *(uint *)(lVar19 + lVar27 * 4) = UF::length_;
    UF::length_ = uVar31;
    iVar30 = iVar24;
    if (cVar8 == '\0') goto LAB_002710ee;
LAB_00271071:
    iVar30 = iVar24 + 2;
    if (iVar30 < iVar37) {
      lVar27 = (long)iVar30;
      do {
        iVar30 = iVar24;
        lVar32 = (long)iVar30;
        if (*(char *)(lVar10 + lVar27) == '\0') {
          if (*(char *)(lVar10 + 3 + lVar32) == '\0') {
            iVar24 = iVar30 + 2;
            uVar29 = 0;
            goto LAB_002710e7;
          }
          puVar15[UF::length_] = UF::length_;
          uVar31 = UF::length_;
          UF::length_ = UF::length_ + 1;
        }
        else {
          if (*(char *)(lVar10 + 3 + lVar32) == '\0') goto LAB_002710cf;
          uVar31 = *(uint *)(lVar19 + lVar32 * 4);
        }
        *(uint *)(lVar19 + lVar27 * 4) = uVar31;
        lVar27 = lVar27 + 2;
        iVar24 = iVar30 + 2;
        if (lVar38 <= lVar27) {
          iVar30 = iVar30 + 4;
          break;
        }
      } while( true );
    }
    lVar38 = (long)iVar30;
    if (iVar37 < iVar30) {
      if (*(char *)(lVar10 + lVar38) == '\0') goto LAB_0027d1fe;
      uVar29 = *(undefined4 *)(lVar19 + (long)iVar24 * 4);
    }
    else {
      if (*(char *)(lVar10 + lVar38) == '\0') {
        cVar8 = *(char *)(lVar10 + 3 + (long)iVar24);
        goto joined_r0x002715b7;
      }
      uVar29 = *(undefined4 *)(lVar19 + (long)iVar24 * 4);
    }
    *(undefined4 *)(lVar19 + lVar38 * 4) = uVar29;
    return;
  }
  iVar24 = 0;
  lVar27 = -2;
  goto LAB_002713f6;
LAB_0027126f:
  iVar24 = (int)lVar23 + (int)lVar34;
  *(undefined4 *)(lVar21 + 8 + lVar34 * 4) = *(undefined4 *)(lVar21 + lVar34 * 4);
LAB_0027127e:
  iVar30 = iVar24 + 2;
  if (iVar37 <= iVar30) {
LAB_0027150e:
    lVar27 = (long)iVar30;
    if (iVar37 < iVar30) {
      if (*(char *)(lVar10 + lVar27) == '\0') {
        if (*(char *)(lVar38 + lVar27) == '\0') goto LAB_00271608;
        cVar8 = *(char *)(lVar38 + 1 + (long)iVar24);
      }
      else {
        cVar8 = *(char *)(lVar38 + 1 + (long)iVar24);
      }
      if (cVar8 == '\0') {
        puVar15[UF::length_] = UF::length_;
        goto LAB_002715a2;
      }
      uVar26 = *(uint *)(lVar32 + (long)iVar24 * 4);
      goto LAB_00271665;
    }
    if (*(char *)(lVar10 + lVar27) != '\0') {
      if (*(char *)(lVar38 + 1 + (long)iVar24) == '\0') {
        puVar15[UF::length_] = UF::length_;
        uVar26 = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
      else {
        uVar26 = *(uint *)(lVar32 + (long)iVar24 * 4);
      }
      goto LAB_00271665;
    }
    if (*(char *)(lVar38 + lVar27) == '\0') {
LAB_0027162d:
      if ((*(char *)((long)iVar24 + 3 + lVar10) == '\0') &&
         (*(char *)(lVar38 + 3 + (long)iVar24) == '\0')) {
        uVar26 = 0;
        goto LAB_00271665;
      }
    }
    else if (*(char *)(lVar38 + 1 + (long)iVar24) != '\0') {
      uVar26 = *(uint *)(lVar32 + (long)iVar24 * 4);
      goto LAB_00271665;
    }
    puVar15[UF::length_] = UF::length_;
    goto LAB_002714db;
  }
  lVar23 = (long)iVar24;
  lVar21 = lVar23 + 2;
  lVar47 = (lVar23 << 0x20) + 0x300000000;
  lVar11 = lVar32 + lVar23 * 4;
  lVar34 = lVar27 + 1 + lVar10 + lVar23;
  lVar23 = lVar23 + lVar10 + 2;
  lVar14 = 0;
  while (*(char *)(lVar23 + lVar14) != '\0') {
    if (*(char *)(lVar34 + lVar14) == '\0') {
      if (*(char *)(lVar23 + 1 + lVar14) != '\0') goto LAB_0027139f;
LAB_00271301:
      puVar15[UF::length_] = UF::length_;
      uVar26 = UF::length_;
      UF::length_ = UF::length_ + 1;
    }
    else {
      if (*(char *)(lVar23 + 1 + lVar14) != '\0') goto LAB_00271381;
LAB_002712ee:
      uVar26 = *(uint *)(lVar11 + lVar14 * 4);
    }
    *(uint *)(lVar11 + 8 + lVar14 * 4) = uVar26;
    lVar47 = lVar47 + 0x200000000;
    lVar39 = lVar21 + lVar14;
    lVar14 = lVar14 + 2;
    if ((long)iVar37 <= lVar39 + 2) {
      iVar30 = iVar24 + (int)lVar14 + 2;
      iVar24 = iVar24 + (int)lVar14;
      goto LAB_0027150e;
    }
  }
  if (*(char *)(lVar34 + 1 + lVar14) == '\0') {
    uVar49 = lVar21 + lVar14;
    if ((*(char *)(lVar10 + (lVar47 >> 0x20)) == '\0') &&
       (*(char *)(lVar38 + (lVar47 >> 0x20)) == '\0')) {
      uVar33 = uVar49 & 0xffffffff;
      goto LAB_002713cf;
    }
  }
  else {
    if (*(char *)(lVar23 + 1 + lVar14) == '\0') {
      if (*(char *)(lVar34 + lVar14) == '\0') goto LAB_00271301;
      goto LAB_002712ee;
    }
    if (*(char *)(lVar14 + lVar34) != '\0') {
LAB_00271381:
      uVar49 = lVar21 + lVar14;
      iVar24 = (int)uVar49;
      uVar26 = *(uint *)(lVar11 + lVar14 * 4);
      goto LAB_002711da;
    }
  }
LAB_0027139f:
  uVar49 = lVar21 + lVar14;
  puVar15[UF::length_] = UF::length_;
  iVar24 = (int)uVar49;
  uVar26 = UF::length_;
  UF::length_ = UF::length_ + 1;
  goto LAB_002711da;
LAB_00277818:
  uVar26 = puVar15[iVar24];
  uVar36 = uVar33 & 0xffffffff;
LAB_00278d3d:
  puVar15[uVar33] = uVar26;
  iVar24 = (int)uVar36;
  uVar26 = iVar24 + 2;
  if ((int)uVar26 < iVar37) {
    lVar28 = (long)iVar24;
    lVar12 = lVar28 + 2;
    lVar44 = lVar28 << 0x20;
    lVar17 = lVar14 + lVar28 * 4;
    lVar45 = lVar34 + 8 + lVar17;
    lVar51 = lVar11 + 3 + lVar39 + lVar28;
    lVar35 = lVar11 + lVar23 * lVar27 + lVar28;
    lVar52 = 0;
    lVar42 = 0;
LAB_00278dc9:
    iVar30 = (int)lVar12;
    lVar25 = lVar44 >> 0x1e;
    lVar43 = lVar44 >> 0x20;
    iVar46 = (int)lVar42;
    if (*(char *)(lVar51 + -1 + lVar42) == '\0') {
      if (*(char *)(lVar11 + lVar23 * lVar19 + lVar28 + 2 + lVar42) == '\0') {
        uVar33 = lVar12 + lVar42;
        lVar12 = lVar44 + 0x300000000 >> 0x20;
        uVar26 = (uint)uVar33;
        if (*(char *)(lVar21 + lVar12) == '\0') {
          if (pcVar1[lVar12] == '\0') {
            puVar20 = (uint *)(lVar52 + lVar17 + lVar34 + 8);
            uVar33 = uVar33 & 0xffffffff;
            goto LAB_0027519e;
          }
          UF::P_[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = UF::length_;
          UF::length_ = uVar26;
          uVar33 = uVar33 & 0xffffffff;
          goto LAB_00275d77;
        }
        if (pcVar41[lVar12] != '\0') {
          *(undefined4 *)(lVar45 + lVar42 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          goto LAB_0027a9ca;
        }
        lVar12 = lVar44 + 0x400000000 >> 0x20;
        if (pcVar41[lVar12] == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = UF::length_;
          UF::length_ = uVar26;
          uVar33 = uVar33 & 0xffffffff;
          goto LAB_00276eae;
        }
        *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = puVar16[lVar12];
LAB_0027a68f:
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002775c6;
      }
      if (*(char *)(lVar51 + lVar42) == '\0') {
        *(undefined4 *)(lVar17 + lVar34 + 8 + lVar42 * 4) = *(undefined4 *)((long)puVar15 + lVar25);
        uVar33 = (ulong)(uint)(iVar30 + iVar46);
        goto LAB_00277c1d;
      }
      if (*(char *)(lVar35 + 3 + lVar42) != '\0') {
        uVar33 = lVar12 + lVar42;
        uVar26 = (uint)uVar33;
        if (*(char *)(lVar42 + 2 + lVar23 * lVar32 + lVar28 + lVar11) == '\0') {
          uVar18 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          do {
            uVar13 = uVar18;
            uVar18 = UF::P_[uVar13];
            uVar9 = *(uint *)((long)puVar15 + lVar25);
          } while (UF::P_[uVar13] < uVar13);
          do {
            uVar18 = uVar9;
            uVar9 = UF::P_[uVar18];
          } while (UF::P_[uVar18] < uVar18);
        }
        else {
          if (pcVar41[lVar43] != '\0') {
            if (pcVar41[lVar43 + (1 - lVar23)] == '\0') {
              uVar26 = puVar16[lVar43];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              uVar18 = uVar26;
              if (uVar9 >= uVar26 && uVar9 != uVar26) {
                uVar18 = uVar9;
              }
              if (uVar9 < uVar26) {
                uVar26 = uVar9;
              }
              UF::P_[uVar18] = uVar26;
              *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = uVar26;
              uVar33 = uVar33 & 0xffffffff;
              goto LAB_00271a79;
            }
            *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = puVar16[lVar43];
            goto LAB_00278070;
          }
          uVar18 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          do {
            uVar13 = uVar18;
            uVar18 = UF::P_[uVar13];
            uVar9 = puVar15[lVar43];
          } while (UF::P_[uVar13] < uVar13);
          do {
            uVar18 = uVar9;
            uVar9 = UF::P_[uVar18];
          } while (UF::P_[uVar18] < uVar18);
        }
        uVar9 = uVar18;
        if (uVar18 < uVar13) {
          uVar9 = uVar13;
        }
        if (uVar13 < uVar18) {
          uVar18 = uVar13;
        }
        UF::P_[uVar9] = uVar18;
        *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = uVar18;
LAB_0027a9ca:
        uVar33 = (ulong)uVar26;
        goto LAB_00271a79;
      }
      if (*(char *)(lVar35 + 4 + lVar42) != '\0') {
        lVar12 = lVar23 * lVar32 + lVar28 + lVar11;
        if (*(char *)(lVar42 + 3 + lVar12) == '\0') {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 0x10 + lVar42 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)((long)puVar15 + lVar25);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else if (*(char *)(lVar42 + 2 + lVar12) == '\0') {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)((long)puVar15 + lVar25);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          if (pcVar41[lVar43] != '\0') {
            uVar26 = puVar16[lVar43];
            if (pcVar41[lVar43 + (1 - lVar23)] != '\0') goto LAB_002796c5;
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_0027b1a0;
          }
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar43];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        goto LAB_0027ae7e;
      }
    }
    else {
      if (*(char *)(lVar35 + 3 + lVar42) != '\0') {
        uVar33 = lVar12 + lVar42;
        if (*(char *)(lVar42 + 2 + lVar23 * lVar32 + lVar28 + lVar11) == '\0') {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)((long)puVar15 + lVar25);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          if (pcVar41[lVar43] != '\0') {
            if (pcVar41[lVar43 + (1 - lVar23)] == '\0') {
              uVar26 = puVar16[lVar43];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              uVar18 = uVar26;
              if (uVar9 >= uVar26 && uVar9 != uVar26) {
                uVar18 = uVar9;
              }
              if (uVar9 < uVar26) {
                uVar26 = uVar9;
              }
              UF::P_[uVar18] = uVar26;
              *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = uVar26;
              uVar33 = uVar33 & 0xffffffff;
            }
            else {
              *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = puVar16[lVar43];
LAB_00278210:
              uVar33 = uVar33 & 0xffffffff;
            }
            goto LAB_0027178d;
          }
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar43];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        uVar18 = uVar26;
        if (uVar26 < uVar9) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = uVar26;
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_0027178d;
      }
      if (*(char *)(lVar51 + lVar42) == '\0') goto LAB_00278fe6;
      if (*(char *)(lVar35 + 4 + lVar42) != '\0') {
        lVar12 = lVar23 * lVar32 + lVar28 + lVar11;
        if (*(char *)(lVar42 + 3 + lVar12) == '\0') {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 0x10 + lVar42 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)((long)puVar15 + lVar25);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else if (*(char *)(lVar42 + 2 + lVar12) == '\0') {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)((long)puVar15 + lVar25);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          if (pcVar41[lVar43] != '\0') {
            uVar26 = puVar16[lVar43];
            if (pcVar41[lVar43 + (1 - lVar23)] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
LAB_0027b1a0:
              uVar18 = uVar26;
              if (uVar26 < uVar9) {
                uVar18 = uVar9;
              }
              if (uVar9 < uVar26) {
                uVar26 = uVar9;
              }
              UF::P_[uVar18] = uVar26;
              *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = uVar26;
              uVar33 = (ulong)(uint)(iVar30 + iVar46);
            }
            else {
LAB_002796c5:
              *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = uVar26;
              uVar33 = (ulong)(uint)(iVar30 + iVar46);
            }
            goto LAB_002775c6;
          }
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar28 * 4 + lVar34 + 8 + lVar42 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar43];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
LAB_0027ae7e:
        uVar18 = uVar26;
        if (uVar26 < uVar9) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        *(uint *)(lVar17 + lVar34 + 8 + lVar42 * 4) = uVar26;
        uVar33 = (ulong)(uint)(iVar30 + iVar46);
        goto LAB_002775c6;
      }
    }
    *(undefined4 *)(lVar45 + lVar42 * 4) = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
    lVar44 = lVar44 + 0x200000000;
    lVar52 = lVar52 + 8;
    lVar25 = lVar12 + lVar42;
    lVar42 = lVar42 + 2;
    if (lVar10 <= lVar25 + 2) {
      iVar24 = iVar24 + (int)lVar42;
      uVar26 = iVar30 + (int)lVar42;
      goto LAB_00278e74;
    }
    goto LAB_00278dc9;
  }
LAB_00278e74:
  uVar49 = (ulong)uVar26;
  uVar36 = uVar49;
  if (iVar37 < (int)uVar26) goto LAB_00277957;
  if (*(char *)(lVar21 + uVar49) == '\0') {
    uVar33 = (ulong)(iVar24 + 3);
    cVar8 = *(char *)(lVar21 + uVar33);
    if (pcVar1[uVar49] == '\0') {
joined_r0x00277376:
      if (cVar8 == '\0') {
LAB_002797ab:
        cVar8 = pcVar1[uVar33];
        goto joined_r0x00273029;
      }
      cVar8 = pcVar41[uVar33];
joined_r0x00279421:
      if (cVar8 == '\0') goto LAB_00279cfe;
LAB_002795d8:
      uVar26 = puVar16[uVar49];
      goto LAB_002795db;
    }
    if ((cVar8 == '\0') || (pcVar41[uVar33] == '\0')) {
LAB_00278f6a:
      lVar21 = (long)iVar24;
      goto LAB_00278f6d;
    }
    if (pcVar41[uVar49 - lVar23] == '\0') {
      uVar26 = puVar16[uVar49];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[iVar24];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    else if (pcVar41[iVar24] == '\0') {
      uVar26 = puVar16[uVar49];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[iVar24];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    else {
      uVar26 = puVar16[iVar24];
      if (pcVar41[(long)iVar24 + (1 - lVar23)] != '\0') goto LAB_0027b41f;
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar16[uVar49];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
  }
  else {
    lVar21 = (long)iVar24;
    if (pcVar41[lVar21 + 3] == '\0') {
LAB_00278f6d:
      uVar26 = puVar15[lVar21];
      goto LAB_002795db;
    }
    if (pcVar41[uVar49 - lVar23] == '\0') {
      uVar26 = puVar16[uVar49];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[lVar21];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    else {
      if (pcVar41[lVar21] != '\0') {
        uVar26 = puVar16[lVar21];
        if (pcVar41[lVar21 + (1 - lVar23)] == '\0') {
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar49];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027b412;
        }
        goto LAB_0027b41f;
      }
      uVar26 = puVar16[uVar49];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[lVar21];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
  }
  goto LAB_0027b412;
LAB_00278fe6:
  uVar33 = lVar12 + lVar42;
  uVar26 = *(uint *)((long)puVar15 + lVar25);
  uVar36 = uVar33 & 0xffffffff;
LAB_00279017:
  puVar15[uVar33] = uVar26;
  iVar24 = (int)uVar36;
  lVar12 = (long)iVar24;
  uVar33 = lVar12 + 2;
  if (iVar37 <= (int)uVar33) {
    uVar49 = uVar33 & 0xffffffff;
    if (iVar37 < (int)uVar33) {
      if (*(char *)(lVar21 + uVar49) == '\0') {
        if (pcVar1[uVar49] == '\0') goto LAB_002797b5;
LAB_00279cee:
        if (pcVar1[lVar12 + 1] == '\0') goto LAB_00279cfe;
      }
      else {
        cVar8 = pcVar41[uVar49];
        if (pcVar1[iVar24 + 1] == '\0') goto joined_r0x00279421;
        if (cVar8 != '\0') {
          if (pcVar41[lVar12] != '\0') {
            uVar26 = puVar16[lVar12];
            if (pcVar41[(ulong)(iVar24 + 1) - lVar23] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[uVar49];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_0027b412;
            }
            goto LAB_0027b41f;
          }
          uVar26 = puVar16[uVar49];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar12];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027b412;
        }
      }
LAB_00279cf5:
      uVar26 = puVar15[lVar12];
      goto LAB_002795db;
    }
    if (*(char *)(lVar21 + uVar49) != '\0') {
      uVar33 = (ulong)(iVar24 + 1);
      cVar8 = pcVar41[lVar12 + 3];
      if (pcVar1[uVar33] == '\0') {
joined_r0x0027942e:
        if (cVar8 == '\0') {
          bVar53 = pcVar41[uVar49] == '\0';
          goto LAB_0027839b;
        }
        goto LAB_002795d8;
      }
      if (cVar8 == '\0') {
        if (pcVar41[uVar49] == '\0') goto LAB_00279cf5;
        if (pcVar41[lVar12] == '\0') {
          uVar26 = puVar16[uVar49];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar12];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          uVar26 = puVar16[lVar12];
          if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_0027b41f;
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar49];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
      }
      else if (pcVar41[lVar12] == '\0') {
        uVar26 = puVar16[uVar49];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar12];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else {
        if (pcVar41[uVar33 - lVar23] != '\0') {
          if (pcVar41[uVar49] == '\0') {
            uVar26 = puVar16[lVar12];
            if (pcVar41[uVar49 - lVar23] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[uVar49];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_0027b412;
            }
            goto LAB_0027b41f;
          }
LAB_00279165:
          uVar26 = puVar16[lVar12];
          goto LAB_002795db;
        }
        uVar26 = puVar16[lVar12];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar49];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      goto LAB_0027b412;
    }
    uVar33 = (ulong)(iVar24 + 3);
    cVar8 = *(char *)(lVar21 + uVar33);
    if (pcVar1[uVar49] == '\0') {
joined_r0x002797a0:
      if (cVar8 == '\0') goto LAB_002797ab;
      cVar8 = pcVar41[uVar33];
    }
    else {
      if (cVar8 == '\0') goto LAB_00279cee;
      uVar36 = (ulong)(iVar24 + 1);
      cVar8 = pcVar41[uVar33];
      if (pcVar1[uVar36] != '\0') {
        if (cVar8 == '\0') {
          if (pcVar41[uVar49] == '\0') goto LAB_00279cf5;
          if (pcVar41[lVar12] == '\0') {
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar12];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else {
            uVar26 = puVar16[lVar12];
            if (pcVar41[uVar36 - lVar23] != '\0') goto LAB_0027b41f;
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[uVar49];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
        }
        else if (pcVar41[lVar12] == '\0') {
          uVar26 = puVar16[uVar49];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar12];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          if (pcVar41[uVar36 - lVar23] != '\0') {
            if (pcVar41[uVar49] != '\0') goto LAB_00279165;
            uVar26 = puVar16[lVar12];
            if (pcVar41[uVar49 - lVar23] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[uVar49];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_0027b412;
            }
            goto LAB_0027b41f;
          }
          uVar26 = puVar16[lVar12];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar49];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        goto LAB_0027b412;
      }
    }
    if (cVar8 != '\0') goto LAB_002795d8;
    bVar53 = pcVar41[uVar49] == '\0';
LAB_0027839b:
    if (bVar53) goto LAB_00279cfe;
    goto LAB_002795d8;
  }
  if (*(char *)(lVar21 + uVar33) == '\0') {
    cVar8 = *(char *)(lVar12 + 3 + lVar21);
    if (pcVar1[lVar12 + 2] == '\0') {
      if (cVar8 == '\0') {
        if (pcVar1[lVar12 + 3] != '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          puVar15[lVar12 + 2] = UF::length_;
          UF::length_ = uVar26;
          goto LAB_00275d77;
        }
        goto LAB_00279c49;
      }
      if (pcVar41[lVar12 + 3] != '\0') {
LAB_00279a76:
        puVar15[lVar12 + 2] = puVar16[lVar12 + 2];
        goto LAB_00271a79;
      }
      cVar8 = pcVar41[lVar12 + 2];
      if (pcVar41[lVar12 + 4] == '\0') {
LAB_0027a937:
        if (cVar8 == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          puVar15[lVar12 + 2] = UF::length_;
          UF::length_ = uVar26;
          goto LAB_00276eae;
        }
        puVar15[lVar12 + 2] = puVar16[lVar12 + 2];
        goto LAB_002778d2;
      }
      if (cVar8 == '\0') {
LAB_0027a94d:
        uVar26 = puVar16[lVar12 + 4];
LAB_0027a951:
        puVar15[lVar12 + 2] = uVar26;
        goto LAB_002775c6;
      }
      uVar26 = puVar16[lVar12 + 2];
      if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[lVar12 + 4];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
LAB_0027b59d:
        uVar18 = uVar26;
        if (uVar26 < uVar9) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        puVar15[lVar12 + 2] = uVar26;
        goto LAB_002775c6;
      }
    }
    else {
      if (cVar8 == '\0') {
        if (pcVar1[lVar12 + 1] != '\0') {
          puVar15[lVar12 + 2] = puVar15[lVar12];
          goto LAB_00277c1d;
        }
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        puVar15[lVar12 + 2] = UF::length_;
        UF::length_ = uVar26;
        goto LAB_00277c1d;
      }
      if (pcVar1[lVar12 + 1] != '\0') {
        if (pcVar41[lVar12 + 3] != '\0') {
          if (pcVar41[lVar12] == '\0') {
            uVar26 = puVar16[lVar12 + 2];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar12];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
            uVar26 = puVar16[lVar12];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[lVar12 + 2];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else {
            if (pcVar41[uVar33] != '\0') {
              puVar15[lVar12 + 2] = puVar16[lVar12];
              goto LAB_00271a79;
            }
            uVar26 = puVar16[lVar12];
            if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_0027ac20;
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[lVar12 + 2];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          uVar18 = uVar26;
          if (uVar26 < uVar9) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
LAB_0027ac20:
          puVar15[lVar12 + 2] = uVar26;
          goto LAB_00271a79;
        }
        if (pcVar41[lVar12 + 4] == '\0') {
          if (pcVar41[lVar12 + 2] == '\0') {
LAB_0027ad8a:
            puVar15[lVar12 + 2] = puVar15[lVar12];
            goto LAB_00276eae;
          }
          if (pcVar41[lVar12] == '\0') {
            uVar26 = puVar16[lVar12 + 2];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar12];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else {
            uVar26 = puVar16[lVar12];
            if (pcVar41[lVar12 + (1 - lVar23)] != '\0') {
LAB_0027ad80:
              puVar15[lVar12 + 2] = uVar26;
              goto LAB_002778d2;
            }
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[lVar12 + 2];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
LAB_0027b5d8:
          uVar18 = uVar26;
          if (uVar26 < uVar9) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          puVar15[lVar12 + 2] = uVar26;
LAB_002778d2:
          iVar24 = (int)uVar33;
          lVar12 = (long)iVar24;
          uVar33 = lVar12 + 2;
          if (iVar37 <= (int)uVar33) {
            if (iVar37 < (int)uVar33) {
              uVar36 = uVar33 & 0xffffffff;
              goto LAB_00277957;
            }
            uVar49 = uVar33 & 0xffffffff;
            puVar20 = UF::P_;
            if (*(char *)(lVar21 + uVar49) != '\0') {
              if (pcVar41[lVar12 + 3] != '\0') {
                if (pcVar41[uVar49 - lVar23] == '\0') {
                  uVar26 = puVar16[uVar49];
                  do {
                    uVar18 = uVar26;
                    uVar26 = UF::P_[uVar18];
                    uVar9 = puVar15[lVar12];
                  } while (UF::P_[uVar18] < uVar18);
                  do {
                    uVar26 = uVar9;
                    uVar9 = UF::P_[uVar26];
                  } while (UF::P_[uVar26] < uVar26);
LAB_002783da:
                  uVar9 = uVar26;
                  if (uVar26 < uVar18) {
                    uVar9 = uVar18;
                  }
                  if (uVar18 < uVar26) {
                    uVar26 = uVar18;
                  }
                  puVar20[uVar9] = uVar26;
LAB_002783e7:
                  puVar15[uVar49] = uVar26;
                  goto LAB_0027b423;
                }
                uVar26 = puVar16[lVar12];
                if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
                  do {
                    uVar9 = uVar26;
                    uVar26 = UF::P_[uVar9];
                    uVar18 = puVar16[uVar49];
                  } while (UF::P_[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = UF::P_[uVar26];
                  } while (UF::P_[uVar26] < uVar26);
                  goto LAB_0027b412;
                }
                goto LAB_0027b41f;
              }
LAB_00277b4d:
              uVar26 = puVar15[lVar12];
              goto LAB_002795db;
            }
            uVar33 = (ulong)(iVar24 + 3);
            if (pcVar1[uVar49] == '\0') {
              if (*(char *)(lVar21 + uVar33) != '\0') {
                cVar8 = pcVar41[uVar33];
                goto joined_r0x00279421;
              }
              cVar8 = pcVar1[uVar33];
              goto joined_r0x00273029;
            }
            if ((*(char *)(lVar21 + uVar33) == '\0') || (pcVar41[uVar33] == '\0'))
            goto LAB_00277b4d;
            if (pcVar41[uVar49 - lVar23] == '\0') {
              uVar26 = puVar16[uVar49];
              do {
                uVar18 = uVar26;
                uVar26 = UF::P_[uVar18];
                uVar9 = puVar15[lVar12];
              } while (UF::P_[uVar18] < uVar18);
              do {
                uVar26 = uVar9;
                uVar9 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_002783da;
            }
            uVar26 = puVar16[lVar12];
            if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[uVar49];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_0027b412;
            }
            goto LAB_0027b41f;
          }
          if (*(char *)(lVar21 + uVar33) != '\0') {
            if (pcVar41[lVar12 + 3] != '\0') {
              if (pcVar41[uVar33 - lVar23] == '\0') {
                uVar26 = puVar16[lVar12 + 2];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar15[lVar12];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
              }
              else {
                if (pcVar41[lVar12 + (1 - lVar23)] != '\0') {
                  puVar15[lVar12 + 2] = puVar16[lVar12];
                  goto LAB_0027178d;
                }
                uVar26 = puVar16[lVar12];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar12 + 2];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
              }
              uVar18 = uVar26;
              if (uVar26 < uVar9) {
                uVar18 = uVar9;
              }
              if (uVar9 < uVar26) {
                uVar26 = uVar9;
              }
              UF::P_[uVar18] = uVar26;
              puVar15[lVar12 + 2] = uVar26;
              goto LAB_0027178d;
            }
            if (*(char *)(lVar21 + 3 + lVar12) == '\0') {
              uVar26 = puVar15[lVar12];
LAB_00278356:
              uVar36 = uVar33 & 0xffffffff;
              goto LAB_00279017;
            }
            if (pcVar41[lVar12 + 4] == '\0') {
              uVar26 = puVar15[lVar12];
LAB_002786bb:
              uVar36 = uVar33 & 0xffffffff;
              goto LAB_00278d3d;
            }
            if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
              uVar26 = puVar16[lVar12 + 4];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar15[lVar12];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
            }
            else {
              if (pcVar41[uVar33 - lVar23] != '\0') {
                uVar26 = puVar16[lVar12];
                if (pcVar41[lVar12 + (1 - lVar23)] != '\0') goto LAB_002786a2;
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar12 + 2];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_0027a8c1;
              }
              uVar26 = puVar16[lVar12 + 2];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar15[lVar12];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
            }
LAB_0027a210:
            uVar18 = uVar26;
            if (uVar26 < uVar9) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            puVar15[lVar12 + 2] = uVar26;
            goto LAB_002775c6;
          }
          cVar8 = *(char *)(lVar12 + 3 + lVar21);
          if (pcVar1[lVar12 + 2] == '\0') {
            if (cVar8 == '\0') {
              if (pcVar1[lVar12 + 3] == '\0') {
                puVar20 = puVar15 + uVar33;
                goto LAB_0027519e;
              }
              UF::P_[UF::length_] = UF::length_;
              uVar26 = UF::length_ + 1;
              puVar15[lVar12 + 2] = UF::length_;
              UF::length_ = uVar26;
              uVar33 = uVar33 & 0xffffffff;
              goto LAB_00275d77;
            }
            if (pcVar41[lVar12 + 3] == '\0') {
              if (pcVar41[lVar12 + 4] == '\0') {
                UF::P_[UF::length_] = UF::length_;
                uVar26 = UF::length_ + 1;
                puVar15[lVar12 + 2] = UF::length_;
                UF::length_ = uVar26;
                goto LAB_00279c7f;
              }
              puVar15[lVar12 + 2] = puVar16[lVar12 + 4];
              goto LAB_002775c6;
            }
            puVar15[lVar12 + 2] = puVar16[lVar12 + 2];
          }
          else {
            if (cVar8 == '\0') {
              puVar15[lVar12 + 2] = puVar15[lVar12];
              goto LAB_00277c1d;
            }
            if (pcVar41[lVar12 + 3] == '\0') {
              if (pcVar41[lVar12 + 4] != '\0') {
                if (pcVar41[lVar12 + (3 - lVar23)] != '\0') {
                  if (pcVar41[uVar33 - lVar23] == '\0') {
                    uVar26 = puVar16[lVar12 + 2];
                    do {
                      uVar9 = uVar26;
                      uVar26 = UF::P_[uVar9];
                      uVar18 = puVar15[lVar12];
                    } while (UF::P_[uVar9] < uVar9);
                    do {
                      uVar26 = uVar18;
                      uVar18 = UF::P_[uVar26];
                    } while (UF::P_[uVar26] < uVar26);
                    goto LAB_0027a210;
                  }
                  uVar26 = puVar16[lVar12];
                  if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
                    do {
                      uVar9 = uVar26;
                      uVar26 = UF::P_[uVar9];
                      uVar18 = puVar16[lVar12 + 2];
                    } while (UF::P_[uVar9] < uVar9);
                    do {
                      uVar26 = uVar18;
                      uVar18 = UF::P_[uVar26];
                    } while (UF::P_[uVar26] < uVar26);
LAB_0027a8c1:
                    uVar18 = uVar26;
                    if (uVar26 < uVar9) {
                      uVar18 = uVar9;
                    }
                    if (uVar9 < uVar26) {
                      uVar26 = uVar9;
                    }
                    UF::P_[uVar18] = uVar26;
                    puVar15[lVar12 + 2] = uVar26;
                  }
                  else {
LAB_002786a2:
                    puVar15[lVar12 + 2] = uVar26;
                  }
                  goto LAB_002775c6;
                }
                uVar26 = puVar16[lVar12 + 4];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar15[lVar12];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_0027a210;
              }
              uVar26 = puVar15[lVar12];
LAB_00278d3a:
              uVar36 = uVar33 & 0xffffffff;
              goto LAB_00278d3d;
            }
            if (pcVar41[uVar33 - lVar23] == '\0') {
              uVar26 = puVar16[lVar12 + 2];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar15[lVar12];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
            }
            else {
              if (pcVar41[lVar12 + (1 - lVar23)] != '\0') {
                puVar15[lVar12 + 2] = puVar16[lVar12];
                goto LAB_00271a79;
              }
              uVar26 = puVar16[lVar12];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[lVar12 + 2];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
            }
            uVar18 = uVar26;
            if (uVar26 < uVar9) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            puVar15[lVar12 + 2] = uVar26;
          }
LAB_00271a79:
          puVar20 = UF::P_;
          uVar26 = (int)uVar33 + 2;
          uVar36 = (ulong)uVar26;
          if (iVar37 <= (int)uVar26) {
LAB_00271b9e:
            iVar24 = (int)uVar33;
            if (iVar37 < (int)uVar36) goto LAB_00277957;
            uVar49 = uVar36 & 0xffffffff;
            if (*(char *)(lVar21 + uVar49) != '\0') {
              lVar21 = (long)iVar24;
              if (pcVar41[lVar21 + 3] == '\0') goto LAB_002777ae;
              if (pcVar41[uVar49] != '\0') goto LAB_002795d8;
              if (pcVar41[uVar49 - lVar23] == '\0') {
                uVar26 = puVar16[uVar49];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar15[lVar21];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_0027b412;
              }
LAB_00271ebd:
              uVar26 = puVar16[lVar21];
              goto LAB_002795db;
            }
            uVar33 = (ulong)(iVar24 + 3);
            cVar8 = *(char *)(lVar21 + uVar33);
            if (pcVar1[uVar49] == '\0') {
LAB_00272477:
              if (cVar8 == '\0') goto LAB_00277850;
              if (pcVar41[uVar33] != '\0') goto LAB_002795d8;
              bVar53 = pcVar41[uVar49] == '\0';
              goto LAB_0027839b;
            }
            if ((cVar8 == '\0') || (pcVar41[uVar33] == '\0')) goto LAB_002777ab;
            if (pcVar41[uVar49] != '\0') goto LAB_0027777f;
            if (pcVar41[uVar49 - lVar23] != '\0') {
LAB_0027236e:
              uVar26 = puVar16[iVar24];
              goto LAB_002777b2;
            }
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[iVar24];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_0027b412;
          }
          lVar17 = (long)(int)uVar33;
          uVar36 = lVar17 + 2;
LAB_00271a97:
          uVar33 = uVar36;
          iVar24 = (int)lVar17;
          if (*(char *)(lVar21 + uVar33) != '\0') goto LAB_0027213c;
          cVar8 = *(char *)(lVar17 + 3 + lVar21);
          if (pcVar1[uVar33] != '\0') {
            if (cVar8 == '\0') goto LAB_002777c0;
            if (pcVar41[lVar17 + 3] != '\0') {
              if (pcVar41[uVar33] == '\0') {
                if (pcVar41[uVar33 - lVar23] == '\0') {
                  uVar26 = puVar16[uVar33];
                  do {
                    uVar9 = uVar26;
                    uVar26 = puVar20[uVar9];
                    uVar18 = puVar15[lVar17];
                  } while (puVar20[uVar9] < uVar9);
                  do {
                    uVar26 = uVar18;
                    uVar18 = puVar20[uVar26];
                  } while (puVar20[uVar26] < uVar26);
                  uVar18 = uVar26;
                  if (uVar9 >= uVar26 && uVar9 != uVar26) {
                    uVar18 = uVar9;
                  }
                  if (uVar9 < uVar26) {
                    uVar26 = uVar9;
                  }
                  puVar20[uVar18] = uVar26;
                }
                else {
                  uVar26 = puVar16[lVar17];
                }
              }
              else {
                uVar26 = puVar16[uVar33];
              }
LAB_00271b87:
              puVar15[uVar33] = uVar26;
              uVar36 = uVar33 + 2;
              lVar17 = lVar17 + 2;
              if (lVar10 <= (long)uVar36) goto LAB_00271b9e;
              goto LAB_00271a97;
            }
            lVar12 = (lVar17 << 0x20) + 0x400000000 >> 0x20;
            if (pcVar41[lVar12] == '\0') {
              uVar26 = puVar15[iVar24];
              uVar36 = uVar33;
              goto LAB_00278d3d;
            }
            if (pcVar41[lVar17 + (3 - lVar23)] == '\0') {
              uVar26 = puVar16[lVar12];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar15[iVar24];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_0027370e;
            }
            if (pcVar41[uVar33] != '\0') {
              uVar26 = puVar16[uVar33];
              goto LAB_002745f8;
            }
            if (pcVar41[uVar33 - lVar23] != '\0') {
LAB_002745ed:
              lVar12 = (long)iVar24;
              goto LAB_002745f0;
            }
            uVar26 = puVar16[uVar33];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[iVar24];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_0027370e;
          }
          if (cVar8 == '\0') {
            cVar8 = pcVar1[lVar17 + 3];
            goto joined_r0x00272736;
          }
          if (pcVar41[lVar17 + 3] != '\0') {
            uVar26 = puVar16[uVar33];
            goto LAB_00271b87;
          }
          lVar12 = (lVar17 << 0x20) + 0x400000000 >> 0x20;
          cVar8 = pcVar41[uVar33];
          if (pcVar41[lVar12] != '\0') goto code_r0x00272791;
joined_r0x00274eb1:
          if (cVar8 != '\0') goto LAB_0027373a;
          UF::P_[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          puVar15[uVar33] = UF::length_;
          UF::length_ = uVar26;
LAB_00279c7f:
          uVar33 = uVar33 & 0xffffffff;
LAB_00276eae:
          puVar6 = UF::P_;
          iVar24 = (int)uVar33;
          uVar26 = iVar24 + 2;
          if (iVar37 <= (int)uVar26) {
LAB_00277004:
            uVar49 = (ulong)uVar26;
            uVar36 = uVar49;
            if (iVar37 < (int)uVar26) goto LAB_00277957;
            if (*(char *)(lVar21 + uVar49) == '\0') {
              uVar33 = (ulong)(iVar24 + 3);
              cVar8 = *(char *)(lVar21 + uVar33);
              if (pcVar1[uVar49] == '\0') goto joined_r0x00277376;
              if ((cVar8 != '\0') && (pcVar41[uVar33] != '\0')) {
                uVar26 = puVar16[uVar49];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar15[iVar24];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_0027b412;
              }
              goto LAB_00278f6a;
            }
            lVar21 = (long)iVar24;
            if (pcVar41[lVar21 + 3] == '\0') goto LAB_00278f6d;
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar21];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_0027b412;
          }
          lVar51 = (long)iVar24;
          lVar12 = lVar51 + 2;
          lVar28 = lVar51 << 0x20;
          lVar44 = lVar23 * lVar19 + lVar51;
          lVar17 = lVar11 + lVar39 + lVar51;
          lVar35 = lVar11 + lVar23 * lVar27 + lVar51;
          local_80 = lVar51 * 4;
          lVar45 = lVar14 + lVar51 * 4;
          puVar40 = (uint *)(lVar34 + lVar45 + 8);
          lVar52 = 0;
          puVar20 = puVar40;
LAB_00276f52:
          lVar42 = lVar28 >> 0x1e;
          if (*(char *)(lVar17 + 2 + lVar52) == '\0') goto code_r0x00276f5e;
          uVar33 = lVar12 + lVar52;
          lVar17 = lVar28 + 0x300000000 >> 0x20;
          if (pcVar41[lVar17] == '\0') {
            if (*(char *)(lVar21 + lVar17) == '\0') {
              uVar26 = *(uint *)((long)puVar15 + lVar42);
              goto LAB_00278356;
            }
            lVar35 = lVar28 + 0x400000000 >> 0x20;
            if (pcVar41[lVar35] != '\0') {
              if (pcVar41[lVar17 - lVar23] == '\0') {
                uVar26 = puVar16[lVar35];
                do {
                  uVar9 = uVar26;
                  uVar18 = *(uint *)((long)puVar15 + lVar42);
                  uVar26 = UF::P_[uVar9];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
              }
              else {
                uVar26 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar52 * 4);
                do {
                  uVar9 = uVar26;
                  uVar18 = *(uint *)((long)puVar15 + lVar42);
                  uVar26 = UF::P_[uVar9];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
              }
              goto LAB_00277585;
            }
            uVar26 = *(uint *)((long)puVar15 + lVar42);
            goto LAB_002786bb;
          }
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar52 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)((long)puVar15 + lVar42);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar18 = uVar26;
          if (uVar9 >= uVar26 && uVar9 != uVar26) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
          goto LAB_0027178d;
        }
        if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
          if (pcVar41[uVar33] != '\0') {
            if (pcVar41[lVar12] == '\0') {
              uVar26 = puVar16[lVar12 + 2];
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[lVar12 + 4];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              uVar18 = uVar26;
              if (uVar9 >= uVar26 && uVar9 != uVar26) {
                uVar18 = uVar9;
              }
              if (uVar9 < uVar26) {
                uVar26 = uVar9;
              }
              UF::P_[uVar18] = uVar26;
              do {
                uVar18 = uVar26;
                uVar9 = puVar15[lVar12];
                uVar26 = UF::P_[uVar18];
              } while (UF::P_[uVar18] < uVar18);
              do {
                uVar26 = uVar9;
                uVar9 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
            }
            else {
              if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
                uVar26 = puVar16[lVar12];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar12 + 2];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                uVar18 = uVar26;
                if (uVar9 >= uVar26 && uVar9 != uVar26) {
                  uVar18 = uVar9;
                }
                if (uVar9 < uVar26) {
                  uVar26 = uVar9;
                }
                UF::P_[uVar18] = uVar26;
                do {
                  uVar18 = uVar26;
                  uVar9 = puVar16[lVar12 + 4];
                  uVar26 = UF::P_[uVar18];
                } while (UF::P_[uVar18] < uVar18);
                do {
                  uVar26 = uVar9;
                  uVar9 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                uVar36 = (ulong)uVar26;
                if (uVar18 >= uVar26 && uVar18 != uVar26) {
                  uVar36 = (ulong)uVar18;
                }
                if (uVar18 < uVar26) {
                  uVar26 = uVar18;
                }
                UF::P_[uVar36] = uVar26;
                puVar15[lVar12 + 2] = uVar26;
                goto LAB_002775c6;
              }
              uVar26 = puVar16[lVar12];
              do {
                uVar18 = uVar26;
                uVar26 = UF::P_[uVar18];
                uVar9 = puVar16[lVar12 + 4];
              } while (UF::P_[uVar18] < uVar18);
              do {
                uVar26 = uVar9;
                uVar9 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
            }
LAB_0027b658:
            uVar9 = uVar26;
            if (uVar26 < uVar18) {
              uVar9 = uVar18;
            }
            if (uVar18 < uVar26) {
              uVar26 = uVar18;
            }
            UF::P_[uVar9] = uVar26;
            puVar15[lVar12 + 2] = uVar26;
            goto LAB_002775c6;
          }
          uVar26 = puVar16[lVar12 + 4];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar12];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          if (pcVar41[lVar12] == '\0') {
            uVar26 = puVar16[lVar12 + 2];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar12];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_0027b53e;
          }
          if (pcVar41[lVar12 + (1 - lVar23)] != '\0') {
            if (pcVar41[uVar33] == '\0') {
              if (pcVar41[uVar33 - lVar23] == '\0') {
                uVar26 = puVar16[lVar12];
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar12 + 2];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                uVar18 = uVar26;
                if (uVar9 >= uVar26 && uVar9 != uVar26) {
                  uVar18 = uVar9;
                }
                if (uVar9 < uVar26) {
                  uVar26 = uVar9;
                }
                UF::P_[uVar18] = uVar26;
                puVar15[lVar12 + 2] = uVar26;
              }
              else {
                puVar15[lVar12 + 2] = puVar16[lVar12];
              }
            }
            else {
              puVar15[lVar12 + 2] = puVar16[lVar12];
            }
            goto LAB_002775c6;
          }
          uVar26 = puVar16[lVar12];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar12 + 2];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        goto LAB_0027b53e;
      }
      if (pcVar41[lVar12 + 3] != '\0') goto LAB_00279a76;
      cVar8 = pcVar41[lVar12 + 2];
      if (pcVar41[lVar12 + 4] == '\0') goto LAB_0027a937;
      if (cVar8 == '\0') goto LAB_0027a94d;
      uVar26 = puVar16[lVar12 + 2];
      if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[lVar12 + 4];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027b59d;
      }
    }
  }
  else {
    if (pcVar1[lVar12 + 1] != '\0') {
      if (pcVar41[lVar12 + 3] != '\0') {
        if (pcVar41[lVar12] == '\0') {
          uVar26 = puVar16[lVar12 + 2];
          do {
            uVar18 = uVar26;
            uVar26 = UF::P_[uVar18];
            uVar9 = puVar15[lVar12];
          } while (UF::P_[uVar18] < uVar18);
          do {
            uVar26 = uVar9;
            uVar9 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
          uVar26 = puVar16[lVar12];
          do {
            uVar18 = uVar26;
            uVar26 = UF::P_[uVar18];
            uVar9 = puVar16[lVar12 + 2];
          } while (UF::P_[uVar18] < uVar18);
          do {
            uVar26 = uVar9;
            uVar9 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          if (pcVar41[uVar33] != '\0') {
            puVar15[lVar12 + 2] = puVar16[lVar12];
            goto LAB_0027178d;
          }
          uVar26 = puVar16[lVar12];
          if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_00279919;
          do {
            uVar18 = uVar26;
            uVar9 = puVar16[lVar12 + 2];
            uVar26 = UF::P_[uVar18];
          } while (UF::P_[uVar18] < uVar18);
          do {
            uVar26 = uVar9;
            uVar9 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        uVar9 = uVar26;
        if (uVar26 < uVar18) {
          uVar9 = uVar18;
        }
        if (uVar18 < uVar26) {
          uVar26 = uVar18;
        }
        UF::P_[uVar9] = uVar26;
LAB_00279919:
        puVar15[lVar12 + 2] = uVar26;
        goto LAB_0027178d;
      }
      if (*(char *)(lVar21 + 3 + lVar12) == '\0') {
        if (pcVar41[lVar12 + 2] == '\0') {
          puVar15[lVar12 + 2] = puVar15[lVar12];
          goto LAB_002729bc;
        }
        if (pcVar41[lVar12] == '\0') {
          uVar26 = puVar16[lVar12 + 2];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar12];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          uVar26 = puVar16[lVar12];
          if (pcVar41[lVar12 + (1 - lVar23)] != '\0') goto LAB_0027ad54;
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar12 + 2];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        uVar18 = uVar26;
        if (uVar26 < uVar9) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
LAB_0027ad54:
        puVar15[lVar12 + 2] = uVar26;
        goto LAB_00271c6e;
      }
      if (pcVar41[lVar12 + 4] == '\0') {
        if (pcVar41[lVar12 + 2] == '\0') goto LAB_0027ad8a;
        if (pcVar41[lVar12] == '\0') {
          uVar26 = puVar16[lVar12 + 2];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar12];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else {
          uVar26 = puVar16[lVar12];
          if (pcVar41[lVar12 + (1 - lVar23)] != '\0') goto LAB_0027ad80;
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar12 + 2];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        goto LAB_0027b5d8;
      }
      if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
        if (pcVar41[uVar33] != '\0') {
          if (pcVar41[lVar12] == '\0') {
            uVar26 = puVar16[lVar12 + 2];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[lVar12 + 4];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            do {
              uVar18 = uVar26;
              uVar9 = puVar15[lVar12];
              uVar26 = UF::P_[uVar18];
            } while (UF::P_[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
            uVar26 = puVar16[lVar12];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[lVar12 + 2];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            do {
              uVar18 = uVar26;
              uVar9 = puVar16[lVar12 + 4];
              uVar26 = UF::P_[uVar18];
            } while (UF::P_[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else {
            uVar26 = puVar16[lVar12];
            do {
              uVar18 = uVar26;
              uVar26 = UF::P_[uVar18];
              uVar9 = puVar16[lVar12 + 4];
            } while (UF::P_[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          goto LAB_0027b658;
        }
        uVar26 = puVar16[lVar12 + 4];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar12];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else if (pcVar41[lVar12] == '\0') {
        uVar26 = puVar16[lVar12 + 2];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar12];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else {
        if (pcVar41[lVar12 + (1 - lVar23)] != '\0') {
          if (pcVar41[uVar33] == '\0') {
            uVar26 = puVar16[lVar12];
            if (pcVar41[uVar33 - lVar23] == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[lVar12 + 2];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              goto LAB_0027b59d;
            }
            goto LAB_0027b286;
          }
          uVar26 = puVar16[lVar12];
          goto LAB_0027a951;
        }
        uVar26 = puVar16[lVar12];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[lVar12 + 2];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
LAB_0027b53e:
      uVar18 = uVar26;
      if (uVar26 < uVar9) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      puVar15[lVar12 + 2] = uVar26;
      goto LAB_002775c6;
    }
    if (pcVar41[lVar12 + 3] != '\0') {
      puVar15[lVar12 + 2] = puVar16[lVar12 + 2];
      goto LAB_0027178d;
    }
    if (*(char *)(lVar21 + 3 + lVar12) == '\0') {
      if (pcVar41[uVar33] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        puVar15[lVar12 + 2] = UF::length_;
        UF::length_ = uVar26;
        goto LAB_002729bc;
      }
      puVar15[lVar12 + 2] = puVar16[lVar12 + 2];
      goto LAB_00271c6e;
    }
    cVar8 = pcVar41[lVar12 + 2];
    if (pcVar41[lVar12 + 4] == '\0') goto LAB_0027a937;
    if (cVar8 == '\0') goto LAB_0027a94d;
    uVar26 = puVar16[lVar12 + 2];
    if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar16[lVar12 + 4];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      goto LAB_0027b59d;
    }
  }
LAB_0027b286:
  puVar15[lVar12 + 2] = uVar26;
  goto LAB_002775c6;
LAB_0027213c:
  lVar17 = lVar17 << 0x20;
  lVar12 = lVar17 + 0x300000000 >> 0x20;
  if (pcVar41[lVar12] == '\0') {
    if (*(char *)(lVar21 + lVar12) == '\0') {
      uVar26 = *(uint *)((long)puVar15 + (lVar17 >> 0x1e));
      uVar36 = uVar33 & 0xffffffff;
      goto LAB_00279017;
    }
    lVar17 = lVar17 + 0x400000000 >> 0x20;
    if (pcVar41[lVar17] == '\0') {
      uVar26 = puVar15[iVar24];
      goto LAB_00278d3a;
    }
    if (pcVar41[lVar12 - lVar23] == '\0') {
      uVar26 = puVar16[lVar17];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[iVar24];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      puVar15[uVar33] = uVar26;
    }
    else {
      if (pcVar41[uVar33] == '\0') {
        if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_002745ed;
        uVar26 = puVar16[uVar33];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[iVar24];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027370e;
      }
      puVar15[uVar33] = puVar16[uVar33];
    }
    goto LAB_002775c6;
  }
  if (pcVar41[uVar33] == '\0') {
    if (pcVar41[uVar33 - lVar23] == '\0') {
      uVar26 = puVar16[uVar33];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[iVar24];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      puVar15[uVar33] = uVar26;
      goto LAB_0027178d;
    }
    uVar26 = puVar16[iVar24];
  }
  else {
    uVar26 = puVar16[uVar33];
  }
  puVar15[uVar33] = uVar26;
  goto LAB_0027178d;
code_r0x00272791:
  if (cVar8 == '\0') {
LAB_002745f0:
    uVar26 = puVar16[lVar12];
LAB_002745f8:
    puVar15[uVar33] = uVar26;
  }
  else {
    uVar26 = puVar16[uVar33];
    if (pcVar41[lVar17 + (3 - lVar23)] == '\0') {
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar16[lVar12];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      goto LAB_0027370e;
    }
LAB_00274f7c:
    puVar15[uVar33] = uVar26;
  }
  goto LAB_002775c6;
LAB_0027373a:
  uVar26 = puVar16[uVar33];
LAB_00273743:
  puVar15[uVar33] = uVar26;
  uVar33 = uVar33 & 0xffffffff;
  goto LAB_002778d2;
code_r0x00276f5e:
  if (*(char *)(lVar11 + lVar44 + 2 + lVar52) == '\0') {
    if (*(char *)(lVar17 + 3 + lVar52) == '\0') {
      uVar33 = lVar12 + lVar52;
      if (*(char *)(lVar52 + 3 + lVar44 + lVar11) == '\0') goto LAB_0027519e;
      UF::P_[UF::length_] = UF::length_;
      uVar26 = UF::length_ + 1;
      *(uint *)(lVar45 + lVar34 + 8 + lVar52 * 4) = UF::length_;
      UF::length_ = uVar26;
      uVar33 = uVar33 & 0xffffffff;
      goto LAB_00275d77;
    }
    iVar30 = (int)lVar12;
    if (*(char *)(lVar35 + 3 + lVar52) == '\0') {
      if (*(char *)(lVar35 + 4 + lVar52) == '\0') goto code_r0x00276f8c;
      uVar33 = (ulong)(uint)(iVar30 + (int)lVar52);
      *(undefined4 *)(lVar34 + local_80 + lVar14 + 8 + lVar52 * 4) =
           *(undefined4 *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 0x10 + lVar52 * 4);
      goto LAB_002775c6;
    }
    uVar33 = (ulong)(uint)(iVar30 + (int)lVar52);
    *(undefined4 *)(lVar34 + local_80 + lVar14 + 8 + lVar52 * 4) =
         *(undefined4 *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar52 * 4);
    goto LAB_00271a79;
  }
  uVar33 = lVar12 + lVar52;
  lVar17 = lVar28 + 0x300000000 >> 0x20;
  if (*(char *)(lVar21 + lVar17) == '\0') goto LAB_00277336;
  if (pcVar41[lVar17] != '\0') {
    uVar26 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar52 * 4);
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = *(uint *)((long)puVar15 + lVar42);
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
    uVar18 = uVar26;
    if (uVar9 >= uVar26 && uVar9 != uVar26) {
      uVar18 = uVar9;
    }
    if (uVar9 < uVar26) {
      uVar26 = uVar9;
    }
    UF::P_[uVar18] = uVar26;
    *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
    goto LAB_00271a79;
  }
  lVar35 = lVar28 + 0x400000000 >> 0x20;
  if (pcVar41[lVar35] == '\0') {
    uVar26 = *(uint *)((long)puVar15 + lVar42);
    uVar36 = uVar33 & 0xffffffff;
    goto LAB_00278d3d;
  }
  if (pcVar41[lVar17 - lVar23] == '\0') {
    uVar26 = puVar16[lVar35];
    do {
      uVar9 = uVar26;
      uVar18 = *(uint *)((long)puVar15 + lVar42);
      uVar26 = UF::P_[uVar9];
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
  }
  else {
    uVar26 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar52 * 4);
    do {
      uVar9 = uVar26;
      uVar18 = *(uint *)((long)puVar15 + lVar42);
      uVar26 = UF::P_[uVar9];
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
  }
LAB_00277585:
  uVar33 = lVar12 + lVar52;
  uVar18 = uVar26;
  if (uVar26 < uVar9) {
    uVar18 = uVar9;
  }
  if (uVar9 < uVar26) {
    uVar26 = uVar9;
  }
  UF::P_[uVar18] = uVar26;
  *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
  goto LAB_002775c6;
code_r0x00276f8c:
  puVar6[UF::length_] = UF::length_;
  uVar26 = UF::length_ + 1;
  puVar40[lVar52] = UF::length_;
  UF::length_ = uVar26;
  lVar28 = lVar28 + 0x200000000;
  puVar20 = puVar20 + 2;
  lVar42 = lVar12 + lVar52;
  lVar52 = lVar52 + 2;
  if (lVar10 <= lVar42 + 2) {
    iVar24 = iVar24 + (int)lVar52;
    uVar26 = iVar30 + (int)lVar52;
    goto LAB_00277004;
  }
  goto LAB_00276f52;
LAB_00277336:
  *(undefined4 *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) =
       *(undefined4 *)((long)puVar15 + (lVar28 >> 0x1e));
LAB_00277c1d:
  puVar20 = UF::P_;
  iVar24 = (int)uVar33;
  uVar26 = iVar24 + 2;
  if (iVar37 <= (int)uVar26) {
LAB_00277d46:
    puVar20 = UF::P_;
    uVar49 = (ulong)uVar26;
    if (iVar37 < (int)uVar26) {
      if (*(char *)(lVar21 + uVar49) == '\0') {
        if (pcVar1[uVar49] == '\0') {
          puVar15[uVar49] = 0;
          goto LAB_0027b423;
        }
        if (pcVar1[(long)iVar24 + 1] == '\0') {
LAB_002786f5:
          UF::P_[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          puVar15[uVar49] = UF::length_;
          UF::length_ = uVar26;
          goto LAB_0027b423;
        }
LAB_002789d6:
        uVar26 = puVar15[iVar24];
      }
      else {
        uVar26 = iVar24 + 1;
        if (pcVar1[uVar26] != '\0') {
          if (pcVar41[uVar26] == '\0') {
            if (pcVar41[uVar49] == '\0') goto LAB_002789d6;
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[iVar24];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else {
            uVar26 = puVar16[iVar24];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[iVar24];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          goto LAB_0027b412;
        }
        if (pcVar41[uVar49] == '\0') {
          if (pcVar41[uVar26] == '\0') goto LAB_002786f5;
          uVar26 = puVar16[iVar24];
        }
        else {
          uVar26 = puVar16[uVar49];
        }
      }
      puVar15[uVar49] = uVar26;
      goto LAB_0027b423;
    }
    if (*(char *)(lVar21 + uVar49) == '\0') {
      uVar33 = (ulong)(iVar24 + 3);
      cVar8 = *(char *)(lVar21 + uVar33);
      if (pcVar1[uVar49] == '\0') {
joined_r0x0027301e:
        if (cVar8 == '\0') {
          cVar8 = pcVar1[uVar33];
          goto joined_r0x00273029;
        }
        cVar8 = pcVar41[uVar33];
joined_r0x00272587:
        if (cVar8 != '\0') goto LAB_002795d8;
        bVar53 = pcVar41[uVar49] == '\0';
        goto LAB_0027839b;
      }
      lVar21 = (long)iVar24;
      if (cVar8 == '\0') {
        if (pcVar1[lVar21 + 1] != '\0') {
LAB_002786d8:
          uVar26 = puVar15[lVar21];
          goto LAB_00278725;
        }
      }
      else {
        cVar8 = pcVar41[uVar33];
        if (pcVar1[lVar21 + 1] != '\0') {
          if (cVar8 == '\0') {
            if (pcVar41[uVar49] == '\0') goto LAB_002786d8;
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar21];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else {
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar21];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          goto LAB_0027b412;
        }
LAB_0027840d:
        if ((cVar8 != '\0') || (pcVar41[uVar49] != '\0')) goto LAB_00278722;
      }
LAB_0027876a:
      UF::P_[UF::length_] = UF::length_;
      uVar26 = UF::length_;
LAB_00278783:
      UF::length_ = uVar26 + 1;
      puVar15[uVar49] = uVar26;
      goto LAB_0027b423;
    }
    uVar26 = iVar24 + 1;
    lVar21 = (long)iVar24;
    if (pcVar1[uVar26] == '\0') {
      if (pcVar41[lVar21 + 3] == '\0') {
        if (pcVar41[uVar49] != '\0') goto LAB_00278722;
        if (pcVar41[uVar26] != '\0') {
          uVar26 = puVar16[lVar21];
          goto LAB_00278725;
        }
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_;
        goto LAB_00278783;
      }
      if ((pcVar41[uVar49] == '\0') && (pcVar41[uVar26] != '\0')) {
        uVar26 = puVar16[lVar21];
        if (pcVar41[uVar49 - lVar23] == '\0') {
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar49];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027b412;
        }
        goto LAB_002783e7;
      }
LAB_00278722:
      uVar26 = puVar16[uVar49];
LAB_00278725:
      puVar15[uVar49] = uVar26;
      goto LAB_0027b423;
    }
    if (pcVar41[lVar21 + 3] != '\0') {
      if (pcVar41[uVar49] != '\0') {
        uVar26 = puVar16[uVar49];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar21];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027b412;
      }
      if (pcVar41[uVar26] == '\0') {
        uVar26 = puVar16[uVar49];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar21];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027b412;
      }
      if (pcVar41[uVar49 - lVar23] == '\0') {
        uVar26 = puVar16[lVar21];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar49];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = puVar15[lVar21];
          uVar26 = puVar20[uVar18];
        } while (puVar20[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar20[uVar26];
        } while (puVar20[uVar26] < uVar26);
        uVar33 = (ulong)uVar26;
        if (uVar18 >= uVar26 && uVar18 != uVar26) {
          uVar33 = (ulong)uVar18;
        }
        if (uVar18 < uVar26) {
          uVar26 = uVar18;
        }
        puVar20[uVar33] = uVar26;
        goto LAB_002783e7;
      }
      uVar26 = puVar16[lVar21];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[lVar21];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      goto LAB_0027b41f;
    }
    if (pcVar41[uVar26] != '\0') {
      uVar26 = puVar16[lVar21];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[lVar21];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      goto LAB_0027b412;
    }
    if (pcVar41[uVar49] == '\0') goto LAB_00278f6d;
    uVar26 = puVar16[uVar49];
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = puVar15[lVar21];
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
    goto LAB_0027b412;
  }
  lVar44 = (long)iVar24;
  lVar12 = lVar44 + 2;
  lVar42 = lVar44 << 0x20;
  lVar51 = lVar11 + 3 + lVar39 + lVar44;
  lVar17 = lVar14 + lVar44 * 4;
  lVar52 = lVar17 + lVar34 + 8;
  lVar35 = lVar11 + lVar23 * lVar19 + lVar44;
  lVar45 = 0;
  lVar28 = 0;
LAB_00277c9b:
  puVar6 = UF::P_;
  lVar25 = lVar42 >> 0x20;
  if (*(char *)(lVar51 + -1 + lVar28) != '\0') goto LAB_00277e3c;
  if (*(char *)(lVar35 + 2 + lVar28) == '\0') {
    uVar33 = lVar12 + lVar28;
    lVar35 = lVar42 + 0x300000000 >> 0x20;
    if (*(char *)(lVar21 + lVar35) == '\0') {
      if (pcVar1[lVar35] != '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
        UF::length_ = uVar26;
        goto LAB_00275d77;
      }
      lVar45 = lVar45 + lVar17 + lVar34;
LAB_002788c0:
      puVar20 = (uint *)(lVar45 + 8);
      goto LAB_0027519e;
    }
    if (pcVar41[lVar35] != '\0') {
      *(undefined4 *)(lVar52 + lVar28 * 4) =
           *(undefined4 *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
      uVar33 = uVar33 & 0xffffffff;
      goto LAB_00271a79;
    }
    lVar45 = lVar42 + 0x400000000 >> 0x20;
    cVar8 = *(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar44 + lVar11);
    if (pcVar41[lVar45] == '\0') {
      if (cVar8 == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
        UF::length_ = uVar26;
        goto LAB_00276eae;
      }
      *(undefined4 *)(lVar52 + lVar28 * 4) =
           *(undefined4 *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
      goto LAB_002778d2;
    }
    if (cVar8 == '\0') {
LAB_00278b6c:
      uVar26 = puVar16[lVar45];
      goto LAB_00278b75;
    }
    uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
    if (pcVar41[lVar35 - lVar23] == '\0') {
      do {
        uVar18 = uVar26;
        uVar26 = UF::P_[uVar18];
        uVar9 = puVar16[lVar45];
      } while (UF::P_[uVar18] < uVar18);
      do {
        uVar26 = uVar9;
        uVar9 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      goto LAB_0027b2d9;
    }
    *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
    goto LAB_00278b83;
  }
  if (*(char *)(lVar51 + lVar28) == '\0') goto code_r0x00277cbd;
  uVar33 = lVar12 + lVar28;
  uVar18 = (uint)uVar33;
  lVar35 = lVar23 * lVar27 + lVar44 + lVar11;
  cVar8 = *(char *)(lVar28 + 3 + lVar35);
  if (pcVar1[lVar25 + 1] == '\0') {
    if (cVar8 != '\0') {
      *(undefined4 *)(lVar52 + lVar28 * 4) =
           *(undefined4 *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
      uVar33 = uVar33 & 0xffffffff;
      goto LAB_00271a79;
    }
    lVar45 = lVar42 + 0x400000000 >> 0x20;
    cVar8 = *(char *)(lVar28 + 2 + lVar35);
    if (pcVar41[lVar45] != '\0') {
      if (cVar8 == '\0') goto LAB_00278b6c;
      uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
      if (*(char *)(lVar28 + 3 + lVar23 * lVar32 + lVar44 + lVar11) == '\0') {
        do {
          uVar18 = uVar26;
          uVar9 = puVar16[lVar45];
          uVar26 = UF::P_[uVar18];
        } while (UF::P_[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027b2d9;
      }
      goto LAB_00278943;
    }
    if (cVar8 == '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar26 = UF::length_ + 1;
      *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
      UF::length_ = uVar26;
      goto LAB_00276eae;
    }
    lVar12 = lVar47 * lVar32 + lVar44 * 4;
LAB_00279bb9:
    *(undefined4 *)(lVar52 + lVar28 * 4) = *(undefined4 *)(lVar12 + lVar34 + 8 + lVar28 * 4);
    goto LAB_002778d2;
  }
  if (cVar8 != '\0') {
    uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = puVar15[lVar25];
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
    uVar18 = uVar26;
    if (uVar9 >= uVar26 && uVar9 != uVar26) {
      uVar18 = uVar9;
    }
    if (uVar9 < uVar26) {
      uVar26 = uVar9;
    }
    UF::P_[uVar18] = uVar26;
    *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
LAB_00278070:
    uVar33 = uVar33 & 0xffffffff;
    goto LAB_00271a79;
  }
  lVar45 = lVar42 + 0x400000000 >> 0x20;
  if (pcVar41[lVar45] == '\0') {
    if (*(char *)(lVar28 + 2 + lVar35) == '\0') {
      *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar15[lVar25];
      goto LAB_00276eae;
    }
    uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = puVar15[lVar25];
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
    uVar18 = uVar26;
    if (uVar9 >= uVar26 && uVar9 != uVar26) {
      uVar18 = uVar9;
    }
    if (uVar9 < uVar26) {
      uVar26 = uVar9;
    }
    UF::P_[uVar18] = uVar26;
    *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
    goto LAB_002778d2;
  }
  if (*(char *)(lVar28 + 3 + lVar23 * lVar32 + lVar44 + lVar11) != '\0') {
    uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = puVar15[lVar25];
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
    uVar18 = uVar26;
    if (uVar9 >= uVar26 && uVar9 != uVar26) {
      uVar18 = uVar9;
    }
    if (uVar9 < uVar26) {
      uVar26 = uVar9;
    }
    UF::P_[uVar18] = uVar26;
    goto LAB_00278943;
  }
  if (*(char *)(lVar28 + 2 + lVar35) != '\0') {
    uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
    do {
      uVar13 = uVar26;
      uVar26 = UF::P_[uVar13];
      uVar9 = puVar16[lVar45];
    } while (UF::P_[uVar13] < uVar13);
    do {
      uVar26 = uVar9;
      uVar9 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
    uVar9 = uVar26;
    if (uVar13 >= uVar26 && uVar13 != uVar26) {
      uVar9 = uVar13;
    }
    if (uVar13 < uVar26) {
      uVar26 = uVar13;
    }
    UF::P_[uVar9] = uVar26;
    do {
      uVar9 = uVar26;
      uVar13 = puVar15[lVar25];
      uVar26 = puVar6[uVar9];
    } while (puVar6[uVar9] < uVar9);
    do {
      uVar26 = uVar13;
      uVar13 = puVar6[uVar26];
    } while (puVar6[uVar26] < uVar26);
    uVar33 = (ulong)uVar26;
    if (uVar9 >= uVar26 && uVar9 != uVar26) {
      uVar33 = (ulong)uVar9;
    }
    if (uVar9 < uVar26) {
      uVar26 = uVar9;
    }
    puVar6[uVar33] = uVar26;
LAB_00279a5f:
    *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
    goto LAB_0027b2f9;
  }
  uVar26 = puVar16[lVar45];
  do {
    uVar9 = uVar26;
    uVar26 = UF::P_[uVar9];
    uVar18 = puVar15[lVar25];
  } while (UF::P_[uVar9] < uVar9);
  do {
    uVar26 = uVar18;
    uVar18 = UF::P_[uVar26];
  } while (UF::P_[uVar26] < uVar26);
  uVar18 = uVar26;
  if (uVar9 >= uVar26 && uVar9 != uVar26) {
    uVar18 = uVar9;
  }
  if (uVar9 < uVar26) {
    uVar26 = uVar9;
  }
  UF::P_[uVar18] = uVar26;
  *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
LAB_0027a879:
  uVar33 = uVar33 & 0xffffffff;
  goto LAB_002775c6;
code_r0x00277cbd:
  if (*(char *)(lVar35 + 1 + lVar28) == '\0') {
    puVar20[UF::length_] = UF::length_;
    uVar26 = UF::length_;
    UF::length_ = UF::length_ + 1;
  }
  else {
    uVar26 = *(uint *)(lVar17 + lVar34 + lVar28 * 4);
  }
  *(uint *)(lVar52 + lVar28 * 4) = uVar26;
  lVar42 = lVar42 + 0x200000000;
  lVar45 = lVar45 + 8;
  lVar25 = lVar28 + lVar12;
  lVar28 = lVar28 + 2;
  if (lVar10 <= lVar25 + 2) {
    iVar24 = iVar24 + (int)lVar28;
    uVar26 = (int)lVar12 + (int)lVar28;
    goto LAB_00277d46;
  }
  goto LAB_00277c9b;
LAB_00277e3c:
  uVar33 = lVar12 + lVar28;
  lVar45 = lVar42 + 0x100000000 >> 0x20;
  lVar35 = lVar42 + 0x300000000 >> 0x20;
  lVar51 = lVar42 >> 0x1e;
  if (pcVar1[lVar45] == '\0') {
    if (pcVar41[lVar35] != '\0') {
      if ((*(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar44 + lVar11) != '\0') ||
         (pcVar41[lVar45] == '\0')) {
        *(undefined4 *)(lVar52 + lVar28 * 4) =
             *(undefined4 *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
        goto LAB_00278210;
      }
      if (*(char *)(lVar28 + 2 + lVar23 * lVar32 + lVar44 + lVar11) != '\0') {
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = *(uint *)((long)puVar16 + lVar51);
        goto LAB_00278210;
      }
      uVar26 = *(uint *)((long)puVar16 + lVar51);
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
LAB_00279e48:
      *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
      uVar33 = uVar33 & 0xffffffff;
      goto LAB_0027178d;
    }
    if (*(char *)(lVar21 + lVar35) == '\0') {
      if (*(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar44 + lVar11) != '\0') {
        *(undefined4 *)(lVar52 + lVar28 * 4) =
             *(undefined4 *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
        goto LAB_002799a0;
      }
      if (pcVar41[lVar45] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
        UF::length_ = uVar26;
      }
      else {
        *(undefined4 *)(lVar17 + lVar34 + 8 + lVar28 * 4) = *(undefined4 *)((long)puVar16 + lVar51);
      }
      uVar33 = uVar33 & 0xffffffff;
      goto LAB_002729bc;
    }
    lVar42 = lVar42 + 0x400000000 >> 0x20;
    cVar8 = *(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar44 + lVar11);
    if (pcVar41[lVar42] == '\0') {
      if (cVar8 != '\0') {
        *(undefined4 *)(lVar52 + lVar28 * 4) =
             *(undefined4 *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
        goto LAB_002778d2;
      }
      if (pcVar41[lVar45] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
        UF::length_ = uVar26;
      }
      else {
        *(undefined4 *)(lVar17 + lVar34 + 8 + lVar28 * 4) = *(undefined4 *)((long)puVar16 + lVar51);
      }
      goto LAB_00276eae;
    }
    if (cVar8 == '\0') {
      if (pcVar41[lVar45] == '\0') {
        uVar26 = puVar16[lVar42];
LAB_00278b75:
        uVar33 = lVar12 + lVar28;
LAB_00278b7a:
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
LAB_00278b83:
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002775c6;
      }
      if (pcVar41[lVar35 - lVar23] == '\0') {
        uVar26 = *(uint *)((long)puVar16 + lVar51);
        do {
          uVar18 = uVar26;
          uVar26 = UF::P_[uVar18];
          uVar9 = puVar16[lVar42];
        } while (UF::P_[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else {
        uVar26 = *(uint *)((long)puVar16 + lVar51);
        if (*(char *)(lVar28 + 2 + lVar23 * lVar32 + lVar44 + lVar11) != '\0') goto LAB_00278943;
        do {
          uVar18 = uVar26;
          uVar9 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
          uVar26 = UF::P_[uVar18];
        } while (UF::P_[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
    }
    else {
      uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
      if (pcVar41[lVar35 - lVar23] != '\0') {
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002775c6;
      }
      do {
        uVar18 = uVar26;
        uVar26 = UF::P_[uVar18];
        uVar9 = puVar16[lVar42];
      } while (UF::P_[uVar18] < uVar18);
      do {
        uVar26 = uVar9;
        uVar9 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
  }
  else {
    if (pcVar41[lVar35] != '\0') {
      if (*(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar44 + lVar11) == '\0') {
        if (pcVar41[lVar45] != '\0') {
          if (*(char *)(lVar28 + 2 + lVar23 * lVar32 + lVar44 + lVar11) == '\0') {
            uVar26 = *(uint *)((long)puVar16 + lVar51);
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            do {
              uVar18 = uVar26;
              uVar9 = puVar15[lVar25];
              uVar26 = puVar6[uVar18];
            } while (puVar6[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = puVar6[uVar26];
            } while (puVar6[uVar26] < uVar26);
          }
          else {
            uVar26 = *(uint *)((long)puVar16 + lVar51);
            do {
              uVar18 = uVar26;
              uVar26 = UF::P_[uVar18];
              uVar9 = puVar15[lVar25];
            } while (UF::P_[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          uVar9 = uVar26;
          if (uVar26 < uVar18) {
            uVar9 = uVar18;
          }
          if (uVar18 < uVar26) {
            uVar26 = uVar18;
          }
          puVar6[uVar9] = uVar26;
          goto LAB_00279e48;
        }
        uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = *(uint *)((long)puVar15 + lVar51);
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else {
        uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = *(uint *)((long)puVar15 + lVar51);
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      uVar18 = uVar26;
      if (uVar26 < uVar9) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
      uVar33 = uVar33 & 0xffffffff;
      goto LAB_0027178d;
    }
    if (*(char *)(lVar21 + lVar35) == '\0') {
      if (pcVar41[lVar45] != '\0') {
        uVar26 = *(uint *)((long)puVar16 + lVar51);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = *(uint *)((long)puVar15 + lVar51);
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        uVar36 = uVar33;
        goto LAB_00279017;
      }
      if (*(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar44 + lVar11) != '\0') {
        uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = *(uint *)((long)puVar15 + lVar51);
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_00271c6e;
      }
      *(undefined4 *)(lVar17 + lVar34 + 8 + lVar28 * 4) = *(undefined4 *)((long)puVar15 + lVar51);
      uVar33 = uVar33 & 0xffffffff;
LAB_002729bc:
      puVar20 = UF::P_;
      iVar24 = (int)uVar33;
      uVar26 = iVar24 + 2;
      if (iVar37 <= (int)uVar26) {
LAB_00272b2f:
        uVar49 = (ulong)uVar26;
        if (iVar37 < (int)uVar26) {
          if (*(char *)(lVar21 + uVar49) == '\0') {
            if (pcVar1[uVar49] == '\0') {
LAB_00272d81:
              puVar15[uVar49] = 0;
              goto LAB_0027b423;
            }
            lVar21 = (long)iVar24;
            cVar8 = pcVar1[lVar21 + 1];
joined_r0x00273338:
            if (cVar8 != '\0') goto LAB_002777ae;
LAB_0027333e:
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            puVar15[uVar49] = UF::length_;
            UF::length_ = uVar26;
            goto LAB_0027b423;
          }
          lVar21 = (long)iVar24;
          cVar8 = pcVar41[uVar49];
          if (pcVar1[lVar21 + 1] == '\0') goto joined_r0x00279421;
          if (cVar8 == '\0') goto LAB_00278f6d;
          uVar26 = puVar16[uVar49];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar21];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
        else if (*(char *)(lVar21 + uVar49) == '\0') {
          uVar33 = (ulong)(iVar24 + 3);
          cVar8 = *(char *)(lVar21 + uVar33);
          if (pcVar1[uVar49] == '\0') goto joined_r0x0027301e;
          lVar21 = (long)iVar24;
          if (cVar8 == '\0') {
            if (pcVar1[lVar21 + 1] == '\0') goto LAB_0027876a;
            goto LAB_002786d8;
          }
          cVar8 = pcVar41[uVar33];
          if (pcVar1[lVar21 + 1] == '\0') goto LAB_0027840d;
          if (cVar8 == '\0') {
            if (pcVar41[uVar49] == '\0') goto LAB_002786d8;
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar21];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          else {
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar21];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
        }
        else {
          lVar21 = (long)iVar24;
          cVar8 = pcVar41[lVar21 + 3];
          if (pcVar1[lVar21 + 1] == '\0') goto joined_r0x0027942e;
          if (cVar8 != '\0') {
            uVar26 = puVar16[uVar49];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar21];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_0027b412;
          }
          if (pcVar41[uVar49] == '\0') goto LAB_00278f6d;
          uVar26 = puVar16[uVar49];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar21];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
        }
LAB_0027b412:
        uVar18 = uVar26;
        if (uVar26 < uVar9) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
LAB_0027b41f:
        puVar15[uVar49] = uVar26;
        goto LAB_0027b423;
      }
      lVar25 = (long)iVar24;
      lVar12 = lVar25 + 2;
      lVar43 = lVar25 << 0x20;
      lVar17 = lVar14 + lVar25 * 4;
      lVar51 = lVar34 + lVar17;
      lVar52 = lVar51 + 8;
      lVar48 = lVar23 * lVar19 + lVar25;
      lVar35 = lVar11 + lVar39 + lVar25;
      lVar50 = lVar35 + 3;
      lVar44 = lVar23 * lVar27 + lVar25;
      lVar42 = lVar11 + lVar44 + 2;
      lVar45 = 0;
      lVar28 = 0;
LAB_00272a5d:
      puVar6 = UF::P_;
      iVar46 = (int)lVar12;
      iVar30 = (int)lVar28;
      if (*(char *)(lVar35 + 2 + lVar28) == '\0') {
        uVar33 = lVar12 + lVar28;
        uVar18 = (uint)uVar33;
        lVar12 = lVar43 + 0x300000000 >> 0x20;
        if (*(char *)(lVar28 + 2 + lVar48 + lVar11) == '\0') {
          if (*(char *)(lVar21 + lVar12) == '\0') {
            if (pcVar1[lVar12] != '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar26 = UF::length_ + 1;
              *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
              UF::length_ = uVar26;
              goto LAB_00275d77;
            }
            lVar45 = lVar45 + lVar17 + lVar34;
            goto LAB_002788c0;
          }
          if (pcVar41[lVar12] == '\0') {
            lVar35 = lVar43 + 0x400000000 >> 0x20;
            cVar8 = *(char *)(lVar28 + 2 + lVar44 + lVar11);
            if (pcVar41[lVar35] == '\0') {
              if (cVar8 != '\0') {
                *(undefined4 *)(lVar52 + lVar28 * 4) =
                     *(undefined4 *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
                goto LAB_002778d2;
              }
LAB_00274cb7:
              UF::P_[UF::length_] = UF::length_;
              uVar26 = UF::length_ + 1;
              *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
              UF::length_ = uVar26;
              goto LAB_00276eae;
            }
            if (cVar8 != '\0') {
              uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
              if (pcVar41[lVar12 - lVar23] == '\0') {
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar35];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_00272f17;
              }
              *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
              goto LAB_00278950;
            }
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar16[lVar35];
LAB_00274e4d:
            uVar33 = uVar33 & 0xffffffff;
            goto LAB_002775c6;
          }
          *(undefined4 *)(lVar52 + lVar28 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
LAB_002754bc:
          uVar33 = uVar33 & 0xffffffff;
          goto LAB_00271a79;
        }
        lVar35 = lVar43 >> 0x20;
        if (*(char *)(lVar21 + lVar12) == '\0') {
          if (pcVar1[lVar35 + 1] == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
            UF::length_ = uVar26;
          }
          else {
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar15[lVar35];
          }
          uVar33 = uVar33 & 0xffffffff;
          goto LAB_00277c1d;
        }
        if (pcVar1[lVar35 + 1] == '\0') {
          if (pcVar41[lVar12] != '\0') {
            *(undefined4 *)(lVar52 + lVar28 * 4) =
                 *(undefined4 *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
            goto LAB_00278070;
          }
          lVar35 = lVar43 + 0x400000000 >> 0x20;
          cVar8 = *(char *)(lVar28 + 2 + lVar44 + lVar11);
          if (pcVar41[lVar35] != '\0') {
            if (cVar8 == '\0') {
              *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar16[lVar35];
            }
            else {
              uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
              if (pcVar41[lVar12 - lVar23] == '\0') {
                do {
                  uVar9 = uVar26;
                  uVar26 = UF::P_[uVar9];
                  uVar18 = puVar16[lVar35];
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar26 = uVar18;
                  uVar18 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                goto LAB_00272f17;
              }
              *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
            }
            goto LAB_00274e4d;
          }
          if (cVar8 == '\0') goto LAB_00274cb7;
          lVar12 = lVar47 * lVar32 + lVar25 * 4;
          goto LAB_00279bb9;
        }
        if (pcVar41[lVar12] != '\0') {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[lVar35];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar18 = uVar26;
          if (uVar9 >= uVar26 && uVar9 != uVar26) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
          goto LAB_00278070;
        }
        lVar45 = lVar43 + 0x400000000 >> 0x20;
        if (pcVar41[lVar45] != '\0') {
          if (pcVar41[lVar12 - lVar23] != '\0') {
            uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar35];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
            goto LAB_00278950;
          }
          if (*(char *)(lVar28 + 2 + lVar44 + lVar11) == '\0') {
            uVar26 = puVar16[lVar45];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar15[lVar35];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
            goto LAB_0027a879;
          }
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
          do {
            uVar13 = uVar26;
            uVar26 = UF::P_[uVar13];
            uVar9 = puVar16[lVar45];
          } while (UF::P_[uVar13] < uVar13);
          do {
            uVar26 = uVar9;
            uVar9 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar9 = uVar26;
          if (uVar13 >= uVar26 && uVar13 != uVar26) {
            uVar9 = uVar13;
          }
          if (uVar13 < uVar26) {
            uVar26 = uVar13;
          }
          UF::P_[uVar9] = uVar26;
          do {
            uVar9 = uVar26;
            uVar13 = puVar15[lVar35];
            uVar26 = puVar6[uVar9];
          } while (puVar6[uVar9] < uVar9);
          do {
            uVar26 = uVar13;
            uVar13 = puVar6[uVar26];
          } while (puVar6[uVar26] < uVar26);
          uVar33 = (ulong)uVar26;
          if (uVar9 >= uVar26 && uVar9 != uVar26) {
            uVar33 = (ulong)uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          puVar6[uVar33] = uVar26;
          goto LAB_00279a5f;
        }
        if (*(char *)(lVar28 + 2 + lVar44 + lVar11) == '\0') {
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar15[lVar35];
          goto LAB_00276eae;
        }
        uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar35];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        goto LAB_002778d2;
      }
      cVar8 = *(char *)(lVar11 + lVar44 + 3 + lVar28);
      if (*(char *)(lVar11 + lVar48 + 1 + lVar28) == '\0') {
        if (cVar8 != '\0') {
          *(undefined4 *)(lVar52 + lVar28 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
          uVar33 = (ulong)(uint)(iVar46 + iVar30);
          goto LAB_0027178d;
        }
        if (*(char *)(lVar50 + lVar28) == '\0') {
          if (*(char *)(lVar42 + lVar28) == '\0') {
            puVar20[UF::length_] = UF::length_;
            uVar26 = UF::length_;
            UF::length_ = UF::length_ + 1;
            goto LAB_00272ad0;
          }
          *(undefined4 *)(lVar52 + lVar28 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
          uVar33 = (ulong)(uint)(iVar46 + iVar30);
          goto LAB_00271c6e;
        }
        uVar33 = lVar12 + lVar28;
        lVar12 = lVar43 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar28 + 2 + lVar44 + lVar11);
        if (pcVar41[lVar12] != '\0') {
          if (cVar8 == '\0') {
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar16[lVar12];
          }
          else {
            uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
            if (*(char *)(lVar28 + 3 + lVar23 * lVar32 + lVar25 + lVar11) == '\0') {
              do {
                uVar9 = uVar26;
                uVar26 = UF::P_[uVar9];
                uVar18 = puVar16[lVar12];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar26 = uVar18;
                uVar18 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
LAB_00272f17:
              uVar18 = iVar46 + iVar30;
              uVar13 = uVar26;
              if (uVar26 < uVar9) {
                uVar13 = uVar9;
              }
              if (uVar9 < uVar26) {
                uVar26 = uVar9;
              }
              UF::P_[uVar13] = uVar26;
              goto LAB_0027b2ef;
            }
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
          }
          goto LAB_00278b83;
        }
        if (cVar8 != '\0') {
          *(undefined4 *)(lVar52 + lVar28 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
          goto LAB_002778d2;
        }
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
        UF::length_ = uVar26;
        goto LAB_00276eae;
      }
      if (cVar8 == '\0') {
        if (*(char *)(lVar50 + lVar28) == '\0') {
          if (*(char *)(lVar42 + lVar28) != '\0') goto LAB_00272f32;
          uVar26 = *(uint *)(lVar51 + lVar28 * 4);
LAB_00272ad0:
          *(uint *)(lVar52 + lVar28 * 4) = uVar26;
          lVar43 = lVar43 + 0x200000000;
          lVar45 = lVar45 + 8;
          lVar2 = lVar12 + lVar28;
          lVar28 = lVar28 + 2;
          if (lVar10 <= lVar2 + 2) {
            iVar24 = iVar24 + (int)lVar28;
            uVar26 = iVar46 + (int)lVar28;
            goto LAB_00272b2f;
          }
          goto LAB_00272a5d;
        }
        uVar33 = lVar12 + lVar28;
        lVar12 = lVar43 + 0x400000000 >> 0x20;
        if (pcVar41[lVar12] == '\0') {
          if (*(char *)(lVar28 + 2 + lVar44 + lVar11) == '\0') {
            *(undefined4 *)(lVar17 + lVar34 + 8 + lVar28 * 4) =
                 *(undefined4 *)(lVar17 + lVar34 + lVar28 * 4);
            goto LAB_00276eae;
          }
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)(lVar51 + lVar28 * 4);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar18 = uVar26;
          if (uVar9 >= uVar26 && uVar9 != uVar26) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
          goto LAB_002778d2;
        }
        if (*(char *)(lVar28 + 3 + lVar23 * lVar32 + lVar25 + lVar11) != '\0') {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)(lVar51 + lVar28 * 4);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_00272f17;
        }
        if (*(char *)(lVar28 + 2 + lVar44 + lVar11) == '\0') {
          uVar26 = puVar16[lVar12];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = *(uint *)(lVar17 + lVar34 + lVar28 * 4);
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar18 = uVar26;
          if (uVar9 >= uVar26 && uVar9 != uVar26) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        }
        else {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar12];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar18 = uVar26;
          if (uVar9 >= uVar26 && uVar9 != uVar26) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          do {
            uVar18 = uVar26;
            uVar9 = *(uint *)(lVar17 + lVar34 + lVar28 * 4);
            uVar26 = puVar6[uVar18];
          } while (puVar6[uVar18] < uVar18);
          do {
            uVar26 = uVar9;
            uVar9 = puVar6[uVar26];
          } while (puVar6[uVar26] < uVar26);
          uVar36 = (ulong)uVar26;
          if (uVar18 >= uVar26 && uVar18 != uVar26) {
            uVar36 = (ulong)uVar18;
          }
          if (uVar18 < uVar26) {
            uVar26 = uVar18;
          }
          puVar6[uVar36] = uVar26;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        }
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002775c6;
      }
      uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
      do {
        uVar18 = uVar26;
        uVar26 = UF::P_[uVar18];
      } while (UF::P_[uVar18] < uVar18);
      uVar26 = *(uint *)(lVar51 + lVar28 * 4);
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
      } while (UF::P_[uVar9] < uVar9);
      uVar26 = uVar9;
      if (uVar18 >= uVar9 && uVar18 != uVar9) {
        uVar26 = uVar18;
      }
      if (uVar18 < uVar9) {
        uVar9 = uVar18;
      }
      UF::P_[uVar26] = uVar9;
      *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar9;
      uVar33 = (ulong)(uint)(iVar46 + iVar30);
      goto LAB_0027178d;
    }
    lVar52 = lVar42 + 0x400000000 >> 0x20;
    if (pcVar41[lVar52] == '\0') {
      if (pcVar41[lVar45] == '\0') {
        if (*(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar44 + lVar11) == '\0') {
          *(undefined4 *)(lVar17 + lVar34 + 8 + lVar28 * 4) =
               *(undefined4 *)((long)puVar15 + lVar51);
          goto LAB_00276eae;
        }
        uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = *(uint *)((long)puVar15 + lVar51);
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        goto LAB_002778d2;
      }
      uVar26 = *(uint *)((long)puVar16 + lVar51);
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = *(uint *)((long)puVar15 + lVar51);
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      uVar36 = uVar33;
      goto LAB_00278d3d;
    }
    if (*(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar44 + lVar11) == '\0') {
      if (pcVar41[lVar45] == '\0') {
        uVar26 = puVar16[lVar52];
        do {
          uVar18 = uVar26;
          uVar26 = UF::P_[uVar18];
          uVar9 = *(uint *)((long)puVar15 + lVar51);
        } while (UF::P_[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else {
        if (pcVar41[lVar35 - lVar23] != '\0') {
          if (*(char *)(lVar28 + 2 + lVar23 * lVar32 + lVar44 + lVar11) == '\0') {
            uVar26 = *(uint *)((long)puVar16 + lVar51);
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            do {
              uVar18 = uVar26;
              uVar9 = puVar15[lVar25];
              uVar26 = puVar6[uVar18];
            } while (puVar6[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = puVar6[uVar26];
            } while (puVar6[uVar26] < uVar26);
          }
          else {
            uVar26 = *(uint *)((long)puVar16 + lVar51);
            do {
              uVar18 = uVar26;
              uVar26 = UF::P_[uVar18];
              uVar9 = puVar15[lVar25];
            } while (UF::P_[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
          }
          uVar9 = uVar26;
          if (uVar26 < uVar18) {
            uVar9 = uVar18;
          }
          if (uVar18 < uVar26) {
            uVar26 = uVar18;
          }
          puVar6[uVar9] = uVar26;
          goto LAB_0027b2ea;
        }
        uVar26 = *(uint *)((long)puVar16 + lVar51);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[lVar52];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = puVar15[lVar25];
          uVar26 = puVar6[uVar18];
        } while (puVar6[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar6[uVar26];
        } while (puVar6[uVar26] < uVar26);
      }
    }
    else {
      uVar26 = *(uint *)(lVar47 * lVar32 + lVar44 * 4 + lVar34 + 8 + lVar28 * 4);
      if (pcVar41[lVar35 - lVar23] == '\0') {
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[lVar52];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = *(uint *)((long)puVar15 + lVar51);
          uVar26 = puVar6[uVar18];
        } while (puVar6[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar6[uVar26];
        } while (puVar6[uVar26] < uVar26);
        uVar36 = (ulong)uVar26;
        if (uVar18 >= uVar26 && uVar18 != uVar26) {
          uVar36 = (ulong)uVar18;
        }
        if (uVar18 < uVar26) {
          uVar26 = uVar18;
        }
        puVar6[uVar36] = uVar26;
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002775c6;
      }
      do {
        uVar18 = uVar26;
        uVar26 = UF::P_[uVar18];
        uVar9 = *(uint *)((long)puVar15 + lVar51);
      } while (UF::P_[uVar18] < uVar18);
      do {
        uVar26 = uVar9;
        uVar9 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
  }
LAB_0027b2d9:
  uVar9 = uVar26;
  if (uVar26 < uVar18) {
    uVar9 = uVar18;
  }
  if (uVar18 < uVar26) {
    uVar26 = uVar18;
  }
  puVar6[uVar9] = uVar26;
LAB_0027b2ea:
  uVar18 = (int)lVar12 + (int)lVar28;
LAB_0027b2ef:
  *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
LAB_0027b2f9:
  uVar33 = (ulong)uVar18;
  goto LAB_002775c6;
LAB_00278943:
  uVar33 = lVar12 + lVar28;
  *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
LAB_00278950:
  uVar33 = uVar33 & 0xffffffff;
  goto LAB_002775c6;
LAB_00272f32:
  uVar26 = *(uint *)(lVar47 * lVar32 + lVar25 * 4 + lVar34 + 8 + lVar28 * 4);
  do {
    uVar18 = uVar26;
    uVar26 = UF::P_[uVar18];
  } while (UF::P_[uVar18] < uVar18);
  uVar26 = *(uint *)(lVar51 + lVar28 * 4);
  do {
    uVar9 = uVar26;
    uVar26 = UF::P_[uVar9];
  } while (UF::P_[uVar9] < uVar9);
  uVar26 = uVar9;
  if (uVar18 >= uVar9 && uVar18 != uVar9) {
    uVar26 = uVar18;
  }
  if (uVar18 < uVar9) {
    uVar9 = uVar18;
  }
  UF::P_[uVar26] = uVar9;
  *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar9;
  uVar33 = lVar12 + lVar28 & 0xffffffff;
LAB_00271c6e:
  puVar20 = UF::P_;
  uVar26 = (int)uVar33 + 2;
  uVar36 = (ulong)uVar26;
  if (iVar37 <= (int)uVar26) {
LAB_00271d89:
    uVar49 = uVar36 & 0xffffffff;
    iVar24 = (int)uVar33;
    if (iVar37 < (int)uVar36) {
      if (*(char *)(lVar21 + uVar49) == '\0') {
        if (pcVar1[uVar49] == '\0') goto LAB_00272d81;
LAB_00273333:
        lVar21 = (long)iVar24;
        cVar8 = pcVar1[lVar21 + 1];
        goto joined_r0x00273338;
      }
      if (pcVar1[iVar24 + 1] == '\0') {
        if (pcVar41[uVar49] != '\0') goto LAB_0027777f;
        goto LAB_0027333e;
      }
      if (pcVar41[uVar49] == '\0') goto LAB_002777ab;
      uVar26 = puVar16[iVar24];
      if (pcVar41[(ulong)(iVar24 + 1) - lVar23] != '\0') goto LAB_00271dd9;
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar16[uVar49];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    else if (*(char *)(lVar21 + uVar49) == '\0') {
      uVar33 = (ulong)(iVar24 + 3);
      cVar8 = *(char *)(lVar21 + uVar33);
      if (pcVar1[uVar49] == '\0') goto LAB_00272477;
      if (cVar8 == '\0') goto LAB_00273333;
      uVar36 = (ulong)(iVar24 + 1);
      if (pcVar1[uVar36] == '\0') {
        if (pcVar41[uVar33] != '\0') goto LAB_0027777f;
        bVar53 = pcVar41[uVar49] == '\0';
        goto LAB_0027839b;
      }
      if (pcVar41[uVar33] == '\0') {
        if (pcVar41[uVar49] == '\0') goto LAB_002777ab;
        uVar26 = puVar16[iVar24];
        if (pcVar41[uVar36 - lVar23] != '\0') {
LAB_00271dd9:
          puVar15[uVar49] = uVar26;
          goto LAB_0027b423;
        }
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar49];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else {
        if (pcVar41[uVar36 - lVar23] != '\0') {
          if (pcVar41[uVar49] == '\0') {
            uVar26 = puVar16[iVar24];
            if (pcVar41[uVar49 - lVar23] != '\0') goto LAB_00271dd9;
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[uVar49];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_0027b412;
          }
          goto LAB_0027236e;
        }
        uVar26 = puVar16[iVar24];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar49];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
    }
    else {
      uVar33 = (ulong)(iVar24 + 1);
      lVar21 = (long)iVar24;
      cVar8 = pcVar41[lVar21 + 3];
      if (pcVar1[uVar33] == '\0') goto joined_r0x00272587;
      if (cVar8 == '\0') {
        if (pcVar41[uVar49] == '\0') goto LAB_00278f6d;
        uVar26 = puVar16[lVar21];
        if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_0027b41f;
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar49];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else if (pcVar41[uVar33 - lVar23] == '\0') {
        uVar26 = puVar16[lVar21];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar49];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
      else {
        if (pcVar41[uVar49] != '\0') goto LAB_00271ebd;
        uVar26 = puVar16[lVar21];
        if (pcVar41[uVar49 - lVar23] != '\0') goto LAB_0027b41f;
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar49];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
      }
    }
    goto LAB_0027b412;
  }
  lVar12 = (long)(int)uVar33;
  uVar36 = lVar12 + 2;
  while (uVar33 = uVar36, puVar6 = UF::P_, iVar24 = (int)lVar12, *(char *)(lVar21 + uVar33) != '\0')
  {
    if (pcVar1[lVar12 + 1] != '\0') {
      if (pcVar41[lVar12 + 3] != '\0') {
        if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
          uVar26 = puVar16[iVar24];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar33];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar18 = uVar26;
          if (uVar9 >= uVar26 && uVar9 != uVar26) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          puVar15[uVar33] = uVar26;
        }
        else if (pcVar41[uVar33] == '\0') {
          if (pcVar41[uVar33 - lVar23] == '\0') {
            uVar26 = puVar16[iVar24];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[uVar33];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            puVar15[uVar33] = uVar26;
          }
          else {
            puVar15[uVar33] = puVar16[iVar24];
          }
        }
        else {
          puVar15[uVar33] = puVar16[iVar24];
        }
        goto LAB_0027178d;
      }
      if (*(char *)(lVar21 + 3 + lVar12) == '\0') {
        if (pcVar41[uVar33] != '\0') {
          uVar26 = puVar16[lVar12];
          if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
            do {
              uVar9 = uVar26;
              uVar26 = puVar20[uVar9];
              uVar18 = puVar16[uVar33];
            } while (puVar20[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = puVar20[uVar26];
            } while (puVar20[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            puVar20[uVar18] = uVar26;
          }
          goto LAB_00271d63;
        }
        puVar15[uVar33] = puVar15[iVar24];
        goto LAB_002729bc;
      }
      lVar17 = (lVar12 << 0x20) + 0x400000000 >> 0x20;
      if (pcVar41[lVar17] == '\0') {
        if (pcVar41[uVar33] == '\0') {
          puVar15[uVar33] = puVar15[iVar24];
          goto LAB_00276eae;
        }
        if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
          uVar26 = puVar16[iVar24];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar33];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_002744ac;
        }
        puVar15[uVar33] = puVar16[iVar24];
        goto LAB_002778d2;
      }
      if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
        if (pcVar41[uVar33] != '\0') {
          if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
            uVar26 = puVar16[iVar24];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[uVar33];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            do {
              uVar18 = uVar26;
              uVar9 = puVar16[lVar17];
              uVar26 = puVar6[uVar18];
            } while (puVar6[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = puVar6[uVar26];
            } while (puVar6[uVar26] < uVar26);
            goto LAB_00274a46;
          }
          uVar26 = puVar16[iVar24];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar17];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_00273a10;
        }
        uVar26 = puVar16[lVar17];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[iVar24];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_002744ff;
      }
      if (pcVar41[lVar12 + (1 - lVar23)] == '\0') {
        uVar26 = puVar16[iVar24];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar33];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        puVar15[uVar33] = uVar26;
      }
      else if (pcVar41[uVar33] == '\0') {
        if (pcVar41[uVar33 - lVar23] == '\0') {
          uVar26 = puVar16[iVar24];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar33];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027370e;
        }
        puVar15[uVar33] = puVar16[iVar24];
      }
      else {
        puVar15[uVar33] = puVar16[iVar24];
      }
      goto LAB_002775c6;
    }
    if (pcVar41[lVar12 + 3] != '\0') {
      puVar15[uVar33] = puVar16[uVar33];
      goto LAB_0027178d;
    }
    if (*(char *)(lVar21 + 3 + lVar12) != '\0') {
      lVar17 = (lVar12 << 0x20) + 0x400000000 >> 0x20;
      if (pcVar41[lVar17] != '\0') {
        if (pcVar41[uVar33] == '\0') {
          puVar15[uVar33] = puVar16[lVar17];
          goto LAB_002775c6;
        }
        uVar26 = puVar16[uVar33];
        if (pcVar41[lVar12 + (3 - lVar23)] == '\0') {
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar17];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027370e;
        }
        goto LAB_00274f7c;
      }
      if (pcVar41[uVar33] != '\0') {
        puVar15[uVar33] = puVar16[uVar33];
        goto LAB_002778d2;
      }
      UF::P_[UF::length_] = UF::length_;
      uVar26 = UF::length_ + 1;
      puVar15[uVar33] = UF::length_;
      UF::length_ = uVar26;
      goto LAB_00276eae;
    }
    if (pcVar41[uVar33] == '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar26 = UF::length_ + 1;
      puVar15[uVar33] = UF::length_;
      UF::length_ = uVar26;
      goto LAB_002729bc;
    }
    uVar26 = puVar16[uVar33];
LAB_00271d63:
    puVar15[uVar33] = uVar26;
    uVar36 = uVar33 + 2;
    lVar12 = lVar12 + 2;
    if (lVar10 <= (long)uVar36) goto LAB_00271d89;
  }
  lVar12 = lVar12 << 0x20;
  lVar17 = lVar12 + 0x300000000 >> 0x20;
  if (pcVar1[uVar33] != '\0') {
    if (*(char *)(lVar21 + lVar17) == '\0') {
      if (pcVar1[(lVar12 >> 0x20) + 1] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar26 = UF::length_ + 1;
        puVar15[uVar33] = UF::length_;
        UF::length_ = uVar26;
      }
      else {
        puVar15[uVar33] = puVar15[lVar12 >> 0x20];
      }
      goto LAB_00277c1d;
    }
    lVar35 = lVar12 + 0x100000000 >> 0x20;
    if (pcVar1[lVar35] == '\0') {
      if (pcVar41[lVar17] != '\0') goto LAB_0027380c;
      lVar12 = lVar12 + 0x400000000 >> 0x20;
      cVar8 = pcVar41[uVar33];
      if (pcVar41[lVar12] == '\0') goto LAB_00274bf9;
      if (cVar8 == '\0') {
        uVar26 = puVar16[lVar12];
        goto LAB_00274dcf;
      }
      uVar26 = puVar16[uVar33];
      if (pcVar41[lVar17 - lVar23] != '\0') goto LAB_00274f7c;
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar16[lVar12];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    else {
      if (pcVar41[lVar17] != '\0') {
        if (pcVar41[lVar35 - lVar23] == '\0') {
          uVar26 = puVar16[iVar24];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[uVar33];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
LAB_00274751:
          uVar18 = uVar26;
          if (uVar26 < uVar9) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
LAB_0027475e:
          puVar15[uVar33] = uVar26;
        }
        else {
          if (pcVar41[uVar33] == '\0') {
            uVar26 = puVar16[iVar24];
            if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_0027475e;
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[uVar33];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_00274751;
          }
          uVar26 = puVar16[iVar24];
LAB_00273e2f:
          puVar15[uVar33] = uVar26;
        }
        goto LAB_00271a79;
      }
      lVar12 = lVar12 + 0x400000000 >> 0x20;
      if (pcVar41[lVar12] == '\0') {
        if (pcVar41[uVar33] == '\0') {
          puVar15[uVar33] = puVar15[iVar24];
          goto LAB_00274de8;
        }
        if (pcVar41[lVar35 - lVar23] != '\0') {
          puVar15[uVar33] = puVar16[iVar24];
          goto LAB_00274c0f;
        }
        uVar26 = puVar16[iVar24];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar33];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
LAB_002744ac:
        uVar18 = uVar26;
        if (uVar26 < uVar9) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        puVar15[uVar33] = uVar26;
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002778d2;
      }
      if (pcVar41[lVar17 - lVar23] == '\0') {
        if (pcVar41[uVar33] == '\0') {
          uVar26 = puVar16[lVar12];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[iVar24];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
LAB_002744ff:
          uVar18 = uVar26;
          if (uVar26 < uVar9) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
        }
        else {
          if (pcVar41[lVar35 - lVar23] == '\0') {
            uVar26 = puVar16[iVar24];
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[uVar33];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            uVar18 = uVar26;
            if (uVar9 >= uVar26 && uVar9 != uVar26) {
              uVar18 = uVar9;
            }
            if (uVar9 < uVar26) {
              uVar26 = uVar9;
            }
            UF::P_[uVar18] = uVar26;
            do {
              uVar18 = uVar26;
              uVar9 = puVar16[lVar12];
              uVar26 = puVar6[uVar18];
            } while (puVar6[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = puVar6[uVar26];
            } while (puVar6[uVar26] < uVar26);
LAB_00274a46:
            uVar9 = uVar26;
            if (uVar26 < uVar18) {
              uVar9 = uVar18;
            }
            if (uVar18 < uVar26) {
              uVar26 = uVar18;
            }
            puVar6[uVar9] = uVar26;
            puVar15[uVar33] = uVar26;
            goto LAB_002775c6;
          }
          uVar26 = puVar16[iVar24];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar12];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
LAB_00273a10:
          uVar18 = uVar26;
          if (uVar26 < uVar9) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
        }
        puVar15[uVar33] = uVar26;
        goto LAB_002775c6;
      }
      if (pcVar41[lVar35 - lVar23] == '\0') {
        uVar26 = puVar16[iVar24];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar33];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027370e;
      }
      if (pcVar41[uVar33] != '\0') {
        uVar26 = puVar16[iVar24];
LAB_00274dcf:
        puVar15[uVar33] = uVar26;
        goto LAB_002775c6;
      }
      uVar26 = puVar16[iVar24];
      if (pcVar41[uVar33 - lVar23] != '\0') goto LAB_00274f7c;
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar16[uVar33];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
LAB_0027370e:
    uVar18 = uVar26;
    if (uVar26 < uVar9) {
      uVar18 = uVar9;
    }
    if (uVar9 < uVar26) {
      uVar26 = uVar9;
    }
    UF::P_[uVar18] = uVar26;
    puVar15[uVar33] = uVar26;
    goto LAB_002775c6;
  }
  if (*(char *)(lVar21 + lVar17) != '\0') goto code_r0x0027285f;
  cVar8 = pcVar1[lVar17];
joined_r0x00272736:
  if (cVar8 == '\0') goto LAB_00279c49;
  *(uint *)((long)UF::P_ + (ulong)UF::length_ * 4) = UF::length_;
  uVar26 = UF::length_ + 1;
  puVar15[uVar33] = UF::length_;
  UF::length_ = uVar26;
LAB_00275d77:
  puVar6 = UF::P_;
  iVar24 = (int)uVar33;
  uVar26 = iVar24 + 2;
  if (iVar37 <= (int)uVar26) {
LAB_00275ea8:
    puVar20 = UF::P_;
    uVar49 = (ulong)uVar26;
    if (iVar37 < (int)uVar26) {
      if (*(char *)(lVar21 + uVar49) == '\0') {
        if (pcVar1[uVar49] == '\0') goto LAB_002797b5;
        goto LAB_00278f6a;
      }
      lVar21 = (long)iVar24;
      if (pcVar41[lVar21 + 1] != '\0') {
        uVar26 = puVar16[lVar21];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar21];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027b412;
      }
      if (pcVar41[uVar49] == '\0') goto LAB_00278f6d;
      uVar26 = puVar16[uVar49];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[lVar21];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    else if (*(char *)(lVar21 + uVar49) == '\0') {
      uVar33 = (ulong)(iVar24 + 3);
      cVar8 = *(char *)(lVar21 + uVar33);
      if (pcVar1[uVar49] == '\0') goto joined_r0x002797a0;
      if (cVar8 == '\0') goto LAB_00278f6a;
      if (pcVar41[uVar33] != '\0') {
        uVar26 = puVar16[uVar49];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[iVar24];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027b412;
      }
      if (pcVar41[uVar49] == '\0') goto LAB_00278f6a;
      uVar26 = puVar16[uVar49];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[iVar24];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    else {
      if (pcVar41[(long)iVar24 + 3] != '\0') {
        if (pcVar41[uVar49] != '\0') {
          uVar26 = puVar16[uVar49];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[iVar24];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027b412;
        }
        if (pcVar41[(long)iVar24 + 1] == '\0') {
          uVar26 = puVar16[uVar49];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[iVar24];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027b412;
        }
        if (pcVar41[uVar49 - lVar23] != '\0') {
          uVar26 = puVar16[iVar24];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar15[iVar24];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_0027b412;
        }
        uVar26 = puVar16[iVar24];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[uVar49];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = puVar15[iVar24];
          uVar26 = puVar20[uVar18];
        } while (puVar20[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar20[uVar26];
        } while (puVar20[uVar26] < uVar26);
        goto LAB_002783da;
      }
      if (pcVar41[(long)iVar24 + 1] != '\0') {
        uVar26 = puVar16[iVar24];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[iVar24];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_0027b412;
      }
      if (pcVar41[uVar49] == '\0') {
        uVar26 = puVar15[iVar24];
        goto LAB_002795db;
      }
      uVar26 = puVar16[uVar49];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[iVar24];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    goto LAB_0027b412;
  }
  lVar45 = (long)iVar24;
  lVar12 = lVar45 + 2;
  lVar28 = lVar45 << 0x20;
  lVar17 = lVar11 + lVar39 + lVar45;
  lVar35 = lVar11 + lVar23 * lVar19 + lVar45;
  local_80 = lVar45 * 4;
  puVar40 = (uint *)(lVar34 + lVar14 + lVar45 * 4 + 8);
  lVar52 = 0;
  puVar20 = puVar40;
LAB_00275dff:
  puVar7 = UF::P_;
  lVar51 = lVar28 >> 0x1e;
  if (*(char *)(lVar17 + 2 + lVar52) == '\0') {
    if (*(char *)(lVar35 + 2 + lVar52) == '\0') {
      if (*(char *)(lVar17 + 3 + lVar52) != '\0') {
        uVar33 = lVar12 + lVar52;
        lVar17 = lVar23 * lVar27 + lVar45 + lVar11;
        if (*(char *)(lVar52 + 3 + lVar17) != '\0') {
          *(undefined4 *)(lVar34 + local_80 + lVar14 + 8 + lVar52 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
          goto LAB_00271a79;
        }
        lVar35 = lVar28 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar52 + 2 + lVar17);
        if (pcVar41[lVar35] == '\0') {
          if (cVar8 == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = UF::length_;
            UF::length_ = uVar26;
            goto LAB_00276eae;
          }
          *(undefined4 *)(lVar34 + local_80 + lVar14 + 8 + lVar52 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
          goto LAB_002778d2;
        }
        if (cVar8 == '\0') {
          *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = puVar16[lVar35];
        }
        else {
          uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
          if (*(char *)(lVar52 + 3 + lVar23 * lVar32 + lVar45 + lVar11) == '\0') {
            do {
              uVar18 = uVar26;
              uVar26 = UF::P_[uVar18];
              uVar9 = puVar16[lVar35];
            } while (UF::P_[uVar18] < uVar18);
            do {
              uVar26 = uVar9;
              uVar9 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_00276de5;
          }
          *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
        }
        goto LAB_002775c6;
      }
      if (*(char *)(lVar35 + 3 + lVar52) == '\0') goto LAB_002761bf;
      puVar6[UF::length_] = UF::length_;
      uVar26 = UF::length_ + 1;
      puVar40[lVar52] = UF::length_;
      UF::length_ = uVar26;
      lVar28 = lVar28 + 0x200000000;
      puVar20 = puVar20 + 2;
      lVar51 = lVar12 + lVar52;
      lVar52 = lVar52 + 2;
      if (lVar10 <= lVar51 + 2) {
        iVar24 = iVar24 + (int)lVar52;
        uVar26 = (int)lVar12 + (int)lVar52;
        goto LAB_00275ea8;
      }
      goto LAB_00275dff;
    }
    uVar33 = lVar12 + lVar52;
    lVar17 = lVar28 + 0x300000000 >> 0x20;
    if (*(char *)(lVar21 + lVar17) == '\0') goto LAB_00277336;
    if (pcVar41[lVar17] != '\0') {
      uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = *(uint *)((long)puVar15 + lVar51);
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
      goto LAB_00271a79;
    }
    lVar35 = lVar28 + 0x400000000 >> 0x20;
    if (pcVar41[lVar35] == '\0') {
      if (*(char *)(lVar52 + 2 + lVar23 * lVar27 + lVar45 + lVar11) == '\0') {
        *(undefined4 *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) =
             *(undefined4 *)((long)puVar15 + lVar51);
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_00276eae;
      }
      uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = *(uint *)((long)puVar15 + lVar51);
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
LAB_00276c70:
      uVar33 = lVar12 + lVar52;
      uVar18 = uVar26;
      if (uVar26 < uVar9) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
      goto LAB_002778d2;
    }
    if (pcVar41[lVar17 - lVar23] == '\0') {
      if (*(char *)(lVar52 + 2 + lVar23 * lVar27 + lVar45 + lVar11) != '\0') {
        uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[lVar35];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = *(uint *)((long)puVar15 + lVar51);
          uVar26 = puVar7[uVar18];
        } while (puVar7[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar7[uVar26];
        } while (puVar7[uVar26] < uVar26);
LAB_00276bd6:
        uVar33 = lVar12 + lVar52;
        uVar9 = uVar26;
        if (uVar26 < uVar18) {
          uVar9 = uVar18;
        }
        if (uVar18 < uVar26) {
          uVar26 = uVar18;
        }
        puVar7[uVar9] = uVar26;
        *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
        goto LAB_002775c6;
      }
      uVar26 = puVar16[lVar35];
      do {
        uVar18 = uVar26;
        uVar26 = UF::P_[uVar18];
        uVar9 = *(uint *)((long)puVar15 + lVar51);
      } while (UF::P_[uVar18] < uVar18);
      do {
        uVar26 = uVar9;
        uVar9 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
    else {
      uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
      do {
        uVar18 = uVar26;
        uVar26 = UF::P_[uVar18];
        uVar9 = *(uint *)((long)puVar15 + lVar51);
      } while (UF::P_[uVar18] < uVar18);
      do {
        uVar26 = uVar9;
        uVar9 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
    }
LAB_00276de5:
    uVar33 = lVar12 + lVar52;
    uVar9 = uVar26;
    if (uVar26 < uVar18) {
      uVar9 = uVar18;
    }
    if (uVar18 < uVar26) {
      uVar26 = uVar18;
    }
    puVar7[uVar9] = uVar26;
    *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
    goto LAB_002775c6;
  }
  uVar33 = lVar12 + lVar52;
  lVar17 = lVar28 + 0x300000000 >> 0x20;
  lVar35 = lVar28 >> 0x20;
  if (pcVar41[lVar17] == '\0') {
    if (*(char *)(lVar21 + lVar17) == '\0') {
      if (pcVar41[lVar35 + 1] == '\0') goto LAB_00276a58;
      uVar26 = puVar16[lVar35];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[lVar35];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      uVar36 = uVar33 & 0xffffffff;
      goto LAB_00279017;
    }
    lVar28 = lVar28 + 0x400000000 >> 0x20;
    if (pcVar41[lVar28] == '\0') {
      if (pcVar41[lVar35 + 1] != '\0') {
        uVar26 = puVar16[lVar35];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar35];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        goto LAB_00278d3a;
      }
      if (*(char *)(lVar52 + 2 + lVar23 * lVar27 + lVar45 + lVar11) != '\0') {
        uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar35];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_00276c70;
      }
      *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = puVar15[lVar35];
      uVar33 = uVar33 & 0xffffffff;
      goto LAB_00276eae;
    }
    if (*(char *)(lVar52 + 2 + lVar23 * lVar27 + lVar45 + lVar11) == '\0') {
      if (pcVar41[lVar35 + 1] == '\0') {
        uVar26 = puVar16[lVar28];
        do {
          uVar18 = uVar26;
          uVar26 = UF::P_[uVar18];
          uVar9 = puVar15[lVar35];
        } while (UF::P_[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        goto LAB_00276de5;
      }
      if (pcVar41[lVar17 - lVar23] == '\0') {
        uVar26 = puVar16[lVar35];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[lVar28];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = puVar15[lVar35];
          uVar26 = puVar7[uVar18];
        } while (puVar7[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar7[uVar26];
        } while (puVar7[uVar26] < uVar26);
        goto LAB_00276de5;
      }
      if (*(char *)(lVar52 + 2 + lVar23 * lVar32 + lVar45 + lVar11) == '\0') {
        uVar26 = puVar16[lVar35];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = puVar15[lVar35];
          uVar26 = puVar7[uVar18];
        } while (puVar7[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar7[uVar26];
        } while (puVar7[uVar26] < uVar26);
        uVar36 = (ulong)uVar26;
        if (uVar18 >= uVar26 && uVar18 != uVar26) {
          uVar36 = (ulong)uVar18;
        }
        if (uVar18 < uVar26) {
          uVar26 = uVar18;
        }
        puVar7[uVar36] = uVar26;
        goto LAB_00276385;
      }
      uVar26 = puVar16[lVar35];
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar15[lVar35];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
      *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
    }
    else {
      uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
      if (pcVar41[lVar17 - lVar23] == '\0') {
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar16[lVar28];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = *(uint *)((long)puVar15 + lVar51);
          uVar26 = puVar7[uVar18];
        } while (puVar7[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar7[uVar26];
        } while (puVar7[uVar26] < uVar26);
        goto LAB_00276bd6;
      }
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = *(uint *)((long)puVar15 + lVar51);
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      uVar18 = uVar26;
      if (uVar9 >= uVar26 && uVar9 != uVar26) {
        uVar18 = uVar9;
      }
      if (uVar9 < uVar26) {
        uVar26 = uVar9;
      }
      UF::P_[uVar18] = uVar26;
LAB_00276385:
      *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
    }
    goto LAB_002775c6;
  }
  if (*(char *)(lVar52 + 2 + lVar23 * lVar27 + lVar45 + lVar11) == '\0') {
    if (pcVar41[lVar35 + 1] != '\0') {
      if (*(char *)(lVar52 + 2 + lVar23 * lVar32 + lVar45 + lVar11) == '\0') {
        uVar26 = puVar16[lVar35];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        do {
          uVar18 = uVar26;
          uVar9 = puVar15[lVar35];
          uVar26 = puVar7[uVar18];
        } while (puVar7[uVar18] < uVar18);
        do {
          uVar26 = uVar9;
          uVar9 = puVar7[uVar26];
        } while (puVar7[uVar26] < uVar26);
        uVar36 = (ulong)uVar26;
        if (uVar18 >= uVar26 && uVar18 != uVar26) {
          uVar36 = (ulong)uVar18;
        }
        if (uVar18 < uVar26) {
          uVar26 = uVar18;
        }
        puVar7[uVar36] = uVar26;
        *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
      }
      else {
        uVar26 = puVar16[lVar35];
        do {
          uVar9 = uVar26;
          uVar26 = UF::P_[uVar9];
          uVar18 = puVar15[lVar35];
        } while (UF::P_[uVar9] < uVar9);
        do {
          uVar26 = uVar18;
          uVar18 = UF::P_[uVar26];
        } while (UF::P_[uVar26] < uVar26);
        uVar18 = uVar26;
        if (uVar9 >= uVar26 && uVar9 != uVar26) {
          uVar18 = uVar9;
        }
        if (uVar9 < uVar26) {
          uVar26 = uVar9;
        }
        UF::P_[uVar18] = uVar26;
        *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
      }
      goto LAB_0027178d;
    }
    uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = puVar15[lVar35];
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
  }
  else {
    uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = *(uint *)((long)puVar15 + lVar51);
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
  }
  uVar18 = uVar26;
  if (uVar26 < uVar9) {
    uVar18 = uVar9;
  }
  if (uVar9 < uVar26) {
    uVar26 = uVar9;
  }
  UF::P_[uVar18] = uVar26;
  *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
  goto LAB_0027178d;
LAB_00276a58:
  if (*(char *)(lVar52 + 2 + lVar23 * lVar27 + lVar45 + lVar11) == '\0') {
    *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = puVar15[lVar35];
    goto LAB_002729bc;
  }
  uVar26 = *(uint *)(lVar47 * lVar32 + local_80 + lVar34 + 8 + lVar52 * 4);
  do {
    uVar9 = uVar26;
    uVar26 = UF::P_[uVar9];
    uVar18 = puVar15[lVar35];
  } while (UF::P_[uVar9] < uVar9);
  do {
    uVar26 = uVar18;
    uVar18 = UF::P_[uVar26];
  } while (UF::P_[uVar26] < uVar26);
  uVar18 = uVar26;
  if (uVar9 >= uVar26 && uVar9 != uVar26) {
    uVar18 = uVar9;
  }
  if (uVar9 < uVar26) {
    uVar26 = uVar9;
  }
  UF::P_[uVar18] = uVar26;
  *(uint *)(local_80 + lVar14 + lVar34 + 8 + lVar52 * 4) = uVar26;
  goto LAB_00271c6e;
LAB_002761bf:
  uVar33 = (ulong)(uint)((int)lVar12 + (int)lVar52);
LAB_0027519e:
  *puVar20 = 0;
  iVar24 = (int)uVar33;
  uVar26 = iVar24 + 2;
  if ((int)uVar26 < iVar37) {
    lVar51 = (long)iVar24;
    lVar12 = lVar51 + 2;
    lVar52 = lVar51 << 0x20;
    lVar45 = lVar39 + lVar51 + lVar11;
    lVar35 = lVar11 + lVar23 * lVar19 + lVar51;
    lVar17 = lVar14 + lVar51 * 4;
    lVar44 = lVar34 + lVar17 + 8;
    lVar28 = 0;
    while (*(char *)(lVar45 + 2 + lVar28) == '\0') {
      if (*(char *)(lVar35 + 2 + lVar28) != '\0') {
        uVar33 = lVar12 + lVar28;
        lVar35 = lVar52 + 0x300000000 >> 0x20;
        if (*(char *)(lVar21 + lVar35) == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
          UF::length_ = uVar26;
          uVar33 = uVar33 & 0xffffffff;
          goto LAB_00277c1d;
        }
        if (pcVar41[lVar35] != '\0') {
LAB_0027549d:
          uVar33 = lVar12 + lVar28;
          *(undefined4 *)(lVar44 + lVar28 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
          goto LAB_002754bc;
        }
        lVar45 = lVar52 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar51 + lVar11);
        if (pcVar41[lVar45] == '\0') {
          if (cVar8 == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
            UF::length_ = uVar26;
            goto LAB_00276eae;
          }
          *(undefined4 *)(lVar44 + lVar28 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
          goto LAB_002778d2;
        }
        if (cVar8 == '\0') {
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar16[lVar45];
          goto LAB_0027a68f;
        }
        uVar26 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
        if (pcVar41[lVar35 - lVar23] == '\0') {
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar45];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          goto LAB_00275b70;
        }
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002775c6;
      }
      if (*(char *)(lVar45 + 3 + lVar28) != '\0') {
        uVar33 = lVar12 + lVar28;
        lVar35 = lVar23 * lVar27 + lVar51 + lVar11;
        if (*(char *)(lVar28 + 3 + lVar35) != '\0') goto LAB_0027549d;
        lVar45 = lVar52 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar28 + 2 + lVar35);
        if (pcVar41[lVar45] == '\0') {
          if (cVar8 == '\0') goto LAB_00275bcb;
          *(undefined4 *)(lVar44 + lVar28 * 4) =
               *(undefined4 *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
          goto LAB_002778d2;
        }
        if (cVar8 == '\0') {
          uVar26 = puVar16[lVar45];
          goto LAB_00278b7a;
        }
        uVar26 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
        if (*(char *)(lVar28 + 3 + lVar23 * lVar32 + lVar51 + lVar11) == '\0') {
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar45];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
LAB_00275b70:
          uVar18 = uVar26;
          if (uVar26 < uVar9) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
          goto LAB_00275b8f;
        }
        *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002775c6;
      }
      if (*(char *)(lVar35 + 3 + lVar28) != '\0') goto LAB_002754d0;
      *(undefined4 *)(lVar44 + lVar28 * 4) = 0;
      lVar52 = lVar52 + 0x200000000;
      lVar42 = lVar28 + lVar12;
      lVar28 = lVar28 + 2;
      if (lVar10 <= lVar42 + 2) {
        iVar24 = iVar24 + (int)lVar28;
        uVar26 = (int)lVar12 + (int)lVar28;
        goto LAB_0027528e;
      }
    }
    uVar33 = lVar12 + lVar28;
    uVar18 = (uint)uVar33;
    lVar45 = lVar52 + 0x300000000 >> 0x20;
    lVar35 = lVar52 >> 0x20;
    if (pcVar41[lVar45] == '\0') {
      if (*(char *)(lVar21 + lVar45) != '\0') {
        lVar52 = lVar52 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar51 + lVar11);
        if (pcVar41[lVar52] == '\0') {
          if (cVar8 != '\0') {
            *(undefined4 *)(lVar44 + lVar28 * 4) =
                 *(undefined4 *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
            goto LAB_002778d2;
          }
          if (pcVar41[lVar35 + 1] == '\0') {
LAB_00275bcb:
            uVar33 = lVar12 + lVar28;
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
            UF::length_ = uVar26;
          }
          else {
            *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar16[lVar35];
          }
          goto LAB_00276eae;
        }
        if (cVar8 != '\0') {
          uVar26 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
          if (pcVar41[lVar45 - lVar23] == '\0') {
            do {
              uVar9 = uVar26;
              uVar26 = UF::P_[uVar9];
              uVar18 = puVar16[lVar52];
            } while (UF::P_[uVar9] < uVar9);
            do {
              uVar26 = uVar18;
              uVar18 = UF::P_[uVar26];
            } while (UF::P_[uVar26] < uVar26);
            goto LAB_00275b70;
          }
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
          uVar33 = uVar33 & 0xffffffff;
          goto LAB_002775c6;
        }
        if (pcVar41[lVar35 + 1] == '\0') {
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar16[lVar52];
          uVar33 = uVar33 & 0xffffffff;
          goto LAB_002775c6;
        }
        if (pcVar41[lVar45 - lVar23] == '\0') {
          uVar26 = puVar16[lVar35];
          do {
            uVar9 = uVar26;
            uVar26 = UF::P_[uVar9];
            uVar18 = puVar16[lVar52];
          } while (UF::P_[uVar9] < uVar9);
          do {
            uVar26 = uVar18;
            uVar18 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar18 = uVar26;
          if (uVar9 >= uVar26 && uVar9 != uVar26) {
            uVar18 = uVar9;
          }
          if (uVar9 < uVar26) {
            uVar26 = uVar9;
          }
          UF::P_[uVar18] = uVar26;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
LAB_00275b8f:
          uVar33 = lVar12 + lVar28 & 0xffffffff;
        }
        else {
          uVar26 = puVar16[lVar35];
          if (*(char *)(lVar28 + 2 + lVar23 * lVar32 + lVar51 + lVar11) != '\0') goto LAB_00279a5f;
          do {
            uVar18 = uVar26;
            uVar9 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
            uVar26 = UF::P_[uVar18];
          } while (UF::P_[uVar18] < uVar18);
          do {
            uVar26 = uVar9;
            uVar9 = UF::P_[uVar26];
          } while (UF::P_[uVar26] < uVar26);
          uVar36 = (ulong)uVar26;
          if (uVar18 >= uVar26 && uVar18 != uVar26) {
            uVar36 = (ulong)uVar18;
          }
          if (uVar18 < uVar26) {
            uVar26 = uVar18;
          }
          UF::P_[uVar36] = uVar26;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
          uVar33 = uVar33 & 0xffffffff;
        }
        goto LAB_002775c6;
      }
      if (*(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar51 + lVar11) == '\0') {
        if (pcVar41[lVar35 + 1] == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar26 = UF::length_ + 1;
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
          UF::length_ = uVar26;
        }
        else {
          *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar16[lVar35];
        }
        uVar33 = uVar33 & 0xffffffff;
        goto LAB_002729bc;
      }
      *(undefined4 *)(lVar44 + lVar28 * 4) =
           *(undefined4 *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
LAB_002799a0:
      uVar33 = uVar33 & 0xffffffff;
      goto LAB_00271c6e;
    }
    if ((*(char *)(lVar28 + 2 + lVar23 * lVar27 + lVar51 + lVar11) != '\0') ||
       (pcVar41[lVar35 + 1] == '\0')) {
      *(undefined4 *)(lVar44 + lVar28 * 4) =
           *(undefined4 *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
      goto LAB_00278210;
    }
    if (*(char *)(lVar28 + 2 + lVar23 * lVar32 + lVar51 + lVar11) != '\0') {
      *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = puVar16[lVar35];
      goto LAB_00278210;
    }
    uVar26 = puVar16[lVar35];
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = *(uint *)(lVar47 * lVar32 + lVar51 * 4 + lVar34 + 8 + lVar28 * 4);
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
    uVar18 = uVar26;
    if (uVar9 >= uVar26 && uVar9 != uVar26) {
      uVar18 = uVar9;
    }
    if (uVar9 < uVar26) {
      uVar26 = uVar9;
    }
    UF::P_[uVar18] = uVar26;
    *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = uVar26;
    uVar33 = uVar33 & 0xffffffff;
    goto LAB_0027178d;
  }
LAB_0027528e:
  uVar49 = (ulong)uVar26;
  if (iVar37 < (int)uVar26) {
    if (*(char *)(lVar21 + uVar49) == '\0') {
      cVar8 = pcVar1[uVar49];
      goto LAB_0027534e;
    }
    if (pcVar41[uVar49] != '\0') goto LAB_00275556;
    lVar21 = (long)iVar24;
    if (pcVar41[lVar21 + 1] != '\0') goto LAB_002752bc;
    goto LAB_0027556c;
  }
  if (*(char *)(lVar21 + uVar49) != '\0') {
    lVar21 = (long)iVar24;
    if (pcVar41[lVar21 + 3] == '\0') {
      if (pcVar41[uVar49] != '\0') goto LAB_00275527;
      if (pcVar41[lVar21 + 1] != '\0') goto LAB_0027570f;
      goto LAB_00275359;
    }
    if ((pcVar41[uVar49] != '\0') || (pcVar41[lVar21 + 1] == '\0')) goto LAB_00275527;
    uVar26 = puVar16[lVar21];
    if (pcVar41[uVar49 - lVar23] != '\0') goto LAB_0027533c;
    do {
      uVar9 = uVar26;
      uVar26 = UF::P_[uVar9];
      uVar18 = puVar16[uVar49];
    } while (UF::P_[uVar9] < uVar9);
    do {
      uVar26 = uVar18;
      uVar18 = UF::P_[uVar26];
    } while (UF::P_[uVar26] < uVar26);
LAB_0027532f:
    uVar18 = uVar26;
    if (uVar26 < uVar9) {
      uVar18 = uVar9;
    }
    if (uVar9 < uVar26) {
      uVar26 = uVar9;
    }
    UF::P_[uVar18] = uVar26;
LAB_0027533c:
    puVar15[uVar49] = uVar26;
LAB_0027b423:
    lVar38 = lVar38 + 2;
    lVar32 = lVar32 + 2;
    lVar27 = lVar27 + 2;
    lVar19 = lVar19 + 2;
    if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 <= lVar38)
    goto LAB_0027b721;
    goto LAB_00271692;
  }
  uVar33 = (ulong)(iVar24 + 3);
  if (pcVar1[uVar49] == '\0') {
    if (*(char *)(lVar21 + uVar33) != '\0') goto LAB_0027554b;
    if (pcVar1[uVar33] == '\0') goto LAB_00275841;
  }
  else if (*(char *)(lVar21 + uVar33) != '\0') {
LAB_0027554b:
    if (pcVar41[uVar33] != '\0') goto LAB_00275556;
    cVar8 = pcVar41[uVar49];
    goto LAB_0027572f;
  }
  UF::P_[UF::length_] = UF::length_;
  uVar26 = UF::length_;
  goto LAB_00275838;
LAB_002754d0:
  uVar33 = (ulong)(uint)((int)lVar12 + (int)lVar28);
  UF::P_[UF::length_] = UF::length_;
  uVar26 = UF::length_ + 1;
  *(uint *)(lVar17 + lVar34 + 8 + lVar28 * 4) = UF::length_;
  UF::length_ = uVar26;
  goto LAB_00275d77;
code_r0x0027285f:
  if (pcVar41[lVar17] == '\0') {
    lVar12 = lVar12 + 0x400000000 >> 0x20;
    cVar8 = pcVar41[uVar33];
    if (pcVar41[lVar12] == '\0') goto joined_r0x00274eb1;
    if (cVar8 == '\0') {
      uVar26 = puVar16[lVar12];
      goto LAB_002745f8;
    }
    uVar26 = puVar16[uVar33];
    if (pcVar41[lVar17 - lVar23] == '\0') {
      do {
        uVar9 = uVar26;
        uVar26 = UF::P_[uVar9];
        uVar18 = puVar16[lVar12];
      } while (UF::P_[uVar9] < uVar9);
      do {
        uVar26 = uVar18;
        uVar18 = UF::P_[uVar26];
      } while (UF::P_[uVar26] < uVar26);
      goto LAB_0027370e;
    }
    goto LAB_00274f7c;
  }
  uVar26 = puVar16[uVar33];
LAB_00273cda:
  puVar15[uVar33] = uVar26;
  goto LAB_00271a79;
LAB_0027380c:
  puVar15[uVar33] = puVar16[uVar33];
  goto LAB_00271a79;
LAB_00274bf9:
  if (cVar8 != '\0') {
    puVar15[uVar33] = puVar16[uVar33];
LAB_00274c0f:
    uVar33 = uVar33 & 0xffffffff;
    goto LAB_002778d2;
  }
  UF::P_[UF::length_] = UF::length_;
  uVar26 = UF::length_ + 1;
  puVar15[uVar33] = UF::length_;
  UF::length_ = uVar26;
LAB_00274de8:
  uVar33 = uVar33 & 0xffffffff;
  goto LAB_00276eae;
LAB_0027c58f:
  uVar36 = lVar21 + lVar35;
  lVar21 = lVar45 + 0x300000000 >> 0x20;
  if (*(char *)(lVar10 + lVar21) == '\0') goto LAB_0027c275;
  if (*(char *)(lVar23 + lVar21) != '\0') goto LAB_0027c1da;
  lVar21 = lVar45 + 0x400000000 >> 0x20;
  if (*(char *)(lVar23 + lVar21) == '\0') {
LAB_0027ca3f:
    puVar15[UF::length_] = UF::length_;
    uVar31 = UF::length_;
    UF::length_ = UF::length_ + 1;
LAB_0027bd17:
    iVar30 = (int)uVar36;
LAB_0027bd1a:
    *(uint *)(lVar19 + uVar36 * 4) = uVar31;
    puVar16 = UF::P_;
    uVar31 = iVar30 + 2;
    if ((int)uVar31 < iVar37) {
      lVar45 = (long)iVar30;
      lVar21 = lVar45 + 2;
      lVar35 = lVar45 << 0x20;
      lVar34 = lVar27 + lVar45;
      lVar51 = 0;
LAB_0027bd5c:
      if (*(char *)(lVar32 + lVar45 + -1 + lVar51) == '\0') {
        if (*(char *)(lVar32 + lVar45 + lVar51) == '\0') goto LAB_0027c272;
        if (*(char *)(lVar34 + -1 + lVar51) != '\0') {
          uVar36 = lVar21 + lVar51;
LAB_0027be50:
          iVar30 = (int)uVar36;
LAB_0027c1dd:
          *(undefined4 *)(lVar19 + uVar36 * 4) = *(undefined4 *)(lVar11 + uVar36 * 4);
          uVar31 = iVar30 + 2;
          if ((int)uVar31 < iVar37) {
            lVar52 = (long)iVar30;
            lVar21 = lVar52 + 2;
            lVar35 = lVar52 << 0x20;
            lVar34 = lVar39 + lVar52;
            lVar45 = lVar12 + lVar52 * 4;
            lVar51 = 0;
LAB_0027c229:
            if (*(char *)(lVar32 + lVar52 + -1 + lVar51) == '\0') {
              if (*(char *)(lVar32 + lVar52 + lVar51) != '\0') {
                if (*(char *)(lVar34 + 1 + lVar51) != '\0') goto code_r0x0027c244;
                uVar36 = lVar21 + lVar51;
                lVar21 = lVar35 + 0x400000000 >> 0x20;
                if (*(char *)(lVar23 + lVar21) == '\0') {
                  if (*(char *)(lVar51 + lVar34) != '\0') goto LAB_0027c395;
                  puVar15[UF::length_] = UF::length_;
                  uVar31 = UF::length_;
                  UF::length_ = UF::length_ + 1;
                  goto LAB_0027bd17;
                }
                if (*(char *)(lVar51 + lVar34) == '\0') {
LAB_0027c3a4:
                  uVar31 = *(uint *)(lVar11 + lVar21 * 4);
                }
                else {
                  uVar31 = *(uint *)(lVar45 + lVar51 * 4);
                  if (*(char *)(lVar51 + lVar52 + lVar14) == '\0') {
                    do {
                      uVar26 = uVar31;
                      uVar31 = puVar15[uVar26];
                      uVar3 = *(uint *)(lVar11 + lVar21 * 4);
                    } while (puVar15[uVar26] < uVar26);
                    do {
                      uVar31 = uVar3;
                      uVar3 = puVar15[uVar31];
                    } while (puVar15[uVar31] < uVar31);
                    goto LAB_0027cb6d;
                  }
                }
                goto LAB_0027c3b2;
              }
LAB_0027c272:
              uVar36 = lVar21 + lVar51;
LAB_0027c275:
              iVar30 = (int)uVar36;
LAB_0027b964:
              *(undefined4 *)(lVar19 + uVar36 * 4) = 0;
              iVar24 = iVar30 + 2;
              if (iVar24 < iVar37) {
                lVar35 = (long)iVar30;
                lVar34 = lVar35 + 2;
                lVar21 = lVar35 << 0x20;
                lVar45 = 0;
LAB_0027b99d:
                if (*(char *)(lVar32 + lVar35 + -1 + lVar45) != '\0') goto LAB_0027b9d9;
                if (*(char *)(lVar32 + lVar35 + lVar45) == '\0') goto code_r0x0027b9ac;
                uVar36 = lVar34 + lVar45;
                if (*(char *)(lVar45 + 1 + lVar39 + lVar35) != '\0') goto LAB_0027be50;
                lVar21 = lVar21 + 0x400000000 >> 0x20;
                cVar8 = *(char *)(lVar45 + lVar39 + lVar35);
                if (*(char *)(lVar23 + lVar21) != '\0') {
                  if (cVar8 == '\0') goto LAB_0027c3a4;
                  uVar31 = *(uint *)(lVar12 + lVar35 * 4 + lVar45 * 4);
                  if (*(char *)(lVar45 + lVar14 + lVar35) == '\0') {
                    do {
                      uVar26 = uVar31;
                      uVar31 = puVar15[uVar26];
                      uVar3 = *(uint *)(lVar11 + lVar21 * 4);
                    } while (puVar15[uVar26] < uVar26);
                    do {
                      uVar31 = uVar3;
                      uVar3 = puVar15[uVar31];
                    } while (puVar15[uVar31] < uVar31);
                    goto LAB_0027bf36;
                  }
                  goto LAB_0027c3b2;
                }
                if (cVar8 == '\0') goto LAB_0027bbe3;
LAB_0027c395:
                iVar30 = (int)uVar36;
                goto LAB_0027c067;
              }
LAB_0027cc19:
              lVar38 = (long)iVar24;
              if (iVar37 < iVar24) {
                if (*(char *)(lVar10 + lVar38) != '\0') {
                  if (*(char *)(lVar23 + lVar38) == '\0') {
                    if (*(char *)(lVar23 + 1 + (long)iVar30) == '\0') {
                      UF::P_[UF::length_] = UF::length_;
                      uVar31 = UF::length_ + 1;
                      *(uint *)(lVar19 + lVar38 * 4) = UF::length_;
                      UF::length_ = uVar31;
                      return;
                    }
                    uVar29 = *(undefined4 *)(lVar11 + (long)iVar30 * 4);
                  }
                  else {
                    uVar29 = *(undefined4 *)(lVar11 + lVar38 * 4);
                  }
                  *(undefined4 *)(lVar19 + lVar38 * 4) = uVar29;
                  return;
                }
                goto LAB_0027cf21;
              }
              if (*(char *)(lVar10 + lVar38) == '\0') {
                lVar27 = (long)iVar30;
                goto LAB_0027cf9d;
              }
              lVar10 = (long)iVar30;
              if (*(char *)(lVar23 + 3 + lVar10) == '\0') {
                if (*(char *)(lVar23 + lVar38) != '\0') goto LAB_0027d1e9;
                if (*(char *)(lVar23 + 1 + lVar10) == '\0') goto LAB_0027d22f;
                goto LAB_0027d04f;
              }
              if ((*(char *)(lVar23 + lVar38) != '\0') || (*(char *)(lVar23 + 1 + lVar10) == '\0'))
              goto LAB_0027d1e9;
              uVar31 = *(uint *)(lVar11 + lVar10 * 4);
              if (*(char *)(lVar17 + lVar38) == '\0') {
                do {
                  uVar26 = uVar31;
                  uVar31 = UF::P_[uVar26];
                  uVar3 = *(uint *)(lVar11 + lVar38 * 4);
                } while (UF::P_[uVar26] < uVar26);
                do {
                  uVar31 = uVar3;
                  uVar3 = UF::P_[uVar31];
                } while (UF::P_[uVar31] < uVar31);
                goto LAB_0027d267;
              }
              goto LAB_0027d274;
            }
            uVar36 = lVar21 + lVar51;
            lVar28 = lVar35 + 0x300000000 >> 0x20;
            lVar21 = lVar35 >> 0x1e;
            if (*(char *)(lVar23 + lVar28) != '\0') {
              if (*(char *)(lVar51 + lVar34) == '\0') {
                if (*(char *)(lVar51 + -1 + lVar52 + lVar14) == '\0') {
                  uVar31 = *(uint *)(lVar45 + lVar51 * 4);
                  do {
                    uVar26 = uVar31;
                    uVar31 = puVar15[uVar26];
                    uVar3 = *(uint *)(lVar19 + lVar21);
                  } while (puVar15[uVar26] < uVar26);
                  do {
                    uVar31 = uVar3;
                    uVar3 = puVar15[uVar31];
                  } while (puVar15[uVar31] < uVar31);
                  goto LAB_0027c7d0;
                }
                uVar31 = *(uint *)(lVar11 + lVar21);
              }
              else {
                uVar31 = *(uint *)(lVar45 + lVar51 * 4);
              }
              goto LAB_0027c3f4;
            }
            if (*(char *)(lVar10 + lVar28) == '\0') goto LAB_0027c3be;
            lVar44 = lVar35 + 0x400000000 >> 0x20;
            if (*(char *)(lVar23 + lVar44) == '\0') goto LAB_0027c400;
            if (*(char *)(lVar17 + lVar28) != '\0') {
              if (*(char *)(lVar51 + lVar34) == '\0') {
                if (*(char *)(lVar51 + -1 + lVar52 + lVar14) == '\0') {
                  uVar31 = *(uint *)(lVar45 + lVar51 * 4);
                  do {
                    uVar26 = uVar31;
                    uVar31 = puVar15[uVar26];
                    uVar3 = *(uint *)(lVar19 + lVar21);
                  } while (puVar15[uVar26] < uVar26);
                  do {
                    uVar31 = uVar3;
                    uVar3 = puVar15[uVar31];
                  } while (puVar15[uVar31] < uVar31);
                  goto LAB_0027cb6d;
                }
                uVar31 = *(uint *)(lVar11 + lVar21);
              }
              else {
                uVar31 = *(uint *)(lVar45 + lVar51 * 4);
              }
              goto LAB_0027c3b2;
            }
            uVar31 = *(uint *)(lVar11 + lVar44 * 4);
            do {
              uVar26 = uVar31;
              uVar31 = puVar15[uVar26];
              uVar3 = *(uint *)(lVar19 + lVar21);
            } while (puVar15[uVar26] < uVar26);
            do {
              uVar31 = uVar3;
              uVar3 = puVar15[uVar31];
            } while (puVar15[uVar31] < uVar31);
            goto LAB_0027cb6d;
          }
LAB_0027ccc6:
          uVar36 = (ulong)uVar31;
          if (iVar37 < (int)uVar31) goto LAB_0027ce16;
          lVar38 = (long)(int)uVar31;
          if (*(char *)(lVar10 + lVar38) == '\0') {
            if (*(char *)((long)iVar30 + 3 + lVar10) == '\0') goto LAB_0027d10b;
            if ((*(char *)(lVar23 + 3 + (long)iVar30) != '\0') ||
               (*(char *)(lVar23 + lVar38) != '\0')) goto LAB_0027d1e9;
LAB_0027d22f:
            UF::P_[UF::length_] = UF::length_;
            uVar31 = UF::length_;
            goto LAB_0027d2af;
          }
          lVar10 = (long)iVar30;
          if (*(char *)(lVar23 + 3 + lVar10) == '\0') goto LAB_0027cfc8;
          if (*(char *)(lVar23 + lVar38) != '\0') goto LAB_0027d1e9;
          if (*(char *)(lVar17 + lVar38) == '\0') {
            uVar31 = *(uint *)(lVar11 + lVar38 * 4);
            do {
              uVar26 = uVar31;
              uVar31 = UF::P_[uVar26];
              uVar3 = *(uint *)(lVar19 + lVar10 * 4);
            } while (UF::P_[uVar26] < uVar26);
            do {
              uVar31 = uVar3;
              uVar3 = UF::P_[uVar31];
            } while (UF::P_[uVar31] < uVar31);
            goto LAB_0027d267;
          }
LAB_0027d04f:
          uVar29 = *(undefined4 *)(lVar11 + lVar10 * 4);
          goto LAB_0027d1ed;
        }
        if (*(char *)(lVar34 + lVar51) == '\0') goto code_r0x0027bd8c;
        uVar36 = lVar21 + lVar51;
        uVar31 = *(uint *)(lVar12 + lVar45 * 4 + 8 + lVar51 * 4);
        uVar33 = uVar36 & 0xffffffff;
        goto LAB_0027bf4b;
      }
      uVar36 = lVar21 + lVar51;
      lVar21 = lVar35 + 0x300000000 >> 0x20;
      if (*(char *)(lVar23 + lVar21) != '\0') {
        uVar31 = *(uint *)(lVar12 + lVar45 * 4 + lVar51 * 4);
        do {
          uVar26 = uVar31;
          uVar31 = puVar15[uVar26];
          uVar3 = *(uint *)(lVar19 + (lVar35 >> 0x1e));
        } while (puVar15[uVar26] < uVar26);
        do {
          uVar31 = uVar3;
          uVar3 = puVar15[uVar31];
        } while (puVar15[uVar31] < uVar31);
        goto LAB_0027be38;
      }
      if (*(char *)(lVar10 + lVar21) == '\0') goto LAB_0027c3be;
      lVar34 = lVar35 + 0x400000000 >> 0x20;
      if (*(char *)(lVar23 + lVar34) != '\0') {
        uVar3 = *(uint *)(lVar19 + (lVar35 >> 0x1e));
        if (*(char *)(lVar17 + lVar21) == '\0') {
          uVar31 = *(uint *)(lVar11 + lVar34 * 4);
          do {
            uVar26 = uVar31;
            uVar31 = puVar15[uVar26];
          } while (puVar15[uVar26] < uVar26);
          do {
            uVar31 = uVar3;
            uVar3 = puVar15[uVar31];
          } while (puVar15[uVar31] < uVar31);
        }
        else {
          uVar31 = *(uint *)(lVar12 + lVar45 * 4 + lVar51 * 4);
          do {
            uVar26 = uVar31;
            uVar31 = puVar15[uVar26];
          } while (puVar15[uVar26] < uVar26);
          do {
            uVar31 = uVar3;
            uVar3 = puVar15[uVar31];
          } while (puVar15[uVar31] < uVar31);
        }
        goto LAB_0027bf36;
      }
LAB_0027c400:
      puVar22 = (undefined4 *)((lVar35 >> 0x1e) + lVar19);
      goto LAB_0027c4ef;
    }
LAB_0027cd70:
    uVar36 = (ulong)uVar31;
    if (iVar37 < (int)uVar31) goto LAB_0027ce16;
    lVar38 = (long)(int)uVar31;
    if (*(char *)(lVar10 + lVar38) == '\0') {
      if (*(char *)((long)iVar30 + 3 + lVar10) == '\0') goto LAB_0027d1fe;
      if (*(char *)(lVar23 + 3 + (long)iVar30) == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar31 = UF::length_ + 1;
        *(uint *)(lVar19 + lVar38 * 4) = UF::length_;
        UF::length_ = uVar31;
        return;
      }
      uVar29 = *(undefined4 *)(lVar11 + lVar38 * 4);
    }
    else {
      lVar10 = (long)iVar30;
      if (*(char *)(lVar23 + 3 + lVar10) != '\0') {
        uVar31 = *(uint *)(lVar11 + lVar38 * 4);
        do {
          uVar26 = uVar31;
          uVar31 = UF::P_[uVar26];
          uVar3 = *(uint *)(lVar19 + lVar10 * 4);
        } while (UF::P_[uVar26] < uVar26);
        do {
          uVar31 = uVar3;
          uVar3 = UF::P_[uVar31];
        } while (UF::P_[uVar31] < uVar31);
        uVar3 = uVar31;
        if (uVar26 >= uVar31 && uVar26 != uVar31) {
          uVar3 = uVar26;
        }
        if (uVar26 < uVar31) {
          uVar31 = uVar26;
        }
        UF::P_[uVar3] = uVar31;
        *(uint *)(lVar19 + lVar38 * 4) = uVar31;
        return;
      }
      uVar29 = *(undefined4 *)(lVar19 + lVar10 * 4);
    }
    *(undefined4 *)(lVar19 + lVar38 * 4) = uVar29;
    return;
  }
  goto LAB_0027caa7;
code_r0x0027c244:
  *(undefined4 *)(lVar38 + lVar52 * 4 + lVar51 * 4) = *(undefined4 *)(lVar45 + lVar51 * 4);
  lVar35 = lVar35 + 0x200000000;
  lVar28 = lVar21 + lVar51;
  lVar51 = lVar51 + 2;
  if (lVar47 <= lVar28 + 2) {
    uVar31 = iVar30 + (int)lVar51 + 2;
    iVar30 = iVar30 + (int)lVar51;
    goto LAB_0027ccc6;
  }
  goto LAB_0027c229;
code_r0x0027b9ac:
  *(undefined4 *)(lVar38 + lVar35 * 4 + lVar45 * 4) = 0;
  lVar21 = lVar21 + 0x200000000;
  lVar51 = lVar34 + lVar45;
  lVar45 = lVar45 + 2;
  if (lVar47 <= lVar51 + 2) {
    iVar24 = iVar30 + (int)lVar45 + 2;
    iVar30 = iVar30 + (int)lVar45;
    goto LAB_0027cc19;
  }
  goto LAB_0027b99d;
LAB_0027b9d9:
  uVar36 = lVar34 + lVar45;
  lVar52 = lVar21 + 0x300000000 >> 0x20;
  lVar51 = lVar21 >> 0x20;
  if (*(char *)(lVar23 + lVar52) != '\0') goto code_r0x0027b9fe;
  if (*(char *)(lVar10 + lVar52) == '\0') {
    if (*(char *)(lVar45 + lVar39 + lVar35) != '\0') {
      uVar31 = *(uint *)(lVar12 + lVar35 * 4 + lVar45 * 4);
      goto LAB_0027c3c6;
    }
    if (*(char *)(lVar23 + 1 + lVar51) != '\0') {
      uVar31 = *(uint *)(lVar11 + lVar51 * 4);
      goto LAB_0027c3c6;
    }
    puVar15[UF::length_] = UF::length_;
    uVar31 = UF::length_;
    UF::length_ = UF::length_ + 1;
    goto LAB_0027c979;
  }
  lVar21 = lVar21 + 0x400000000 >> 0x20;
  cVar8 = *(char *)(lVar45 + lVar39 + lVar35);
  if (*(char *)(lVar23 + lVar21) == '\0') {
    if (cVar8 == '\0') {
      if (*(char *)(lVar23 + 1 + lVar51) == '\0') {
LAB_0027bbe3:
        uVar36 = lVar34 + lVar45;
        puVar15[UF::length_] = UF::length_;
        uVar31 = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
      else {
        uVar31 = *(uint *)(lVar11 + lVar51 * 4);
      }
      goto LAB_0027bd17;
    }
    iVar30 = (int)uVar36;
LAB_0027c067:
    *(undefined4 *)(lVar19 + uVar36 * 4) = *(undefined4 *)(lVar11 + uVar36 * 4);
    lVar21 = (long)iVar30;
    uVar36 = lVar21 + 2;
    if (iVar37 <= (int)uVar36) {
      if ((int)uVar36 <= iVar37) {
        if (*(char *)(lVar10 + uVar36) == '\0') {
          if (*(char *)(lVar21 + 3 + lVar10) == '\0') {
            *(undefined4 *)(lVar19 + 8 + lVar21 * 4) = 0;
            return;
          }
          if (*(char *)(lVar23 + 3 + lVar21) == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar31 = UF::length_ + 1;
            *(uint *)(lVar19 + 8 + lVar21 * 4) = UF::length_;
            UF::length_ = uVar31;
            return;
          }
          uVar29 = *(undefined4 *)(lVar11 + 8 + lVar21 * 4);
        }
        else {
          if (*(char *)(lVar23 + 3 + lVar21) != '\0') {
            if (*(char *)(lVar17 + uVar36) == '\0') {
              uVar31 = *(uint *)(lVar11 + 8 + lVar21 * 4);
              do {
                uVar26 = uVar31;
                uVar31 = UF::P_[uVar26];
                uVar3 = *(uint *)(lVar19 + lVar21 * 4);
              } while (UF::P_[uVar26] < uVar26);
              do {
                uVar31 = uVar3;
                uVar3 = UF::P_[uVar31];
              } while (UF::P_[uVar31] < uVar31);
              uVar3 = uVar31;
              if (uVar26 >= uVar31 && uVar26 != uVar31) {
                uVar3 = uVar26;
              }
              if (uVar26 < uVar31) {
                uVar31 = uVar26;
              }
              UF::P_[uVar3] = uVar31;
            }
            else {
              uVar31 = *(uint *)(lVar11 + lVar21 * 4);
              if (*(char *)(lVar17 + 1 + lVar21) == '\0') {
                do {
                  uVar26 = uVar31;
                  uVar31 = UF::P_[uVar26];
                  uVar3 = *(uint *)(lVar11 + 8 + lVar21 * 4);
                } while (UF::P_[uVar26] < uVar26);
                do {
                  uVar31 = uVar3;
                  uVar3 = UF::P_[uVar31];
                } while (UF::P_[uVar31] < uVar31);
                uVar3 = uVar31;
                if (uVar26 >= uVar31 && uVar26 != uVar31) {
                  uVar3 = uVar26;
                }
                if (uVar26 < uVar31) {
                  uVar31 = uVar26;
                }
                UF::P_[uVar3] = uVar31;
                *(uint *)(lVar19 + 8 + lVar21 * 4) = uVar31;
                return;
              }
            }
            *(uint *)(lVar19 + 8 + lVar21 * 4) = uVar31;
            return;
          }
          uVar29 = *(undefined4 *)(lVar19 + lVar21 * 4);
        }
        *(undefined4 *)(lVar19 + 8 + lVar21 * 4) = uVar29;
        return;
      }
      goto LAB_0027ce16;
    }
    if (*(char *)(lVar10 + 2 + lVar21) == '\0') {
      if (*(char *)(lVar10 + 3 + lVar21) != '\0') goto code_r0x0027c0dd;
LAB_0027c934:
      iVar30 = (int)uVar36;
      goto LAB_0027b964;
    }
    if (*(char *)(lVar23 + 3 + lVar21) != '\0') {
      if (*(char *)(lVar17 + uVar36) == '\0') {
        uVar31 = *(uint *)(lVar11 + 8 + lVar21 * 4);
        do {
          uVar26 = uVar31;
          uVar31 = puVar15[uVar26];
          uVar3 = *(uint *)(lVar19 + lVar21 * 4);
        } while (puVar15[uVar26] < uVar26);
        do {
          uVar31 = uVar3;
          uVar3 = puVar15[uVar31];
        } while (puVar15[uVar31] < uVar31);
      }
      else {
        uVar31 = *(uint *)(lVar11 + lVar21 * 4);
        if (*(char *)(lVar17 + 1 + lVar21) != '\0') goto LAB_0027c7de;
        do {
          uVar26 = uVar31;
          uVar31 = puVar15[uVar26];
          uVar3 = *(uint *)(lVar11 + 8 + lVar21 * 4);
        } while (puVar15[uVar26] < uVar26);
        do {
          uVar31 = uVar3;
          uVar3 = puVar15[uVar31];
        } while (puVar15[uVar31] < uVar31);
      }
LAB_0027c7d0:
      uVar3 = uVar31;
      if (uVar31 < uVar26) {
        uVar3 = uVar26;
      }
      if (uVar26 < uVar31) {
        uVar31 = uVar26;
      }
      puVar15[uVar3] = uVar31;
      goto LAB_0027c7de;
    }
    if (*(char *)(lVar10 + 3 + lVar21) == '\0') goto LAB_0027c975;
    if (*(char *)(lVar21 + 4 + lVar23) == '\0') goto LAB_0027c9f2;
    if (*(char *)(lVar17 + 3 + lVar21) == '\0') {
      uVar31 = *(uint *)(lVar11 + 0x10 + lVar21 * 4);
      do {
        uVar26 = uVar31;
        uVar31 = puVar15[uVar26];
        uVar3 = *(uint *)(lVar19 + lVar21 * 4);
      } while (puVar15[uVar26] < uVar26);
      do {
        uVar31 = uVar3;
        uVar3 = puVar15[uVar31];
      } while (puVar15[uVar31] < uVar31);
    }
    else if (*(char *)(lVar17 + uVar36) == '\0') {
      uVar31 = *(uint *)(lVar11 + 8 + lVar21 * 4);
      do {
        uVar26 = uVar31;
        uVar31 = puVar15[uVar26];
        uVar3 = *(uint *)(lVar19 + lVar21 * 4);
      } while (puVar15[uVar26] < uVar26);
      do {
        uVar31 = uVar3;
        uVar3 = puVar15[uVar31];
      } while (puVar15[uVar31] < uVar31);
    }
    else {
      uVar31 = *(uint *)(lVar11 + lVar21 * 4);
      if (*(char *)(lVar17 + 1 + lVar21) != '\0') goto LAB_0027cb7b;
      do {
        uVar26 = uVar31;
        uVar31 = puVar15[uVar26];
        uVar3 = *(uint *)(lVar11 + 8 + lVar21 * 4);
      } while (puVar15[uVar26] < uVar26);
      do {
        uVar31 = uVar3;
        uVar3 = puVar15[uVar31];
      } while (puVar15[uVar31] < uVar31);
    }
LAB_0027cb6d:
    uVar3 = uVar31;
    if (uVar31 < uVar26) {
      uVar3 = uVar26;
    }
    if (uVar26 < uVar31) {
      uVar31 = uVar26;
    }
    puVar15[uVar3] = uVar31;
  }
  else {
    if (cVar8 == '\0') {
      if (*(char *)(lVar23 + 1 + lVar51) == '\0') {
        uVar31 = *(uint *)(lVar11 + lVar21 * 4);
        goto LAB_0027c3b2;
      }
      if (*(char *)(lVar17 + lVar52) == '\0') {
        uVar31 = *(uint *)(lVar11 + lVar51 * 4);
        do {
          uVar26 = uVar31;
          uVar31 = puVar15[uVar26];
          uVar3 = *(uint *)(lVar11 + lVar21 * 4);
        } while (puVar15[uVar26] < uVar26);
        do {
          uVar31 = uVar3;
          uVar3 = puVar15[uVar31];
        } while (puVar15[uVar31] < uVar31);
      }
      else {
        uVar31 = *(uint *)(lVar11 + lVar51 * 4);
        if (*(char *)(lVar45 + -1 + lVar14 + lVar35) != '\0') goto LAB_0027c3b2;
        do {
          uVar26 = uVar31;
          uVar31 = puVar15[uVar26];
          uVar3 = *(uint *)(lVar12 + lVar35 * 4 + lVar45 * 4);
        } while (puVar15[uVar26] < uVar26);
        do {
          uVar31 = uVar3;
          uVar3 = puVar15[uVar31];
        } while (puVar15[uVar31] < uVar31);
      }
    }
    else {
      uVar31 = *(uint *)(lVar12 + lVar35 * 4 + lVar45 * 4);
      if (*(char *)(lVar17 + lVar52) != '\0') goto LAB_0027c3b2;
      do {
        uVar26 = uVar31;
        uVar31 = puVar15[uVar26];
        uVar3 = *(uint *)(lVar11 + lVar21 * 4);
      } while (puVar15[uVar26] < uVar26);
      do {
        uVar31 = uVar3;
        uVar3 = puVar15[uVar31];
      } while (puVar15[uVar31] < uVar31);
    }
LAB_0027bf36:
    uVar3 = uVar31;
    if (uVar31 < uVar26) {
      uVar3 = uVar26;
    }
    if (uVar26 < uVar31) {
      uVar31 = uVar26;
    }
    puVar15[uVar3] = uVar31;
  }
LAB_0027cb7b:
  uVar33 = uVar36 & 0xffffffff;
  goto LAB_0027bf4b;
code_r0x0027b9fe:
  if ((*(char *)(lVar45 + lVar39 + lVar35) != '\0') || (*(char *)(lVar23 + 1 + lVar51) == '\0')) {
    uVar31 = *(uint *)(lVar12 + lVar35 * 4 + lVar45 * 4);
    goto LAB_0027c3f4;
  }
  uVar31 = *(uint *)(lVar11 + lVar51 * 4);
  if (*(char *)(lVar45 + -1 + lVar14 + lVar35) != '\0') goto LAB_0027c3f4;
  do {
    uVar26 = uVar31;
    uVar31 = puVar15[uVar26];
    uVar3 = *(uint *)(lVar12 + lVar35 * 4 + lVar45 * 4);
  } while (puVar15[uVar26] < uVar26);
  do {
    uVar31 = uVar3;
    uVar3 = puVar15[uVar31];
  } while (puVar15[uVar31] < uVar31);
LAB_0027be38:
  uVar3 = uVar31;
  if (uVar31 < uVar26) {
    uVar3 = uVar26;
  }
  if (uVar26 < uVar31) {
    uVar31 = uVar26;
  }
  puVar15[uVar3] = uVar31;
  goto LAB_0027c7de;
code_r0x0027c0dd:
  if (*(char *)(lVar23 + 3 + lVar21) == '\0') {
    if (*(char *)(lVar21 + 4 + lVar23) == '\0') goto LAB_0027ca3f;
    uVar31 = *(uint *)(lVar11 + 0x10 + lVar21 * 4);
    goto LAB_0027cb7b;
  }
LAB_0027c1da:
  iVar30 = (int)uVar36;
  goto LAB_0027c1dd;
code_r0x0027bd8c:
  puVar16[UF::length_] = UF::length_;
  uVar31 = UF::length_ + 1;
  *(uint *)(lVar38 + lVar45 * 4 + lVar51 * 4) = UF::length_;
  UF::length_ = uVar31;
  lVar35 = lVar35 + 0x200000000;
  lVar52 = lVar21 + lVar51;
  lVar51 = lVar51 + 2;
  if (lVar47 <= lVar52 + 2) {
    uVar31 = iVar30 + (int)lVar51 + 2;
    iVar30 = iVar30 + (int)lVar51;
    goto LAB_0027cd70;
  }
  goto LAB_0027bd5c;
LAB_0027c3be:
  uVar31 = *(uint *)(lVar19 + (lVar35 >> 0x1e));
LAB_0027c3c6:
  iVar24 = (int)uVar36;
  goto LAB_0027c97c;
LAB_0027c3f4:
  uVar33 = uVar36 & 0xffffffff;
  goto LAB_0027c7e1;
code_r0x0027c563:
  *(undefined4 *)(lVar34 + lVar35 * 4) = *(undefined4 *)(lVar34 + -8 + lVar35 * 4);
  lVar45 = lVar45 + 0x200000000;
  lVar28 = lVar21 + lVar35;
  lVar35 = lVar35 + 2;
  if (lVar47 <= lVar28 + 2) {
    uVar31 = (int)lVar35 + iVar24 + 2;
    iVar24 = iVar24 + (int)lVar35;
    goto LAB_0027cdff;
  }
  goto LAB_0027c539;
LAB_0027c3b2:
  uVar33 = uVar36 & 0xffffffff;
  goto LAB_0027bf4b;
LAB_002710cf:
  iVar24 = iVar30 + 2;
  uVar29 = *(undefined4 *)(lVar19 + lVar32 * 4);
LAB_002710e7:
  *(undefined4 *)(lVar19 + lVar27 * 4) = uVar29;
  iVar30 = iVar24;
LAB_002710ee:
  iVar24 = iVar30 + 2;
  if (iVar37 <= iVar24) goto code_r0x002710fb;
  goto LAB_00271014;
code_r0x002710fb:
  lVar27 = (long)iVar30;
LAB_002713f6:
  lVar38 = (long)iVar24;
  cVar8 = *(char *)(lVar10 + lVar38);
  if (iVar24 <= iVar37) {
    if (cVar8 != '\0') goto LAB_002715bd;
    cVar8 = *(char *)(lVar10 + 3 + lVar27);
  }
joined_r0x002715b7:
  if (cVar8 == '\0') {
LAB_0027d1fe:
    *(undefined4 *)(lVar19 + lVar38 * 4) = 0;
    return;
  }
LAB_002715bd:
  puVar15[UF::length_] = UF::length_;
  uVar31 = UF::length_ + 1;
  *(uint *)(lVar19 + lVar38 * 4) = UF::length_;
  UF::length_ = uVar31;
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        e_rows = h & 0xfffffffe;
        o_rows = h % 2 == 1;
        e_cols = w & 0xfffffffe;
        o_cols = w % 2 == 1;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan

        // Define Conditions and Actions
        {
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

            // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
                               // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
                               //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
                               // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
                               // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
                               // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
                               // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
                               //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
                               // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
                               // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
                               // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
                               // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
                               // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
                               // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
                               //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
                               //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
        }

        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }


        // Undef Conditions and Actions
        {
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
        }
    }